

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [28];
  Primitive PVar8;
  uint uVar9;
  uint uVar10;
  __int_type_conflict _Var11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [28];
  undefined1 auVar115 [28];
  undefined1 auVar116 [28];
  undefined1 auVar117 [28];
  ulong uVar118;
  RTCIntersectArguments *pRVar119;
  uint uVar120;
  ulong uVar121;
  long lVar122;
  ulong uVar123;
  Geometry *pGVar124;
  undefined4 uVar125;
  undefined8 unaff_R13;
  long lVar126;
  long lVar127;
  float fVar128;
  float fVar129;
  float fVar142;
  float fVar145;
  vint4 ai;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar143;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar144;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  float fVar152;
  float fVar164;
  float fVar165;
  undefined1 auVar153 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar166;
  undefined1 auVar158 [32];
  undefined1 auVar154 [16];
  float fVar167;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  float fVar168;
  float fVar183;
  float fVar185;
  vint4 bi_2;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar169;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar187;
  undefined1 auVar181 [32];
  float fVar184;
  float fVar186;
  float fVar188;
  undefined1 auVar182 [32];
  float fVar189;
  float fVar200;
  float fVar201;
  vint4 bi;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar203;
  undefined1 auVar194 [16];
  undefined1 auVar193 [16];
  float fVar202;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  float fVar207;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar220;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  vint4 ai_1;
  undefined1 auVar223 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar230;
  float fVar231;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  float fVar232;
  float fVar233;
  float fVar241;
  float fVar243;
  vint4 bi_1;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar245;
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar242;
  float fVar244;
  float fVar246;
  undefined1 auVar240 [32];
  float fVar250;
  float fVar256;
  float fVar257;
  vint4 ai_2;
  undefined1 auVar251 [16];
  float fVar258;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  undefined1 auVar255 [32];
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar269;
  float fVar270;
  undefined1 auVar266 [16];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  float fVar275;
  float fVar276;
  float fVar283;
  float fVar284;
  float fVar286;
  undefined1 auVar277 [16];
  float fVar288;
  undefined1 auVar278 [16];
  float fVar287;
  float fVar289;
  undefined1 auVar285 [12];
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar293 [16];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  float fVar296;
  float fVar302;
  float fVar304;
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  float fVar306;
  float fVar308;
  float fVar309;
  float fVar311;
  undefined1 auVar300 [32];
  float fVar303;
  float fVar305;
  float fVar307;
  float fVar310;
  undefined1 auVar301 [32];
  float fVar312;
  float fVar321;
  float fVar322;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  float fVar323;
  undefined1 auVar320 [64];
  undefined1 auVar324 [16];
  undefined1 auVar325 [32];
  float fVar327;
  float fVar328;
  undefined1 auVar326 [32];
  float fVar331;
  float fVar332;
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_800 [16];
  Precalculations *local_7f0;
  ulong local_7e8;
  uint local_7e0;
  undefined4 uStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined1 auStack_710 [8];
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined1 (*local_6b8) [16];
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [8];
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  undefined1 auStack_630 [8];
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [8];
  undefined8 uStack_5d8;
  undefined1 local_5d0 [8];
  undefined8 uStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  LinearSpace3fa *local_510;
  Primitive *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 local_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_3b0 [16];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [8];
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  uint local_280;
  uint local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar157 [24];
  undefined1 auVar254 [32];
  
  PVar8 = prim[1];
  uVar118 = (ulong)(byte)PVar8;
  auVar213 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 4 + 6)));
  lVar126 = uVar118 * 0x25;
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 5 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 6 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0xf + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x11 + 6)));
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1a + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1b + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar118 * 0x1c + 6)));
  auVar223 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar223 = vinsertps_avx(auVar223,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar178 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar178 = vinsertps_avx(auVar178,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar223 = vsubps_avx(auVar223,*(undefined1 (*) [16])(prim + lVar126 + 6));
  fVar296 = *(float *)(prim + lVar126 + 0x12);
  auVar208._0_4_ = fVar296 * auVar223._0_4_;
  auVar208._4_4_ = fVar296 * auVar223._4_4_;
  auVar208._8_4_ = fVar296 * auVar223._8_4_;
  auVar208._12_4_ = fVar296 * auVar223._12_4_;
  auVar297._0_4_ = fVar296 * auVar178._0_4_;
  auVar297._4_4_ = fVar296 * auVar178._4_4_;
  auVar297._8_4_ = fVar296 * auVar178._8_4_;
  auVar297._12_4_ = fVar296 * auVar178._12_4_;
  auVar16 = vcvtdq2ps_avx(auVar194);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar223 = vshufps_avx(auVar297,auVar297,0x55);
  auVar178 = vshufps_avx(auVar297,auVar297,0xaa);
  fVar250 = auVar178._0_4_;
  fVar256 = auVar178._4_4_;
  fVar257 = auVar178._8_4_;
  fVar258 = auVar178._12_4_;
  fVar152 = auVar223._0_4_;
  fVar164 = auVar223._4_4_;
  fVar165 = auVar223._8_4_;
  fVar263 = auVar223._12_4_;
  auVar17 = vcvtdq2ps_avx(auVar213);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar223 = vshufps_avx(auVar297,auVar297,0);
  fVar296 = auVar223._0_4_;
  fVar302 = auVar223._4_4_;
  fVar304 = auVar223._8_4_;
  fVar306 = auVar223._12_4_;
  auVar277._0_4_ = fVar296 * auVar17._0_4_ + fVar152 * auVar16._0_4_ + fVar250 * auVar18._0_4_;
  auVar277._4_4_ = fVar302 * auVar17._4_4_ + fVar164 * auVar16._4_4_ + fVar256 * auVar18._4_4_;
  auVar277._8_4_ = fVar304 * auVar17._8_4_ + fVar165 * auVar16._8_4_ + fVar257 * auVar18._8_4_;
  auVar277._12_4_ = fVar306 * auVar17._12_4_ + fVar263 * auVar16._12_4_ + fVar258 * auVar18._12_4_;
  auVar170._0_4_ = fVar296 * auVar19._0_4_ + fVar250 * auVar21._0_4_ + fVar152 * auVar20._0_4_;
  auVar170._4_4_ = fVar302 * auVar19._4_4_ + fVar256 * auVar21._4_4_ + fVar164 * auVar20._4_4_;
  auVar170._8_4_ = fVar304 * auVar19._8_4_ + fVar257 * auVar21._8_4_ + fVar165 * auVar20._8_4_;
  auVar170._12_4_ = fVar306 * auVar19._12_4_ + fVar258 * auVar21._12_4_ + fVar263 * auVar20._12_4_;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar118 * 7 + 6);
  auVar131 = vpmovsxwd_avx(auVar223);
  auVar223 = vcvtdq2ps_avx(auVar130);
  auVar298._0_4_ = fVar152 * auVar22._0_4_ + fVar250 * auVar23._0_4_ + fVar296 * auVar223._0_4_;
  auVar298._4_4_ = fVar164 * auVar22._4_4_ + fVar256 * auVar23._4_4_ + fVar302 * auVar223._4_4_;
  auVar298._8_4_ = fVar165 * auVar22._8_4_ + fVar257 * auVar23._8_4_ + fVar304 * auVar223._8_4_;
  auVar298._12_4_ = fVar263 * auVar22._12_4_ + fVar258 * auVar23._12_4_ + fVar306 * auVar223._12_4_;
  auVar178 = vshufps_avx(auVar208,auVar208,0xaa);
  fVar250 = auVar178._0_4_;
  fVar256 = auVar178._4_4_;
  fVar257 = auVar178._8_4_;
  fVar258 = auVar178._12_4_;
  auVar178 = vshufps_avx(auVar208,auVar208,0x55);
  fVar296 = auVar178._0_4_;
  fVar304 = auVar178._4_4_;
  fVar152 = auVar178._8_4_;
  fVar165 = auVar178._12_4_;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *(ulong *)(prim + uVar118 * 0xb + 6);
  auVar130 = vpmovsxwd_avx(auVar178);
  auVar213._8_8_ = 0;
  auVar213._0_8_ = *(ulong *)(prim + uVar118 * 9 + 6);
  auVar132 = vpmovsxwd_avx(auVar213);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar118 * 0xd + 6);
  auVar194 = vpmovsxwd_avx(auVar194);
  auVar178 = vshufps_avx(auVar208,auVar208,0);
  fVar302 = auVar178._0_4_;
  fVar306 = auVar178._4_4_;
  fVar164 = auVar178._8_4_;
  fVar263 = auVar178._12_4_;
  auVar293._0_4_ = auVar16._0_4_ * fVar296 + fVar250 * auVar18._0_4_ + auVar17._0_4_ * fVar302;
  auVar293._4_4_ = auVar16._4_4_ * fVar304 + fVar256 * auVar18._4_4_ + auVar17._4_4_ * fVar306;
  auVar293._8_4_ = auVar16._8_4_ * fVar152 + fVar257 * auVar18._8_4_ + auVar17._8_4_ * fVar164;
  auVar293._12_4_ = auVar16._12_4_ * fVar165 + fVar258 * auVar18._12_4_ + auVar17._12_4_ * fVar263;
  auVar266._0_4_ = auVar21._0_4_ * fVar250 + fVar296 * auVar20._0_4_ + auVar19._0_4_ * fVar302;
  auVar266._4_4_ = auVar21._4_4_ * fVar256 + fVar304 * auVar20._4_4_ + auVar19._4_4_ * fVar306;
  auVar266._8_4_ = auVar21._8_4_ * fVar257 + fVar152 * auVar20._8_4_ + auVar19._8_4_ * fVar164;
  auVar266._12_4_ = auVar21._12_4_ * fVar258 + fVar165 * auVar20._12_4_ + auVar19._12_4_ * fVar263;
  auVar209._0_4_ = fVar296 * auVar22._0_4_ + fVar250 * auVar23._0_4_ + auVar223._0_4_ * fVar302;
  auVar209._4_4_ = fVar304 * auVar22._4_4_ + fVar256 * auVar23._4_4_ + auVar223._4_4_ * fVar306;
  auVar209._8_4_ = fVar152 * auVar22._8_4_ + fVar257 * auVar23._8_4_ + auVar223._8_4_ * fVar164;
  auVar209._12_4_ = fVar165 * auVar22._12_4_ + fVar258 * auVar23._12_4_ + auVar223._12_4_ * fVar263;
  auVar324._8_4_ = 0x7fffffff;
  auVar324._0_8_ = 0x7fffffff7fffffff;
  auVar324._12_4_ = 0x7fffffff;
  auVar223 = vandps_avx(auVar277,auVar324);
  auVar313._8_4_ = 0x219392ef;
  auVar313._0_8_ = 0x219392ef219392ef;
  auVar313._12_4_ = 0x219392ef;
  auVar223 = vcmpps_avx(auVar223,auVar313,1);
  auVar178 = vblendvps_avx(auVar277,auVar313,auVar223);
  auVar223 = vandps_avx(auVar324,auVar170);
  auVar223 = vcmpps_avx(auVar223,auVar313,1);
  auVar213 = vblendvps_avx(auVar170,auVar313,auVar223);
  auVar223 = vandps_avx(auVar298,auVar324);
  auVar223 = vcmpps_avx(auVar223,auVar313,1);
  auVar223 = vblendvps_avx(auVar298,auVar313,auVar223);
  auVar16 = vrcpps_avx(auVar178);
  fVar250 = auVar16._0_4_;
  auVar251._0_4_ = fVar250 * auVar178._0_4_;
  fVar256 = auVar16._4_4_;
  auVar251._4_4_ = fVar256 * auVar178._4_4_;
  fVar257 = auVar16._8_4_;
  auVar251._8_4_ = fVar257 * auVar178._8_4_;
  fVar258 = auVar16._12_4_;
  auVar251._12_4_ = fVar258 * auVar178._12_4_;
  auVar314._8_4_ = 0x3f800000;
  auVar314._0_8_ = 0x3f8000003f800000;
  auVar314._12_4_ = 0x3f800000;
  auVar178 = vsubps_avx(auVar314,auVar251);
  fVar250 = fVar250 + fVar250 * auVar178._0_4_;
  fVar256 = fVar256 + fVar256 * auVar178._4_4_;
  fVar257 = fVar257 + fVar257 * auVar178._8_4_;
  fVar258 = fVar258 + fVar258 * auVar178._12_4_;
  auVar178 = vrcpps_avx(auVar213);
  fVar275 = auVar178._0_4_;
  auVar171._0_4_ = fVar275 * auVar213._0_4_;
  fVar283 = auVar178._4_4_;
  auVar171._4_4_ = fVar283 * auVar213._4_4_;
  fVar286 = auVar178._8_4_;
  auVar171._8_4_ = fVar286 * auVar213._8_4_;
  fVar288 = auVar178._12_4_;
  auVar171._12_4_ = fVar288 * auVar213._12_4_;
  auVar178 = vsubps_avx(auVar314,auVar171);
  fVar275 = fVar275 + fVar275 * auVar178._0_4_;
  fVar283 = fVar283 + fVar283 * auVar178._4_4_;
  fVar286 = fVar286 + fVar286 * auVar178._8_4_;
  fVar288 = fVar288 + fVar288 * auVar178._12_4_;
  auVar178 = vrcpps_avx(auVar223);
  fVar296 = auVar178._0_4_;
  auVar299._0_4_ = auVar223._0_4_ * fVar296;
  fVar302 = auVar178._4_4_;
  auVar299._4_4_ = auVar223._4_4_ * fVar302;
  fVar304 = auVar178._8_4_;
  auVar299._8_4_ = auVar223._8_4_ * fVar304;
  fVar306 = auVar178._12_4_;
  auVar299._12_4_ = auVar223._12_4_ * fVar306;
  auVar223 = vsubps_avx(auVar314,auVar299);
  fVar296 = auVar223._0_4_ * fVar296 + fVar296;
  fVar302 = auVar223._4_4_ * fVar302 + fVar302;
  fVar304 = auVar223._8_4_ * fVar304 + fVar304;
  fVar306 = auVar223._12_4_ * fVar306 + fVar306;
  auVar213 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                          *(float *)(prim + lVar126 + 0x16)) *
                                         *(float *)(prim + lVar126 + 0x1a))),0);
  auVar223 = vcvtdq2ps_avx(auVar131);
  auVar178 = vcvtdq2ps_avx(auVar130);
  auVar178 = vsubps_avx(auVar178,auVar223);
  fVar152 = auVar213._0_4_;
  fVar164 = auVar213._4_4_;
  fVar165 = auVar213._8_4_;
  fVar263 = auVar213._12_4_;
  auVar130._0_4_ = fVar152 * auVar178._0_4_ + auVar223._0_4_;
  auVar130._4_4_ = fVar164 * auVar178._4_4_ + auVar223._4_4_;
  auVar130._8_4_ = fVar165 * auVar178._8_4_ + auVar223._8_4_;
  auVar130._12_4_ = fVar263 * auVar178._12_4_ + auVar223._12_4_;
  auVar223 = vcvtdq2ps_avx(auVar132);
  auVar178 = vcvtdq2ps_avx(auVar194);
  auVar178 = vsubps_avx(auVar178,auVar223);
  auVar190._0_4_ = fVar152 * auVar178._0_4_ + auVar223._0_4_;
  auVar190._4_4_ = fVar164 * auVar178._4_4_ + auVar223._4_4_;
  auVar190._8_4_ = fVar165 * auVar178._8_4_ + auVar223._8_4_;
  auVar190._12_4_ = fVar263 * auVar178._12_4_ + auVar223._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar118 * 0x12 + 6);
  auVar223 = vpmovsxwd_avx(auVar16);
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar118 * 0x16 + 6);
  auVar178 = vpmovsxwd_avx(auVar18);
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar178 = vsubps_avx(auVar178,auVar223);
  auVar221._0_4_ = fVar152 * auVar178._0_4_ + auVar223._0_4_;
  auVar221._4_4_ = fVar164 * auVar178._4_4_ + auVar223._4_4_;
  auVar221._8_4_ = fVar165 * auVar178._8_4_ + auVar223._8_4_;
  auVar221._12_4_ = fVar263 * auVar178._12_4_ + auVar223._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar118 * 0x14 + 6);
  auVar223 = vpmovsxwd_avx(auVar20);
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar118 * 0x18 + 6);
  auVar178 = vpmovsxwd_avx(auVar21);
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar213 = vsubps_avx(auVar178,auVar223);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar118 * 0x1d + 6);
  auVar178 = vpmovsxwd_avx(auVar17);
  auVar234._0_4_ = auVar213._0_4_ * fVar152 + auVar223._0_4_;
  auVar234._4_4_ = auVar213._4_4_ * fVar164 + auVar223._4_4_;
  auVar234._8_4_ = auVar213._8_4_ * fVar165 + auVar223._8_4_;
  auVar234._12_4_ = auVar213._12_4_ * fVar263 + auVar223._12_4_;
  auVar223 = vcvtdq2ps_avx(auVar178);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar118 * 0x21 + 6);
  auVar178 = vpmovsxwd_avx(auVar19);
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar178 = vsubps_avx(auVar178,auVar223);
  auVar315._0_4_ = auVar178._0_4_ * fVar152 + auVar223._0_4_;
  auVar315._4_4_ = auVar178._4_4_ * fVar164 + auVar223._4_4_;
  auVar315._8_4_ = auVar178._8_4_ * fVar165 + auVar223._8_4_;
  auVar315._12_4_ = auVar178._12_4_ * fVar263 + auVar223._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar118 * 0x1f + 6);
  auVar223 = vpmovsxwd_avx(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar118 * 0x23 + 6);
  auVar178 = vpmovsxwd_avx(auVar23);
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar178 = vsubps_avx(auVar178,auVar223);
  auVar172._0_4_ = auVar223._0_4_ + auVar178._0_4_ * fVar152;
  auVar172._4_4_ = auVar223._4_4_ + auVar178._4_4_ * fVar164;
  auVar172._8_4_ = auVar223._8_4_ + auVar178._8_4_ * fVar165;
  auVar172._12_4_ = auVar223._12_4_ + auVar178._12_4_ * fVar263;
  auVar223 = vsubps_avx(auVar130,auVar293);
  auVar131._0_4_ = fVar250 * auVar223._0_4_;
  auVar131._4_4_ = fVar256 * auVar223._4_4_;
  auVar131._8_4_ = fVar257 * auVar223._8_4_;
  auVar131._12_4_ = fVar258 * auVar223._12_4_;
  auVar223 = vsubps_avx(auVar190,auVar293);
  auVar191._0_4_ = fVar250 * auVar223._0_4_;
  auVar191._4_4_ = fVar256 * auVar223._4_4_;
  auVar191._8_4_ = fVar257 * auVar223._8_4_;
  auVar191._12_4_ = fVar258 * auVar223._12_4_;
  auVar223 = vsubps_avx(auVar221,auVar266);
  auVar222._0_4_ = fVar275 * auVar223._0_4_;
  auVar222._4_4_ = fVar283 * auVar223._4_4_;
  auVar222._8_4_ = fVar286 * auVar223._8_4_;
  auVar222._12_4_ = fVar288 * auVar223._12_4_;
  auVar223 = vsubps_avx(auVar234,auVar266);
  auVar235._0_4_ = fVar275 * auVar223._0_4_;
  auVar235._4_4_ = fVar283 * auVar223._4_4_;
  auVar235._8_4_ = fVar286 * auVar223._8_4_;
  auVar235._12_4_ = fVar288 * auVar223._12_4_;
  auVar223 = vsubps_avx(auVar315,auVar209);
  auVar252._0_4_ = fVar296 * auVar223._0_4_;
  auVar252._4_4_ = fVar302 * auVar223._4_4_;
  auVar252._8_4_ = fVar304 * auVar223._8_4_;
  auVar252._12_4_ = fVar306 * auVar223._12_4_;
  auVar223 = vsubps_avx(auVar172,auVar209);
  auVar173._0_4_ = fVar296 * auVar223._0_4_;
  auVar173._4_4_ = fVar302 * auVar223._4_4_;
  auVar173._8_4_ = fVar304 * auVar223._8_4_;
  auVar173._12_4_ = fVar306 * auVar223._12_4_;
  auVar223 = vpminsd_avx(auVar131,auVar191);
  auVar178 = vpminsd_avx(auVar222,auVar235);
  auVar223 = vmaxps_avx(auVar223,auVar178);
  auVar178 = vpminsd_avx(auVar252,auVar173);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar278._4_4_ = uVar125;
  auVar278._0_4_ = uVar125;
  auVar278._8_4_ = uVar125;
  auVar278._12_4_ = uVar125;
  auVar178 = vmaxps_avx(auVar178,auVar278);
  auVar223 = vmaxps_avx(auVar223,auVar178);
  local_2f0._0_4_ = auVar223._0_4_ * 0.99999964;
  local_2f0._4_4_ = auVar223._4_4_ * 0.99999964;
  local_2f0._8_4_ = auVar223._8_4_ * 0.99999964;
  local_2f0._12_4_ = auVar223._12_4_ * 0.99999964;
  auVar223 = vpmaxsd_avx(auVar131,auVar191);
  auVar178 = vpmaxsd_avx(auVar222,auVar235);
  auVar223 = vminps_avx(auVar223,auVar178);
  auVar178 = vpmaxsd_avx(auVar252,auVar173);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar192._4_4_ = uVar125;
  auVar192._0_4_ = uVar125;
  auVar192._8_4_ = uVar125;
  auVar192._12_4_ = uVar125;
  auVar178 = vminps_avx(auVar178,auVar192);
  auVar223 = vminps_avx(auVar223,auVar178);
  auVar132._0_4_ = auVar223._0_4_ * 1.0000004;
  auVar132._4_4_ = auVar223._4_4_ * 1.0000004;
  auVar132._8_4_ = auVar223._8_4_ * 1.0000004;
  auVar132._12_4_ = auVar223._12_4_ * 1.0000004;
  auVar223 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar178 = vpcmpgtd_avx(auVar223,_DAT_01f4ad30);
  auVar223 = vcmpps_avx(local_2f0,auVar132,2);
  auVar223 = vandps_avx(auVar223,auVar178);
  uVar125 = vmovmskps_avx(auVar223);
  local_510 = pre->ray_space + k;
  local_500 = mm_lookupmask_ps._16_8_;
  uStack_4f8 = mm_lookupmask_ps._24_8_;
  uStack_4f0 = mm_lookupmask_ps._16_8_;
  uStack_4e8 = mm_lookupmask_ps._24_8_;
  local_6b8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_7f0 = pre;
  local_508 = prim;
  for (uVar118 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar125); uVar118 != 0;
      uVar118 = (ulong)((uint)uVar118 & (uint)uVar118 + 0xf & uVar120)) {
    lVar126 = 0;
    if (uVar118 != 0) {
      for (; (uVar118 >> lVar126 & 1) == 0; lVar126 = lVar126 + 1) {
      }
    }
    uVar120 = *(uint *)(local_508 + 2);
    local_7e8 = (ulong)uVar120;
    uVar9 = *(uint *)(local_508 + lVar126 * 4 + 6);
    pGVar124 = (context->scene->geometries).items[local_7e8].ptr;
    uVar121 = (ulong)*(uint *)(*(long *)&pGVar124->field_0x58 +
                              (ulong)uVar9 *
                              pGVar124[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar296 = (pGVar124->time_range).lower;
    fVar296 = pGVar124->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar296) / ((pGVar124->time_range).upper - fVar296)
              );
    auVar223 = vroundss_avx(ZEXT416((uint)fVar296),ZEXT416((uint)fVar296),9);
    auVar223 = vminss_avx(auVar223,ZEXT416((uint)(pGVar124->fnumTimeSegments + -1.0)));
    auVar223 = vmaxss_avx(ZEXT816(0) << 0x20,auVar223);
    fVar296 = fVar296 - auVar223._0_4_;
    _Var11 = pGVar124[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar122 = (long)(int)auVar223._0_4_ * 0x38;
    lVar126 = *(long *)(_Var11 + 0x10 + lVar122);
    lVar127 = *(long *)(_Var11 + 0x38 + lVar122);
    lVar12 = *(long *)(_Var11 + 0x48 + lVar122);
    auVar223 = vshufps_avx(ZEXT416((uint)fVar296),ZEXT416((uint)fVar296),0);
    pfVar1 = (float *)(lVar127 + uVar121 * lVar12);
    fVar152 = auVar223._0_4_;
    fVar164 = auVar223._4_4_;
    fVar165 = auVar223._8_4_;
    fVar263 = auVar223._12_4_;
    pfVar2 = (float *)(lVar127 + (uVar121 + 1) * lVar12);
    uVar123 = (uVar121 + 2) * lVar12;
    pfVar3 = (float *)(lVar127 + uVar123);
    pfVar4 = (float *)(lVar127 + lVar12 * (uVar121 + 3));
    lVar127 = *(long *)(_Var11 + lVar122);
    auVar223 = vshufps_avx(ZEXT416((uint)(1.0 - fVar296)),ZEXT416((uint)(1.0 - fVar296)),0);
    pfVar5 = (float *)(lVar127 + lVar126 * uVar121);
    fVar296 = auVar223._0_4_;
    fVar302 = auVar223._4_4_;
    fVar304 = auVar223._8_4_;
    fVar306 = auVar223._12_4_;
    pfVar6 = (float *)(lVar127 + lVar126 * (uVar121 + 1));
    local_6d0 = (undefined1  [8])
                CONCAT44(fVar164 * pfVar1[1] + fVar302 * pfVar5[1],
                         fVar152 * *pfVar1 + fVar296 * *pfVar5);
    uStack_6c8._0_4_ = fVar165 * pfVar1[2] + fVar304 * pfVar5[2];
    uStack_6c8._4_4_ = fVar263 * pfVar1[3] + fVar306 * pfVar5[3];
    pfVar1 = (float *)(lVar127 + lVar126 * (uVar121 + 2));
    local_6e0 = (undefined1  [8])
                CONCAT44(fVar302 * pfVar6[1] + fVar164 * pfVar2[1],
                         fVar296 * *pfVar6 + fVar152 * *pfVar2);
    uStack_6d8._0_4_ = fVar304 * pfVar6[2] + fVar165 * pfVar2[2];
    uStack_6d8._4_4_ = fVar306 * pfVar6[3] + fVar263 * pfVar2[3];
    local_5d0 = (undefined1  [8])
                CONCAT44(fVar302 * pfVar1[1] + fVar164 * pfVar3[1],
                         fVar296 * *pfVar1 + fVar152 * *pfVar3);
    uStack_5c8._0_4_ = fVar304 * pfVar1[2] + fVar165 * pfVar3[2];
    uStack_5c8._4_4_ = fVar306 * pfVar1[3] + fVar263 * pfVar3[3];
    pfVar1 = (float *)(lVar127 + lVar126 * (uVar121 + 3));
    local_5e0 = (undefined1  [8])
                CONCAT44(fVar302 * pfVar1[1] + fVar164 * pfVar4[1],
                         fVar296 * *pfVar1 + fVar152 * *pfVar4);
    uStack_5d8._0_4_ = fVar304 * pfVar1[2] + fVar165 * pfVar4[2];
    uStack_5d8._4_4_ = fVar306 * pfVar1[3] + fVar263 * pfVar4[3];
    auVar223 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    uVar10 = (uint)pGVar124[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar194 = vinsertps_avx(auVar223,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar213 = vsubps_avx(_local_6d0,auVar194);
    auVar223 = vshufps_avx(auVar213,auVar213,0);
    auVar178 = vshufps_avx(auVar213,auVar213,0x55);
    auVar213 = vshufps_avx(auVar213,auVar213,0xaa);
    fVar296 = (local_510->vx).field_0.m128[0];
    fVar302 = (local_510->vx).field_0.m128[1];
    fVar304 = (local_510->vx).field_0.m128[2];
    fVar306 = (local_510->vx).field_0.m128[3];
    fVar152 = (local_510->vy).field_0.m128[0];
    fVar164 = (local_510->vy).field_0.m128[1];
    fVar165 = (local_510->vy).field_0.m128[2];
    fVar263 = (local_510->vy).field_0.m128[3];
    fVar250 = (local_510->vz).field_0.m128[0];
    fVar256 = (local_510->vz).field_0.m128[1];
    fVar257 = (local_510->vz).field_0.m128[2];
    fVar258 = (local_510->vz).field_0.m128[3];
    auVar210._0_4_ = auVar223._0_4_ * fVar296 + auVar178._0_4_ * fVar152 + fVar250 * auVar213._0_4_;
    auVar210._4_4_ = auVar223._4_4_ * fVar302 + auVar178._4_4_ * fVar164 + fVar256 * auVar213._4_4_;
    auVar210._8_4_ = auVar223._8_4_ * fVar304 + auVar178._8_4_ * fVar165 + fVar257 * auVar213._8_4_;
    auVar210._12_4_ =
         auVar223._12_4_ * fVar306 + auVar178._12_4_ * fVar263 + fVar258 * auVar213._12_4_;
    auVar223 = vblendps_avx(auVar210,_local_6d0,8);
    auVar16 = vsubps_avx(_local_6e0,auVar194);
    auVar178 = vshufps_avx(auVar16,auVar16,0);
    auVar213 = vshufps_avx(auVar16,auVar16,0x55);
    auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar211._0_8_ =
         CONCAT44(auVar178._4_4_ * fVar302 + auVar213._4_4_ * fVar164 + fVar256 * auVar16._4_4_,
                  auVar178._0_4_ * fVar296 + auVar213._0_4_ * fVar152 + fVar250 * auVar16._0_4_);
    auVar211._8_4_ = auVar178._8_4_ * fVar304 + auVar213._8_4_ * fVar165 + fVar257 * auVar16._8_4_;
    auVar211._12_4_ =
         auVar178._12_4_ * fVar306 + auVar213._12_4_ * fVar263 + fVar258 * auVar16._12_4_;
    auVar178 = vblendps_avx(auVar211,_local_6e0,8);
    auVar18 = vsubps_avx(_local_5d0,auVar194);
    auVar213 = vshufps_avx(auVar18,auVar18,0);
    auVar16 = vshufps_avx(auVar18,auVar18,0x55);
    auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
    auVar212._0_4_ = auVar213._0_4_ * fVar296 + auVar16._0_4_ * fVar152 + fVar250 * auVar18._0_4_;
    auVar212._4_4_ = auVar213._4_4_ * fVar302 + auVar16._4_4_ * fVar164 + fVar256 * auVar18._4_4_;
    auVar212._8_4_ = auVar213._8_4_ * fVar304 + auVar16._8_4_ * fVar165 + fVar257 * auVar18._8_4_;
    auVar212._12_4_ =
         auVar213._12_4_ * fVar306 + auVar16._12_4_ * fVar263 + fVar258 * auVar18._12_4_;
    auVar213 = vblendps_avx(auVar212,_local_5d0,8);
    auVar18 = vsubps_avx(_local_5e0,auVar194);
    auVar194 = vshufps_avx(auVar18,auVar18,0);
    auVar16 = vshufps_avx(auVar18,auVar18,0x55);
    auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
    auVar153._0_4_ = auVar194._0_4_ * fVar296 + auVar16._0_4_ * fVar152 + fVar250 * auVar18._0_4_;
    auVar153._4_4_ = auVar194._4_4_ * fVar302 + auVar16._4_4_ * fVar164 + fVar256 * auVar18._4_4_;
    auVar153._8_4_ = auVar194._8_4_ * fVar304 + auVar16._8_4_ * fVar165 + fVar257 * auVar18._8_4_;
    auVar153._12_4_ =
         auVar194._12_4_ * fVar306 + auVar16._12_4_ * fVar263 + fVar258 * auVar18._12_4_;
    auVar194 = vblendps_avx(auVar153,_local_5e0,8);
    auVar193._8_4_ = 0x7fffffff;
    auVar193._0_8_ = 0x7fffffff7fffffff;
    auVar193._12_4_ = 0x7fffffff;
    auVar223 = vandps_avx(auVar223,auVar193);
    auVar178 = vandps_avx(auVar178,auVar193);
    auVar16 = vmaxps_avx(auVar223,auVar178);
    auVar223 = vandps_avx(auVar213,auVar193);
    auVar178 = vandps_avx(auVar194,auVar193);
    auVar223 = vmaxps_avx(auVar223,auVar178);
    auVar223 = vmaxps_avx(auVar16,auVar223);
    auVar178 = vmovshdup_avx(auVar223);
    auVar178 = vmaxss_avx(auVar178,auVar223);
    auVar223 = vshufpd_avx(auVar223,auVar223,1);
    auVar223 = vmaxss_avx(auVar223,auVar178);
    lVar126 = (long)(int)uVar10 * 0x44;
    fVar263 = *(float *)(bspline_basis0 + lVar126 + 0x908);
    fVar250 = *(float *)(bspline_basis0 + lVar126 + 0x90c);
    fVar256 = *(float *)(bspline_basis0 + lVar126 + 0x910);
    fVar257 = *(float *)(bspline_basis0 + lVar126 + 0x914);
    fStack_490 = *(float *)(bspline_basis0 + lVar126 + 0x918);
    fStack_48c = *(float *)(bspline_basis0 + lVar126 + 0x91c);
    fStack_488 = *(float *)(bspline_basis0 + lVar126 + 0x920);
    fStack_484 = *(float *)(bspline_basis0 + lVar126 + 0x924);
    local_760._0_16_ = auVar212;
    auVar178 = vshufps_avx(auVar212,auVar212,0);
    register0x000012d0 = auVar178;
    _local_620 = auVar178;
    auVar213 = vshufps_avx(auVar212,auVar212,0x55);
    local_7a0._16_16_ = auVar213;
    local_7a0._0_16_ = auVar213;
    fVar296 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar126 + 0xd8c);
    fVar302 = *(float *)(bspline_basis0 + lVar126 + 0xd90);
    fVar304 = *(float *)(bspline_basis0 + lVar126 + 0xd94);
    fVar306 = *(float *)(bspline_basis0 + lVar126 + 0xd98);
    fVar152 = *(float *)(bspline_basis0 + lVar126 + 0xd9c);
    fVar164 = *(float *)(bspline_basis0 + lVar126 + 0xda0);
    fVar165 = *(float *)(bspline_basis0 + lVar126 + 0xda4);
    auVar114 = *(undefined1 (*) [28])(bspline_basis0 + lVar126 + 0xd8c);
    auVar194 = vshufps_avx(auVar153,auVar153,0);
    register0x00001550 = auVar194;
    _local_440 = auVar194;
    fVar260 = auVar194._0_4_;
    fVar261 = auVar194._4_4_;
    fVar262 = auVar194._8_4_;
    fVar276 = auVar194._12_4_;
    fVar129 = auVar178._0_4_;
    fVar144 = auVar178._4_4_;
    fVar220 = auVar178._8_4_;
    fVar202 = auVar178._12_4_;
    auVar178 = vshufps_avx(auVar153,auVar153,0x55);
    register0x00001510 = auVar178;
    _local_7c0 = auVar178;
    fVar312 = auVar178._0_4_;
    fVar321 = auVar178._4_4_;
    fVar322 = auVar178._8_4_;
    fVar323 = auVar178._12_4_;
    fVar168 = auVar213._0_4_;
    fVar183 = auVar213._4_4_;
    fVar185 = auVar213._8_4_;
    fVar187 = auVar213._12_4_;
    auVar178 = vshufps_avx(_local_5d0,_local_5d0,0xff);
    register0x00001490 = auVar178;
    _local_160 = auVar178;
    auVar213 = vshufps_avx(_local_5e0,_local_5e0,0xff);
    register0x00001410 = auVar213;
    _local_80 = auVar213;
    fVar207 = auVar213._0_4_;
    fVar167 = auVar213._4_4_;
    fVar233 = auVar213._8_4_;
    fVar242 = auVar213._12_4_;
    fVar248 = auVar178._0_4_;
    fVar249 = auVar178._4_4_;
    fVar259 = auVar178._8_4_;
    auVar104._8_4_ = auVar211._8_4_;
    auVar104._0_8_ = auVar211._0_8_;
    auVar104._12_4_ = auVar211._12_4_;
    auVar213 = vshufps_avx(auVar104,auVar104,0);
    register0x000015d0 = auVar213;
    _local_460 = auVar213;
    fVar258 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar126 + 0x484);
    fVar275 = *(float *)(bspline_basis0 + lVar126 + 0x488);
    fVar283 = *(float *)(bspline_basis0 + lVar126 + 0x48c);
    fVar286 = *(float *)(bspline_basis0 + lVar126 + 0x490);
    fVar288 = *(float *)(bspline_basis0 + lVar126 + 0x494);
    fVar303 = *(float *)(bspline_basis0 + lVar126 + 0x498);
    fVar203 = *(float *)(bspline_basis0 + lVar126 + 0x49c);
    auVar115 = *(undefined1 (*) [28])(bspline_basis0 + lVar126 + 0x484);
    fVar291 = auVar213._0_4_;
    fVar292 = auVar213._4_4_;
    fVar331 = auVar213._8_4_;
    fVar332 = auVar213._12_4_;
    auVar213 = vshufps_avx(auVar104,auVar104,0x55);
    register0x00001210 = auVar213;
    _local_700 = auVar213;
    fVar128 = auVar213._0_4_;
    fVar142 = auVar213._4_4_;
    fVar145 = auVar213._8_4_;
    fVar147 = auVar213._12_4_;
    auVar213 = vpermilps_avx(_local_6e0,0xff);
    register0x00001590 = auVar213;
    _local_a0 = auVar213;
    fVar284 = auVar213._0_4_;
    fVar287 = auVar213._4_4_;
    fVar289 = auVar213._8_4_;
    fVar290 = auVar213._12_4_;
    fVar231 = fVar202 + 0.0 + 0.0;
    auVar213 = vshufps_avx(auVar210,auVar210,0);
    register0x00001390 = auVar213;
    _local_140 = auVar213;
    fVar305 = *(float *)(bspline_basis0 + lVar126);
    fVar205 = *(float *)(bspline_basis0 + lVar126 + 4);
    fVar307 = *(float *)(bspline_basis0 + lVar126 + 8);
    fVar230 = *(float *)(bspline_basis0 + lVar126 + 0xc);
    fVar308 = *(float *)(bspline_basis0 + lVar126 + 0x10);
    fVar271 = *(float *)(bspline_basis0 + lVar126 + 0x14);
    fVar310 = *(float *)(bspline_basis0 + lVar126 + 0x18);
    fVar232 = auVar213._0_4_;
    fVar241 = auVar213._4_4_;
    fVar243 = auVar213._8_4_;
    fVar245 = auVar213._12_4_;
    auVar253._0_4_ = fVar232 * fVar305 + fVar291 * fVar258 + fVar129 * fVar263 + fVar260 * fVar296;
    auVar253._4_4_ = fVar241 * fVar205 + fVar292 * fVar275 + fVar144 * fVar250 + fVar261 * fVar302;
    auVar253._8_4_ = fVar243 * fVar307 + fVar331 * fVar283 + fVar220 * fVar256 + fVar262 * fVar304;
    auVar253._12_4_ = fVar245 * fVar230 + fVar332 * fVar286 + fVar202 * fVar257 + fVar276 * fVar306;
    auVar254._16_4_ =
         fVar232 * fVar308 + fVar291 * fVar288 + fVar129 * fStack_490 + fVar260 * fVar152;
    auVar254._0_16_ = auVar253;
    auVar254._20_4_ =
         fVar241 * fVar271 + fVar292 * fVar303 + fVar144 * fStack_48c + fVar261 * fVar164;
    auVar254._24_4_ =
         fVar243 * fVar310 + fVar331 * fVar203 + fVar220 * fStack_488 + fVar262 * fVar165;
    auVar254._28_4_ = fVar245 + 0.0;
    auVar213 = vshufps_avx(auVar210,auVar210,0x55);
    auVar181._16_16_ = auVar213;
    auVar181._0_16_ = auVar213;
    fVar169 = auVar213._0_4_;
    fVar184 = auVar213._4_4_;
    fVar186 = auVar213._8_4_;
    fVar188 = auVar213._12_4_;
    auVar300._0_4_ = fVar169 * fVar305 + fVar128 * fVar258 + fVar168 * fVar263 + fVar312 * fVar296;
    auVar300._4_4_ = fVar184 * fVar205 + fVar142 * fVar275 + fVar183 * fVar250 + fVar321 * fVar302;
    auVar300._8_4_ = fVar186 * fVar307 + fVar145 * fVar283 + fVar185 * fVar256 + fVar322 * fVar304;
    auVar300._12_4_ = fVar188 * fVar230 + fVar147 * fVar286 + fVar187 * fVar257 + fVar323 * fVar306;
    auVar300._16_4_ =
         fVar169 * fVar308 + fVar128 * fVar288 + fVar168 * fStack_490 + fVar312 * fVar152;
    auVar300._20_4_ =
         fVar184 * fVar271 + fVar142 * fVar303 + fVar183 * fStack_48c + fVar321 * fVar164;
    auVar300._24_4_ =
         fVar186 * fVar310 + fVar145 * fVar203 + fVar185 * fStack_488 + fVar322 * fVar165;
    auVar300._28_4_ = fVar147 + fVar187 + 0.0 + 0.0;
    auVar213 = vpermilps_avx(_local_6d0,0xff);
    register0x00001450 = auVar213;
    _local_c0 = auVar213;
    fVar244 = auVar213._0_4_;
    fVar246 = auVar213._4_4_;
    fVar247 = auVar213._8_4_;
    local_840._0_4_ = fVar244 * fVar305 + fVar284 * fVar258 + fVar248 * fVar263 + fVar207 * fVar296;
    local_840._4_4_ = fVar246 * fVar205 + fVar287 * fVar275 + fVar249 * fVar250 + fVar167 * fVar302;
    fStack_838 = fVar247 * fVar307 + fVar289 * fVar283 + fVar259 * fVar256 + fVar233 * fVar304;
    fStack_834 = auVar213._12_4_ * fVar230 +
                 fVar290 * fVar286 + auVar178._12_4_ * fVar257 + fVar242 * fVar306;
    fStack_830 = fVar244 * fVar308 + fVar284 * fVar288 + fVar248 * fStack_490 + fVar207 * fVar152;
    fStack_82c = fVar246 * fVar271 + fVar287 * fVar303 + fVar249 * fStack_48c + fVar167 * fVar164;
    fStack_828 = fVar247 * fVar310 + fVar289 * fVar203 + fVar259 * fStack_488 + fVar233 * fVar165;
    fStack_824 = fVar231 + 0.0;
    fVar258 = *(float *)(bspline_basis1 + lVar126 + 0x908);
    fVar275 = *(float *)(bspline_basis1 + lVar126 + 0x90c);
    fVar283 = *(float *)(bspline_basis1 + lVar126 + 0x910);
    fVar286 = *(float *)(bspline_basis1 + lVar126 + 0x914);
    fVar288 = *(float *)(bspline_basis1 + lVar126 + 0x918);
    fVar303 = *(float *)(bspline_basis1 + lVar126 + 0x91c);
    fVar203 = *(float *)(bspline_basis1 + lVar126 + 0x920);
    fVar309 = *(float *)(bspline_basis1 + lVar126 + 0xd8c);
    fVar311 = *(float *)(bspline_basis1 + lVar126 + 0xd90);
    fVar272 = *(float *)(bspline_basis1 + lVar126 + 0xd94);
    fVar264 = *(float *)(bspline_basis1 + lVar126 + 0xd98);
    fVar265 = *(float *)(bspline_basis1 + lVar126 + 0xd9c);
    fVar204 = *(float *)(bspline_basis1 + lVar126 + 0xda0);
    fVar273 = *(float *)(bspline_basis1 + lVar126 + 0xda4);
    fVar269 = *(float *)(bspline_basis1 + lVar126 + 0x484);
    fVar270 = *(float *)(bspline_basis1 + lVar126 + 0x488);
    fVar206 = *(float *)(bspline_basis1 + lVar126 + 0x48c);
    fVar166 = *(float *)(bspline_basis1 + lVar126 + 0x490);
    fVar274 = *(float *)(bspline_basis1 + lVar126 + 0x494);
    fVar143 = *(float *)(bspline_basis1 + lVar126 + 0x498);
    fVar146 = *(float *)(bspline_basis1 + lVar126 + 0x49c);
    fVar148 = *(float *)(bspline_basis1 + lVar126);
    fVar149 = *(float *)(bspline_basis1 + lVar126 + 4);
    fVar150 = *(float *)(bspline_basis1 + lVar126 + 8);
    fVar151 = *(float *)(bspline_basis1 + lVar126 + 0xc);
    fVar189 = *(float *)(bspline_basis1 + lVar126 + 0x10);
    fVar200 = *(float *)(bspline_basis1 + lVar126 + 0x14);
    fVar201 = *(float *)(bspline_basis1 + lVar126 + 0x18);
    auVar214._0_4_ = fVar232 * fVar148 + fVar291 * fVar269 + fVar129 * fVar258 + fVar260 * fVar309;
    auVar214._4_4_ = fVar241 * fVar149 + fVar292 * fVar270 + fVar144 * fVar275 + fVar261 * fVar311;
    auVar214._8_4_ = fVar243 * fVar150 + fVar331 * fVar206 + fVar220 * fVar283 + fVar262 * fVar272;
    auVar214._12_4_ = fVar245 * fVar151 + fVar332 * fVar166 + fVar202 * fVar286 + fVar276 * fVar264;
    auVar214._16_4_ = fVar232 * fVar189 + fVar291 * fVar274 + fVar129 * fVar288 + fVar260 * fVar265;
    auVar214._20_4_ = fVar241 * fVar200 + fVar292 * fVar143 + fVar144 * fVar303 + fVar261 * fVar204;
    auVar214._24_4_ = fVar243 * fVar201 + fVar331 * fVar146 + fVar220 * fVar203 + fVar262 * fVar273;
    auVar214._28_4_ = fVar290 + fVar276 + fVar231 + 0.0;
    local_480._0_4_ = fVar148 * fVar169 + fVar128 * fVar269 + fVar258 * fVar168 + fVar312 * fVar309;
    local_480._4_4_ = fVar149 * fVar184 + fVar142 * fVar270 + fVar275 * fVar183 + fVar321 * fVar311;
    fStack_478 = fVar150 * fVar186 + fVar145 * fVar206 + fVar283 * fVar185 + fVar322 * fVar272;
    fStack_474 = fVar151 * fVar188 + fVar147 * fVar166 + fVar286 * fVar187 + fVar323 * fVar264;
    fStack_470 = fVar189 * fVar169 + fVar128 * fVar274 + fVar288 * fVar168 + fVar312 * fVar265;
    fStack_46c = fVar200 * fVar184 + fVar142 * fVar143 + fVar303 * fVar183 + fVar321 * fVar204;
    fStack_468 = fVar201 * fVar186 + fVar145 * fVar146 + fVar203 * fVar185 + fVar322 * fVar273;
    fStack_464 = fVar188 + fVar276 + fVar245 + 0.0;
    local_780._0_4_ = fVar284 * fVar269 + fVar248 * fVar258 + fVar207 * fVar309 + fVar244 * fVar148;
    local_780._4_4_ = fVar287 * fVar270 + fVar249 * fVar275 + fVar167 * fVar311 + fVar246 * fVar149;
    local_780._8_4_ = fVar289 * fVar206 + fVar259 * fVar283 + fVar233 * fVar272 + fVar247 * fVar150;
    local_780._12_4_ =
         fVar290 * fVar166 + auVar178._12_4_ * fVar286 + fVar242 * fVar264 +
         auVar213._12_4_ * fVar151;
    local_780._16_4_ = fVar284 * fVar274 + fVar248 * fVar288 + fVar207 * fVar265 + fVar244 * fVar189
    ;
    local_780._20_4_ = fVar287 * fVar143 + fVar249 * fVar303 + fVar167 * fVar204 + fVar246 * fVar200
    ;
    local_780._24_4_ = fVar289 * fVar146 + fVar259 * fVar203 + fVar233 * fVar273 + fVar247 * fVar201
    ;
    local_780._28_4_ = fVar276 + fVar242 + fVar245 + fVar188;
    local_340 = vsubps_avx(auVar214,auVar254);
    auVar24 = vsubps_avx(_local_480,auVar300);
    fVar296 = local_340._0_4_;
    fVar302 = local_340._4_4_;
    auVar162._4_4_ = auVar300._4_4_ * fVar302;
    auVar162._0_4_ = auVar300._0_4_ * fVar296;
    fVar304 = local_340._8_4_;
    auVar162._8_4_ = auVar300._8_4_ * fVar304;
    fVar306 = local_340._12_4_;
    auVar162._12_4_ = auVar300._12_4_ * fVar306;
    fVar152 = local_340._16_4_;
    auVar162._16_4_ = auVar300._16_4_ * fVar152;
    fVar164 = local_340._20_4_;
    auVar162._20_4_ = auVar300._20_4_ * fVar164;
    fVar165 = local_340._24_4_;
    auVar162._24_4_ = auVar300._24_4_ * fVar165;
    auVar162._28_4_ = fVar188;
    fVar231 = auVar24._0_4_;
    fVar207 = auVar24._4_4_;
    auVar25._4_4_ = fVar207 * auVar253._4_4_;
    auVar25._0_4_ = fVar231 * auVar253._0_4_;
    fVar167 = auVar24._8_4_;
    auVar25._8_4_ = fVar167 * auVar253._8_4_;
    fVar233 = auVar24._12_4_;
    auVar25._12_4_ = fVar233 * auVar253._12_4_;
    fVar242 = auVar24._16_4_;
    auVar25._16_4_ = fVar242 * auVar254._16_4_;
    fVar244 = auVar24._20_4_;
    auVar25._20_4_ = fVar244 * auVar254._20_4_;
    fVar246 = auVar24._24_4_;
    auVar25._24_4_ = fVar246 * auVar254._24_4_;
    auVar25._28_4_ = fStack_464;
    auVar25 = vsubps_avx(auVar162,auVar25);
    auVar162 = vmaxps_avx(_local_840,local_780);
    auVar32._4_4_ = auVar162._4_4_ * auVar162._4_4_ * (fVar302 * fVar302 + fVar207 * fVar207);
    auVar32._0_4_ = auVar162._0_4_ * auVar162._0_4_ * (fVar296 * fVar296 + fVar231 * fVar231);
    auVar32._8_4_ = auVar162._8_4_ * auVar162._8_4_ * (fVar304 * fVar304 + fVar167 * fVar167);
    auVar32._12_4_ = auVar162._12_4_ * auVar162._12_4_ * (fVar306 * fVar306 + fVar233 * fVar233);
    auVar32._16_4_ = auVar162._16_4_ * auVar162._16_4_ * (fVar152 * fVar152 + fVar242 * fVar242);
    auVar32._20_4_ = auVar162._20_4_ * auVar162._20_4_ * (fVar164 * fVar164 + fVar244 * fVar244);
    auVar32._24_4_ = auVar162._24_4_ * auVar162._24_4_ * (fVar165 * fVar165 + fVar246 * fVar246);
    auVar32._28_4_ = auVar214._28_4_ + fStack_464;
    auVar26._4_4_ = auVar25._4_4_ * auVar25._4_4_;
    auVar26._0_4_ = auVar25._0_4_ * auVar25._0_4_;
    auVar26._8_4_ = auVar25._8_4_ * auVar25._8_4_;
    auVar26._12_4_ = auVar25._12_4_ * auVar25._12_4_;
    auVar26._16_4_ = auVar25._16_4_ * auVar25._16_4_;
    auVar26._20_4_ = auVar25._20_4_ * auVar25._20_4_;
    auVar26._24_4_ = auVar25._24_4_ * auVar25._24_4_;
    auVar26._28_4_ = auVar25._28_4_;
    local_5f0._0_4_ = (undefined4)(int)uVar10;
    local_5f0._4_12_ = auVar253._4_12_;
    auVar162 = vcmpps_avx(auVar26,auVar32,2);
    auVar178 = vshufps_avx(local_5f0,local_5f0,0);
    auVar195._16_16_ = auVar178;
    auVar195._0_16_ = auVar178;
    auVar25 = vcmpps_avx(_DAT_01f7b060,auVar195,1);
    auVar199 = ZEXT3264(auVar25);
    auVar178 = vpermilps_avx(auVar210,0xaa);
    register0x00001450 = auVar178;
    _local_5a0 = auVar178;
    auVar105._8_4_ = auVar211._8_4_;
    auVar105._0_8_ = auVar211._0_8_;
    auVar105._12_4_ = auVar211._12_4_;
    auVar213 = vpermilps_avx(auVar105,0xaa);
    register0x00001550 = auVar213;
    _local_e0 = auVar213;
    auVar194 = vpermilps_avx(auVar212,0xaa);
    register0x00001590 = auVar194;
    _local_100 = auVar194;
    auVar16 = vpermilps_avx(auVar153,0xaa);
    auVar215._16_16_ = auVar16;
    auVar215._0_16_ = auVar16;
    auVar32 = auVar25 & auVar162;
    local_660._0_16_ = ZEXT416(uVar9);
    local_7e0 = *(uint *)(ray + k * 4 + 0x30);
    uStack_7dc = 0;
    fStack_7d8 = 0.0;
    fStack_7d4 = 0.0;
    auVar223 = ZEXT416((uint)(auVar223._0_4_ * 4.7683716e-07));
    fVar296 = fVar312;
    fVar302 = fVar321;
    fVar304 = fVar322;
    fVar306 = fVar323;
    fVar152 = fVar128;
    fVar164 = fVar142;
    fVar165 = fVar145;
    if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar32 >> 0x7f,0) == '\0') &&
          (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar32 >> 0xbf,0) == '\0') &&
        (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar32[0x1f]) {
      uVar123 = 0;
      auVar320 = ZEXT3264(local_7a0);
      auVar163 = ZEXT1664(auVar223);
    }
    else {
      local_320 = vandps_avx(auVar162,auVar25);
      fVar244 = auVar178._0_4_;
      fVar246 = auVar178._4_4_;
      fVar247 = auVar178._8_4_;
      fVar248 = auVar178._12_4_;
      fVar249 = auVar213._0_4_;
      fVar259 = auVar213._4_4_;
      fVar284 = auVar213._8_4_;
      fVar287 = auVar213._12_4_;
      fVar289 = auVar194._0_4_;
      fVar290 = auVar194._4_4_;
      fVar327 = auVar194._8_4_;
      fVar328 = auVar194._12_4_;
      fVar207 = auVar16._0_4_;
      fVar167 = auVar16._4_4_;
      fVar233 = auVar16._8_4_;
      fVar242 = auVar16._12_4_;
      fVar231 = auVar25._28_4_ + *(float *)(bspline_basis1 + lVar126 + 0x924) + 0.0;
      local_4e0 = fVar244 * fVar148 + fVar249 * fVar269 + fVar289 * fVar258 + fVar207 * fVar309;
      fStack_4dc = fVar246 * fVar149 + fVar259 * fVar270 + fVar290 * fVar275 + fVar167 * fVar311;
      fStack_4d8 = fVar247 * fVar150 + fVar284 * fVar206 + fVar327 * fVar283 + fVar233 * fVar272;
      fStack_4d4 = fVar248 * fVar151 + fVar287 * fVar166 + fVar328 * fVar286 + fVar242 * fVar264;
      fStack_4d0 = fVar244 * fVar189 + fVar249 * fVar274 + fVar289 * fVar288 + fVar207 * fVar265;
      fStack_4cc = fVar246 * fVar200 + fVar259 * fVar143 + fVar290 * fVar303 + fVar167 * fVar204;
      fStack_4c8 = fVar247 * fVar201 + fVar284 * fVar146 + fVar327 * fVar203 + fVar233 * fVar273;
      fStack_4c4 = local_320._28_4_ + fVar231;
      local_580._0_4_ = auVar115._0_4_;
      local_580._4_4_ = auVar115._4_4_;
      fStack_578 = auVar115._8_4_;
      fStack_574 = auVar115._12_4_;
      fStack_570 = auVar115._16_4_;
      fStack_56c = auVar115._20_4_;
      fStack_568 = auVar115._24_4_;
      local_5c0._0_4_ = auVar114._0_4_;
      local_5c0._4_4_ = auVar114._4_4_;
      fStack_5b8 = auVar114._8_4_;
      fStack_5b4 = auVar114._12_4_;
      fStack_5b0 = auVar114._16_4_;
      fStack_5ac = auVar114._20_4_;
      fStack_5a8 = auVar114._24_4_;
      local_4a0 = fVar244 * fVar305 +
                  fVar249 * (float)local_580._0_4_ +
                  fVar289 * fVar263 + fVar207 * (float)local_5c0._0_4_;
      fStack_49c = fVar246 * fVar205 +
                   fVar259 * (float)local_580._4_4_ +
                   fVar290 * fVar250 + fVar167 * (float)local_5c0._4_4_;
      fStack_498 = fVar247 * fVar307 +
                   fVar284 * fStack_578 + fVar327 * fVar256 + fVar233 * fStack_5b8;
      fStack_494 = fVar248 * fVar230 +
                   fVar287 * fStack_574 + fVar328 * fVar257 + fVar242 * fStack_5b4;
      fStack_490 = fVar244 * fVar308 +
                   fVar249 * fStack_570 + fVar289 * fStack_490 + fVar207 * fStack_5b0;
      fStack_48c = fVar246 * fVar271 +
                   fVar259 * fStack_56c + fVar290 * fStack_48c + fVar167 * fStack_5ac;
      fStack_488 = fVar247 * fVar310 +
                   fVar284 * fStack_568 + fVar327 * fStack_488 + fVar233 * fStack_5a8;
      fStack_484 = fStack_4c4 + fVar231 + local_320._28_4_ + auVar25._28_4_;
      fVar263 = *(float *)(bspline_basis0 + lVar126 + 0x1210);
      fVar250 = *(float *)(bspline_basis0 + lVar126 + 0x1214);
      fVar256 = *(float *)(bspline_basis0 + lVar126 + 0x1218);
      fVar257 = *(float *)(bspline_basis0 + lVar126 + 0x121c);
      fVar258 = *(float *)(bspline_basis0 + lVar126 + 0x1220);
      fVar275 = *(float *)(bspline_basis0 + lVar126 + 0x1224);
      fVar283 = *(float *)(bspline_basis0 + lVar126 + 0x1228);
      fVar286 = *(float *)(bspline_basis0 + lVar126 + 0x1694);
      fVar288 = *(float *)(bspline_basis0 + lVar126 + 0x1698);
      fVar303 = *(float *)(bspline_basis0 + lVar126 + 0x169c);
      fVar203 = *(float *)(bspline_basis0 + lVar126 + 0x16a0);
      fVar305 = *(float *)(bspline_basis0 + lVar126 + 0x16a4);
      fVar205 = *(float *)(bspline_basis0 + lVar126 + 0x16a8);
      fVar307 = *(float *)(bspline_basis0 + lVar126 + 0x16ac);
      fVar230 = *(float *)(bspline_basis0 + lVar126 + 0x1b18);
      fVar308 = *(float *)(bspline_basis0 + lVar126 + 0x1b1c);
      fVar271 = *(float *)(bspline_basis0 + lVar126 + 0x1b20);
      fVar310 = *(float *)(bspline_basis0 + lVar126 + 0x1b24);
      fVar309 = *(float *)(bspline_basis0 + lVar126 + 0x1b28);
      fVar311 = *(float *)(bspline_basis0 + lVar126 + 0x1b2c);
      fVar272 = *(float *)(bspline_basis0 + lVar126 + 0x1b30);
      fVar264 = *(float *)(bspline_basis0 + lVar126 + 0x1f9c);
      fVar265 = *(float *)(bspline_basis0 + lVar126 + 0x1fa0);
      fVar204 = *(float *)(bspline_basis0 + lVar126 + 0x1fa4);
      fVar273 = *(float *)(bspline_basis0 + lVar126 + 0x1fa8);
      fVar269 = *(float *)(bspline_basis0 + lVar126 + 0x1fac);
      fVar270 = *(float *)(bspline_basis0 + lVar126 + 0x1fb0);
      fVar206 = *(float *)(bspline_basis0 + lVar126 + 0x1fb4);
      local_760._0_16_ = auVar223;
      fVar166 = *(float *)(bspline_basis0 + lVar126 + 0x1b34) +
                *(float *)(bspline_basis0 + lVar126 + 0x1fb8);
      fVar274 = *(float *)(bspline_basis0 + lVar126 + 0x16b0) + fVar166;
      local_580._4_4_ =
           fVar241 * fVar250 + fVar292 * fVar288 + fVar144 * fVar308 + fVar261 * fVar265;
      local_580._0_4_ =
           fVar232 * fVar263 + fVar291 * fVar286 + fVar129 * fVar230 + fVar260 * fVar264;
      fStack_578 = fVar243 * fVar256 + fVar331 * fVar303 + fVar220 * fVar271 + fVar262 * fVar204;
      fStack_574 = fVar245 * fVar257 + fVar332 * fVar203 + fVar202 * fVar310 + fVar276 * fVar273;
      fStack_570 = fVar232 * fVar258 + fVar291 * fVar305 + fVar129 * fVar309 + fVar260 * fVar269;
      fStack_56c = fVar241 * fVar275 + fVar292 * fVar205 + fVar144 * fVar311 + fVar261 * fVar270;
      fStack_568 = fVar243 * fVar283 + fVar331 * fVar307 + fVar220 * fVar272 + fVar262 * fVar206;
      fStack_564 = *(float *)(bspline_basis0 + lVar126 + 0x16b0) +
                   *(float *)(bspline_basis0 + lVar126 + 0x1fb8) +
                   fVar248 + *(float *)(bspline_basis1 + lVar126 + 0x4a0);
      auVar236._0_4_ = fVar169 * fVar263 + fVar168 * fVar230 + fVar312 * fVar264 + fVar128 * fVar286
      ;
      auVar236._4_4_ = fVar184 * fVar250 + fVar183 * fVar308 + fVar321 * fVar265 + fVar142 * fVar288
      ;
      auVar236._8_4_ = fVar186 * fVar256 + fVar185 * fVar271 + fVar322 * fVar204 + fVar145 * fVar303
      ;
      auVar236._12_4_ =
           fVar188 * fVar257 + fVar187 * fVar310 + fVar323 * fVar273 + fVar147 * fVar203;
      auVar236._16_4_ =
           fVar169 * fVar258 + fVar168 * fVar309 + fVar312 * fVar269 + fVar128 * fVar305;
      auVar236._20_4_ =
           fVar184 * fVar275 + fVar183 * fVar311 + fVar321 * fVar270 + fVar142 * fVar205;
      auVar236._24_4_ =
           fVar186 * fVar283 + fVar185 * fVar272 + fVar322 * fVar206 + fVar145 * fVar307;
      auVar236._28_4_ =
           fVar166 + fVar248 + *(float *)(bspline_basis1 + lVar126 + 0x1c) +
                     fVar248 + *(float *)(bspline_basis1 + lVar126 + 0x4a0);
      local_4c0 = fVar249 * fVar286 + fVar289 * fVar230 + fVar207 * fVar264 + fVar244 * fVar263;
      fStack_4bc = fVar259 * fVar288 + fVar290 * fVar308 + fVar167 * fVar265 + fVar246 * fVar250;
      fStack_4b8 = fVar284 * fVar303 + fVar327 * fVar271 + fVar233 * fVar204 + fVar247 * fVar256;
      fStack_4b4 = fVar287 * fVar203 + fVar328 * fVar310 + fVar242 * fVar273 + fVar248 * fVar257;
      fStack_4b0 = fVar249 * fVar305 + fVar289 * fVar309 + fVar207 * fVar269 + fVar244 * fVar258;
      fStack_4ac = fVar259 * fVar205 + fVar290 * fVar311 + fVar167 * fVar270 + fVar246 * fVar275;
      fStack_4a8 = fVar284 * fVar307 + fVar327 * fVar272 + fVar233 * fVar206 + fVar247 * fVar283;
      fStack_4a4 = fVar274 + *(float *)(bspline_basis0 + lVar126 + 0x122c);
      fVar263 = *(float *)(bspline_basis1 + lVar126 + 0x1b18);
      fVar250 = *(float *)(bspline_basis1 + lVar126 + 0x1b1c);
      fVar256 = *(float *)(bspline_basis1 + lVar126 + 0x1b20);
      fVar257 = *(float *)(bspline_basis1 + lVar126 + 0x1b24);
      fVar258 = *(float *)(bspline_basis1 + lVar126 + 0x1b28);
      fVar275 = *(float *)(bspline_basis1 + lVar126 + 0x1b2c);
      fVar283 = *(float *)(bspline_basis1 + lVar126 + 0x1b30);
      fVar286 = *(float *)(bspline_basis1 + lVar126 + 0x1f9c);
      fVar288 = *(float *)(bspline_basis1 + lVar126 + 0x1fa0);
      fVar303 = *(float *)(bspline_basis1 + lVar126 + 0x1fa4);
      fVar203 = *(float *)(bspline_basis1 + lVar126 + 0x1fa8);
      fVar305 = *(float *)(bspline_basis1 + lVar126 + 0x1fac);
      fVar205 = *(float *)(bspline_basis1 + lVar126 + 0x1fb0);
      fVar307 = *(float *)(bspline_basis1 + lVar126 + 0x1fb4);
      fVar230 = *(float *)(bspline_basis1 + lVar126 + 0x1694);
      fVar308 = *(float *)(bspline_basis1 + lVar126 + 0x1698);
      fVar271 = *(float *)(bspline_basis1 + lVar126 + 0x169c);
      fVar310 = *(float *)(bspline_basis1 + lVar126 + 0x16a0);
      fVar309 = *(float *)(bspline_basis1 + lVar126 + 0x16a4);
      fVar311 = *(float *)(bspline_basis1 + lVar126 + 0x16a8);
      fVar272 = *(float *)(bspline_basis1 + lVar126 + 0x16ac);
      fVar264 = *(float *)(bspline_basis1 + lVar126 + 0x1210);
      fVar265 = *(float *)(bspline_basis1 + lVar126 + 0x1214);
      fVar204 = *(float *)(bspline_basis1 + lVar126 + 0x1218);
      fVar273 = *(float *)(bspline_basis1 + lVar126 + 0x121c);
      fVar269 = *(float *)(bspline_basis1 + lVar126 + 0x1220);
      fVar270 = *(float *)(bspline_basis1 + lVar126 + 0x1224);
      fVar206 = *(float *)(bspline_basis1 + lVar126 + 0x1228);
      auVar267._0_4_ = fVar232 * fVar264 + fVar291 * fVar230 + fVar129 * fVar263 + fVar260 * fVar286
      ;
      auVar267._4_4_ = fVar241 * fVar265 + fVar292 * fVar308 + fVar144 * fVar250 + fVar261 * fVar288
      ;
      auVar267._8_4_ = fVar243 * fVar204 + fVar331 * fVar271 + fVar220 * fVar256 + fVar262 * fVar303
      ;
      auVar267._12_4_ =
           fVar245 * fVar273 + fVar332 * fVar310 + fVar202 * fVar257 + fVar276 * fVar203;
      auVar267._16_4_ =
           fVar232 * fVar269 + fVar291 * fVar309 + fVar129 * fVar258 + fVar260 * fVar305;
      auVar267._20_4_ =
           fVar241 * fVar270 + fVar292 * fVar311 + fVar144 * fVar275 + fVar261 * fVar205;
      auVar267._24_4_ =
           fVar243 * fVar206 + fVar331 * fVar272 + fVar220 * fVar283 + fVar262 * fVar307;
      auVar267._28_4_ = fVar187 + fVar187 + fVar248 + fVar274;
      auVar279._0_4_ = fVar169 * fVar264 + fVar128 * fVar230 + fVar168 * fVar263 + fVar312 * fVar286
      ;
      auVar279._4_4_ = fVar184 * fVar265 + fVar142 * fVar308 + fVar183 * fVar250 + fVar321 * fVar288
      ;
      auVar279._8_4_ = fVar186 * fVar204 + fVar145 * fVar271 + fVar185 * fVar256 + fVar322 * fVar303
      ;
      auVar279._12_4_ =
           fVar188 * fVar273 + fVar147 * fVar310 + fVar187 * fVar257 + fVar323 * fVar203;
      auVar279._16_4_ =
           fVar169 * fVar269 + fVar128 * fVar309 + fVar168 * fVar258 + fVar312 * fVar305;
      auVar279._20_4_ =
           fVar184 * fVar270 + fVar142 * fVar311 + fVar183 * fVar275 + fVar321 * fVar205;
      auVar279._24_4_ =
           fVar186 * fVar206 + fVar145 * fVar272 + fVar185 * fVar283 + fVar322 * fVar307;
      auVar279._28_4_ = fVar187 + fVar187 + fVar187 + fVar248;
      auVar182._0_4_ = fVar244 * fVar264 + fVar249 * fVar230 + fVar289 * fVar263 + fVar286 * fVar207
      ;
      auVar182._4_4_ = fVar246 * fVar265 + fVar259 * fVar308 + fVar290 * fVar250 + fVar288 * fVar167
      ;
      auVar182._8_4_ = fVar247 * fVar204 + fVar284 * fVar271 + fVar327 * fVar256 + fVar303 * fVar233
      ;
      auVar182._12_4_ =
           fVar248 * fVar273 + fVar287 * fVar310 + fVar328 * fVar257 + fVar203 * fVar242;
      auVar182._16_4_ =
           fVar244 * fVar269 + fVar249 * fVar309 + fVar289 * fVar258 + fVar305 * fVar207;
      auVar182._20_4_ =
           fVar246 * fVar270 + fVar259 * fVar311 + fVar290 * fVar275 + fVar205 * fVar167;
      auVar182._24_4_ =
           fVar247 * fVar206 + fVar284 * fVar272 + fVar327 * fVar283 + fVar307 * fVar233;
      auVar182._28_4_ =
           *(float *)(bspline_basis1 + lVar126 + 0x122c) +
           *(float *)(bspline_basis1 + lVar126 + 0x16b0) +
           *(float *)(bspline_basis1 + lVar126 + 0x1b34) +
           *(float *)(bspline_basis1 + lVar126 + 0x1fb8);
      auVar216._8_4_ = 0x7fffffff;
      auVar216._0_8_ = 0x7fffffff7fffffff;
      auVar216._12_4_ = 0x7fffffff;
      auVar216._16_4_ = 0x7fffffff;
      auVar216._20_4_ = 0x7fffffff;
      auVar216._24_4_ = 0x7fffffff;
      auVar216._28_4_ = 0x7fffffff;
      auVar162 = vandps_avx(_local_580,auVar216);
      auVar25 = vandps_avx(auVar236,auVar216);
      auVar25 = vmaxps_avx(auVar162,auVar25);
      auVar110._4_4_ = fStack_4bc;
      auVar110._0_4_ = local_4c0;
      auVar110._8_4_ = fStack_4b8;
      auVar110._12_4_ = fStack_4b4;
      auVar110._16_4_ = fStack_4b0;
      auVar110._20_4_ = fStack_4ac;
      auVar110._24_4_ = fStack_4a8;
      auVar110._28_4_ = fStack_4a4;
      auVar162 = vandps_avx(auVar216,auVar110);
      auVar162 = vmaxps_avx(auVar25,auVar162);
      auVar178 = vpermilps_avx(auVar223,0);
      auVar237._16_16_ = auVar178;
      auVar237._0_16_ = auVar178;
      auVar162 = vcmpps_avx(auVar162,auVar237,1);
      auVar32 = vblendvps_avx(_local_580,local_340,auVar162);
      auVar26 = vblendvps_avx(auVar236,auVar24,auVar162);
      auVar162 = vandps_avx(auVar267,auVar216);
      auVar25 = vandps_avx(auVar279,auVar216);
      auVar195 = vmaxps_avx(auVar162,auVar25);
      auVar162 = vandps_avx(auVar182,auVar216);
      auVar162 = vmaxps_avx(auVar195,auVar162);
      auVar195 = vcmpps_avx(auVar162,auVar237,1);
      auVar162 = vblendvps_avx(auVar267,local_340,auVar195);
      auVar24 = vblendvps_avx(auVar279,auVar24,auVar195);
      fVar274 = auVar32._0_4_;
      fVar143 = auVar32._4_4_;
      fVar146 = auVar32._8_4_;
      fVar148 = auVar32._12_4_;
      fVar149 = auVar32._16_4_;
      fVar150 = auVar32._20_4_;
      fVar151 = auVar32._24_4_;
      fVar189 = auVar162._0_4_;
      fVar200 = auVar162._4_4_;
      fVar201 = auVar162._8_4_;
      fVar168 = auVar162._12_4_;
      fVar183 = auVar162._16_4_;
      fVar185 = auVar162._20_4_;
      fVar187 = auVar162._24_4_;
      fVar129 = -auVar162._28_4_;
      fVar263 = auVar26._0_4_;
      fVar258 = auVar26._4_4_;
      fVar288 = auVar26._8_4_;
      fVar205 = auVar26._12_4_;
      fVar271 = auVar26._16_4_;
      fVar272 = auVar26._20_4_;
      fVar273 = auVar26._24_4_;
      auVar135._0_4_ = fVar263 * fVar263 + fVar274 * fVar274;
      auVar135._4_4_ = fVar258 * fVar258 + fVar143 * fVar143;
      auVar135._8_4_ = fVar288 * fVar288 + fVar146 * fVar146;
      auVar135._12_4_ = fVar205 * fVar205 + fVar148 * fVar148;
      auVar135._16_4_ = fVar271 * fVar271 + fVar149 * fVar149;
      auVar135._20_4_ = fVar272 * fVar272 + fVar150 * fVar150;
      auVar135._24_4_ = fVar273 * fVar273 + fVar151 * fVar151;
      auVar135._28_4_ = auVar279._28_4_ + auVar32._28_4_;
      auVar32 = vrsqrtps_avx(auVar135);
      fVar250 = auVar32._0_4_;
      fVar256 = auVar32._4_4_;
      auVar14._4_4_ = fVar256 * 1.5;
      auVar14._0_4_ = fVar250 * 1.5;
      fVar257 = auVar32._8_4_;
      auVar14._8_4_ = fVar257 * 1.5;
      fVar275 = auVar32._12_4_;
      auVar14._12_4_ = fVar275 * 1.5;
      fVar283 = auVar32._16_4_;
      auVar14._16_4_ = fVar283 * 1.5;
      fVar286 = auVar32._20_4_;
      auVar14._20_4_ = fVar286 * 1.5;
      fVar303 = auVar32._24_4_;
      fVar166 = auVar25._28_4_;
      auVar14._24_4_ = fVar303 * 1.5;
      auVar14._28_4_ = fVar166;
      auVar15._4_4_ = fVar256 * fVar256 * fVar256 * auVar135._4_4_ * 0.5;
      auVar15._0_4_ = fVar250 * fVar250 * fVar250 * auVar135._0_4_ * 0.5;
      auVar15._8_4_ = fVar257 * fVar257 * fVar257 * auVar135._8_4_ * 0.5;
      auVar15._12_4_ = fVar275 * fVar275 * fVar275 * auVar135._12_4_ * 0.5;
      auVar15._16_4_ = fVar283 * fVar283 * fVar283 * auVar135._16_4_ * 0.5;
      auVar15._20_4_ = fVar286 * fVar286 * fVar286 * auVar135._20_4_ * 0.5;
      auVar15._24_4_ = fVar303 * fVar303 * fVar303 * auVar135._24_4_ * 0.5;
      auVar15._28_4_ = auVar135._28_4_;
      auVar25 = vsubps_avx(auVar14,auVar15);
      fVar250 = auVar25._0_4_;
      fVar275 = auVar25._4_4_;
      fVar303 = auVar25._8_4_;
      fVar307 = auVar25._12_4_;
      fVar310 = auVar25._16_4_;
      fVar264 = auVar25._20_4_;
      fVar269 = auVar25._24_4_;
      fVar256 = auVar24._0_4_;
      fVar283 = auVar24._4_4_;
      fVar203 = auVar24._8_4_;
      fVar230 = auVar24._12_4_;
      fVar309 = auVar24._16_4_;
      fVar265 = auVar24._20_4_;
      fVar270 = auVar24._24_4_;
      auVar136._0_4_ = fVar256 * fVar256 + fVar189 * fVar189;
      auVar136._4_4_ = fVar283 * fVar283 + fVar200 * fVar200;
      auVar136._8_4_ = fVar203 * fVar203 + fVar201 * fVar201;
      auVar136._12_4_ = fVar230 * fVar230 + fVar168 * fVar168;
      auVar136._16_4_ = fVar309 * fVar309 + fVar183 * fVar183;
      auVar136._20_4_ = fVar265 * fVar265 + fVar185 * fVar185;
      auVar136._24_4_ = fVar270 * fVar270 + fVar187 * fVar187;
      auVar136._28_4_ = auVar162._28_4_ + auVar25._28_4_;
      auVar162 = vrsqrtps_avx(auVar136);
      fVar257 = auVar162._0_4_;
      fVar286 = auVar162._4_4_;
      auVar27._4_4_ = fVar286 * 1.5;
      auVar27._0_4_ = fVar257 * 1.5;
      fVar305 = auVar162._8_4_;
      auVar27._8_4_ = fVar305 * 1.5;
      fVar308 = auVar162._12_4_;
      auVar27._12_4_ = fVar308 * 1.5;
      fVar311 = auVar162._16_4_;
      auVar27._16_4_ = fVar311 * 1.5;
      fVar204 = auVar162._20_4_;
      auVar27._20_4_ = fVar204 * 1.5;
      fVar206 = auVar162._24_4_;
      auVar27._24_4_ = fVar206 * 1.5;
      auVar27._28_4_ = fVar166;
      auVar28._4_4_ = fVar286 * fVar286 * fVar286 * auVar136._4_4_ * 0.5;
      auVar28._0_4_ = fVar257 * fVar257 * fVar257 * auVar136._0_4_ * 0.5;
      auVar28._8_4_ = fVar305 * fVar305 * fVar305 * auVar136._8_4_ * 0.5;
      auVar28._12_4_ = fVar308 * fVar308 * fVar308 * auVar136._12_4_ * 0.5;
      auVar28._16_4_ = fVar311 * fVar311 * fVar311 * auVar136._16_4_ * 0.5;
      auVar28._20_4_ = fVar204 * fVar204 * fVar204 * auVar136._20_4_ * 0.5;
      auVar28._24_4_ = fVar206 * fVar206 * fVar206 * auVar136._24_4_ * 0.5;
      auVar28._28_4_ = auVar136._28_4_;
      auVar162 = vsubps_avx(auVar27,auVar28);
      fVar257 = auVar162._0_4_;
      fVar286 = auVar162._4_4_;
      fVar305 = auVar162._8_4_;
      fVar308 = auVar162._12_4_;
      fVar311 = auVar162._16_4_;
      fVar204 = auVar162._20_4_;
      fVar206 = auVar162._24_4_;
      fVar263 = (float)local_840._0_4_ * fVar263 * fVar250;
      fVar258 = (float)local_840._4_4_ * fVar258 * fVar275;
      auVar29._4_4_ = fVar258;
      auVar29._0_4_ = fVar263;
      fVar288 = fStack_838 * fVar288 * fVar303;
      auVar29._8_4_ = fVar288;
      fVar205 = fStack_834 * fVar205 * fVar307;
      auVar29._12_4_ = fVar205;
      fVar271 = fStack_830 * fVar271 * fVar310;
      auVar29._16_4_ = fVar271;
      fVar272 = fStack_82c * fVar272 * fVar264;
      auVar29._20_4_ = fVar272;
      fVar273 = fStack_828 * fVar273 * fVar269;
      auVar29._24_4_ = fVar273;
      auVar29._28_4_ = fVar129;
      local_5c0._4_4_ = fVar258 + auVar253._4_4_;
      local_5c0._0_4_ = fVar263 + auVar253._0_4_;
      fStack_5b8 = fVar288 + auVar253._8_4_;
      fStack_5b4 = fVar205 + auVar253._12_4_;
      fStack_5b0 = fVar271 + auVar254._16_4_;
      fStack_5ac = fVar272 + auVar254._20_4_;
      fStack_5a8 = fVar273 + auVar254._24_4_;
      fStack_5a4 = fVar129 + auVar254._28_4_;
      fVar263 = (float)local_840._0_4_ * fVar250 * -fVar274;
      fVar258 = (float)local_840._4_4_ * fVar275 * -fVar143;
      auVar31._4_4_ = fVar258;
      auVar31._0_4_ = fVar263;
      fVar288 = fStack_838 * fVar303 * -fVar146;
      auVar31._8_4_ = fVar288;
      fVar205 = fStack_834 * fVar307 * -fVar148;
      auVar31._12_4_ = fVar205;
      fVar271 = fStack_830 * fVar310 * -fVar149;
      auVar31._16_4_ = fVar271;
      fVar272 = fStack_82c * fVar264 * -fVar150;
      auVar31._20_4_ = fVar272;
      fVar273 = fStack_828 * fVar269 * -fVar151;
      auVar31._24_4_ = fVar273;
      auVar31._28_4_ = fVar166;
      local_580._4_4_ = fVar258 + auVar300._4_4_;
      local_580._0_4_ = fVar263 + auVar300._0_4_;
      fStack_578 = fVar288 + auVar300._8_4_;
      fStack_574 = fVar205 + auVar300._12_4_;
      fStack_570 = fVar271 + auVar300._16_4_;
      fStack_56c = fVar272 + auVar300._20_4_;
      fStack_568 = fVar273 + auVar300._24_4_;
      fStack_564 = fVar166 + auVar300._28_4_;
      fVar263 = fVar250 * 0.0 * (float)local_840._0_4_;
      fVar250 = fVar275 * 0.0 * (float)local_840._4_4_;
      auVar30._4_4_ = fVar250;
      auVar30._0_4_ = fVar263;
      fVar258 = fVar303 * 0.0 * fStack_838;
      auVar30._8_4_ = fVar258;
      fVar275 = fVar307 * 0.0 * fStack_834;
      auVar30._12_4_ = fVar275;
      fVar288 = fVar310 * 0.0 * fStack_830;
      auVar30._16_4_ = fVar288;
      fVar303 = fVar264 * 0.0 * fStack_82c;
      auVar30._20_4_ = fVar303;
      fVar205 = fVar269 * 0.0 * fStack_828;
      auVar30._24_4_ = fVar205;
      auVar30._28_4_ = fVar323;
      auVar113._4_4_ = fStack_49c;
      auVar113._0_4_ = local_4a0;
      auVar113._8_4_ = fStack_498;
      auVar113._12_4_ = fStack_494;
      auVar113._16_4_ = fStack_490;
      auVar113._20_4_ = fStack_48c;
      auVar113._24_4_ = fStack_488;
      auVar113._28_4_ = fStack_484;
      auVar238._0_4_ = fVar263 + local_4a0;
      auVar238._4_4_ = fVar250 + fStack_49c;
      auVar238._8_4_ = fVar258 + fStack_498;
      auVar238._12_4_ = fVar275 + fStack_494;
      auVar238._16_4_ = fVar288 + fStack_490;
      auVar238._20_4_ = fVar303 + fStack_48c;
      auVar238._24_4_ = fVar205 + fStack_488;
      auVar238._28_4_ = fVar323 + fStack_484;
      fVar263 = (float)local_780._0_4_ * fVar256 * fVar257;
      fVar250 = local_780._4_4_ * fVar283 * fVar286;
      auVar33._4_4_ = fVar250;
      auVar33._0_4_ = fVar263;
      fVar256 = local_780._8_4_ * fVar203 * fVar305;
      auVar33._8_4_ = fVar256;
      fVar258 = local_780._12_4_ * fVar230 * fVar308;
      auVar33._12_4_ = fVar258;
      fVar275 = local_780._16_4_ * fVar309 * fVar311;
      auVar33._16_4_ = fVar275;
      fVar283 = local_780._20_4_ * fVar265 * fVar204;
      auVar33._20_4_ = fVar283;
      fVar288 = local_780._24_4_ * fVar270 * fVar206;
      auVar33._24_4_ = fVar288;
      auVar33._28_4_ = auVar24._28_4_;
      auVar15 = vsubps_avx(auVar254,auVar29);
      auVar280._0_4_ = auVar214._0_4_ + fVar263;
      auVar280._4_4_ = auVar214._4_4_ + fVar250;
      auVar280._8_4_ = auVar214._8_4_ + fVar256;
      auVar280._12_4_ = auVar214._12_4_ + fVar258;
      auVar280._16_4_ = auVar214._16_4_ + fVar275;
      auVar280._20_4_ = auVar214._20_4_ + fVar283;
      auVar280._24_4_ = auVar214._24_4_ + fVar288;
      auVar280._28_4_ = auVar214._28_4_ + auVar24._28_4_;
      fVar263 = (float)local_780._0_4_ * -fVar189 * fVar257;
      fVar250 = local_780._4_4_ * -fVar200 * fVar286;
      auVar24._4_4_ = fVar250;
      auVar24._0_4_ = fVar263;
      fVar256 = local_780._8_4_ * -fVar201 * fVar305;
      auVar24._8_4_ = fVar256;
      fVar258 = local_780._12_4_ * -fVar168 * fVar308;
      auVar24._12_4_ = fVar258;
      fVar275 = local_780._16_4_ * -fVar183 * fVar311;
      auVar24._16_4_ = fVar275;
      fVar283 = local_780._20_4_ * -fVar185 * fVar204;
      auVar24._20_4_ = fVar283;
      fVar288 = local_780._24_4_ * -fVar187 * fVar206;
      auVar24._24_4_ = fVar288;
      auVar24._28_4_ = fVar287;
      auVar300 = vsubps_avx(auVar300,auVar31);
      auVar294._0_4_ = fVar263 + (float)local_480._0_4_;
      auVar294._4_4_ = fVar250 + (float)local_480._4_4_;
      auVar294._8_4_ = fVar256 + fStack_478;
      auVar294._12_4_ = fVar258 + fStack_474;
      auVar294._16_4_ = fVar275 + fStack_470;
      auVar294._20_4_ = fVar283 + fStack_46c;
      auVar294._24_4_ = fVar288 + fStack_468;
      auVar294._28_4_ = fVar287 + fStack_464;
      fVar263 = fVar257 * 0.0 * (float)local_780._0_4_;
      fVar250 = fVar286 * 0.0 * local_780._4_4_;
      auVar34._4_4_ = fVar250;
      auVar34._0_4_ = fVar263;
      fVar256 = fVar305 * 0.0 * local_780._8_4_;
      auVar34._8_4_ = fVar256;
      fVar257 = fVar308 * 0.0 * local_780._12_4_;
      auVar34._12_4_ = fVar257;
      fVar258 = fVar311 * 0.0 * local_780._16_4_;
      auVar34._16_4_ = fVar258;
      fVar275 = fVar204 * 0.0 * local_780._20_4_;
      auVar34._20_4_ = fVar275;
      fVar283 = fVar206 * 0.0 * local_780._24_4_;
      auVar34._24_4_ = fVar283;
      auVar34._28_4_ = 0x3f000000;
      auVar27 = vsubps_avx(auVar113,auVar30);
      auVar108._4_4_ = fStack_4dc;
      auVar108._0_4_ = local_4e0;
      auVar108._8_4_ = fStack_4d8;
      auVar108._12_4_ = fStack_4d4;
      auVar108._16_4_ = fStack_4d0;
      auVar108._20_4_ = fStack_4cc;
      auVar108._24_4_ = fStack_4c8;
      auVar108._28_4_ = fStack_4c4;
      auVar326._0_4_ = fVar263 + local_4e0;
      auVar326._4_4_ = fVar250 + fStack_4dc;
      auVar326._8_4_ = fVar256 + fStack_4d8;
      auVar326._12_4_ = fVar257 + fStack_4d4;
      auVar326._16_4_ = fVar258 + fStack_4d0;
      auVar326._20_4_ = fVar275 + fStack_4cc;
      auVar326._24_4_ = fVar283 + fStack_4c8;
      auVar326._28_4_ = fStack_4c4 + 0.5;
      auVar162 = vsubps_avx(auVar214,auVar33);
      auVar25 = vsubps_avx(_local_480,auVar24);
      auVar28 = vsubps_avx(auVar108,auVar34);
      auVar24 = vsubps_avx(auVar294,auVar300);
      auVar32 = vsubps_avx(auVar326,auVar27);
      auVar35._4_4_ = auVar27._4_4_ * auVar24._4_4_;
      auVar35._0_4_ = auVar27._0_4_ * auVar24._0_4_;
      auVar35._8_4_ = auVar27._8_4_ * auVar24._8_4_;
      auVar35._12_4_ = auVar27._12_4_ * auVar24._12_4_;
      auVar35._16_4_ = auVar27._16_4_ * auVar24._16_4_;
      auVar35._20_4_ = auVar27._20_4_ * auVar24._20_4_;
      auVar35._24_4_ = auVar27._24_4_ * auVar24._24_4_;
      auVar35._28_4_ = fVar147;
      auVar36._4_4_ = auVar300._4_4_ * auVar32._4_4_;
      auVar36._0_4_ = auVar300._0_4_ * auVar32._0_4_;
      auVar36._8_4_ = auVar300._8_4_ * auVar32._8_4_;
      auVar36._12_4_ = auVar300._12_4_ * auVar32._12_4_;
      auVar36._16_4_ = auVar300._16_4_ * auVar32._16_4_;
      auVar36._20_4_ = auVar300._20_4_ * auVar32._20_4_;
      auVar36._24_4_ = auVar300._24_4_ * auVar32._24_4_;
      auVar36._28_4_ = fStack_464;
      auVar26 = vsubps_avx(auVar36,auVar35);
      auVar37._4_4_ = auVar15._4_4_ * auVar32._4_4_;
      auVar37._0_4_ = auVar15._0_4_ * auVar32._0_4_;
      auVar37._8_4_ = auVar15._8_4_ * auVar32._8_4_;
      auVar37._12_4_ = auVar15._12_4_ * auVar32._12_4_;
      auVar37._16_4_ = auVar15._16_4_ * auVar32._16_4_;
      auVar37._20_4_ = auVar15._20_4_ * auVar32._20_4_;
      auVar37._24_4_ = auVar15._24_4_ * auVar32._24_4_;
      auVar37._28_4_ = auVar32._28_4_;
      auVar195 = vsubps_avx(auVar280,auVar15);
      auVar38._4_4_ = auVar195._4_4_ * auVar27._4_4_;
      auVar38._0_4_ = auVar195._0_4_ * auVar27._0_4_;
      auVar38._8_4_ = auVar195._8_4_ * auVar27._8_4_;
      auVar38._12_4_ = auVar195._12_4_ * auVar27._12_4_;
      auVar38._16_4_ = auVar195._16_4_ * auVar27._16_4_;
      auVar38._20_4_ = auVar195._20_4_ * auVar27._20_4_;
      auVar38._24_4_ = auVar195._24_4_ * auVar27._24_4_;
      auVar38._28_4_ = auVar214._28_4_;
      auVar214 = vsubps_avx(auVar38,auVar37);
      auVar39._4_4_ = auVar195._4_4_ * auVar300._4_4_;
      auVar39._0_4_ = auVar195._0_4_ * auVar300._0_4_;
      auVar39._8_4_ = auVar195._8_4_ * auVar300._8_4_;
      auVar39._12_4_ = auVar195._12_4_ * auVar300._12_4_;
      auVar39._16_4_ = auVar195._16_4_ * auVar300._16_4_;
      auVar39._20_4_ = auVar195._20_4_ * auVar300._20_4_;
      auVar39._24_4_ = auVar195._24_4_ * auVar300._24_4_;
      auVar39._28_4_ = auVar32._28_4_;
      auVar40._4_4_ = auVar15._4_4_ * auVar24._4_4_;
      auVar40._0_4_ = auVar15._0_4_ * auVar24._0_4_;
      auVar40._8_4_ = auVar15._8_4_ * auVar24._8_4_;
      auVar40._12_4_ = auVar15._12_4_ * auVar24._12_4_;
      auVar40._16_4_ = auVar15._16_4_ * auVar24._16_4_;
      auVar40._20_4_ = auVar15._20_4_ * auVar24._20_4_;
      auVar40._24_4_ = auVar15._24_4_ * auVar24._24_4_;
      auVar40._28_4_ = auVar24._28_4_;
      auVar24 = vsubps_avx(auVar40,auVar39);
      auVar137._0_4_ = auVar26._0_4_ * 0.0 + auVar24._0_4_ + auVar214._0_4_ * 0.0;
      auVar137._4_4_ = auVar26._4_4_ * 0.0 + auVar24._4_4_ + auVar214._4_4_ * 0.0;
      auVar137._8_4_ = auVar26._8_4_ * 0.0 + auVar24._8_4_ + auVar214._8_4_ * 0.0;
      auVar137._12_4_ = auVar26._12_4_ * 0.0 + auVar24._12_4_ + auVar214._12_4_ * 0.0;
      auVar137._16_4_ = auVar26._16_4_ * 0.0 + auVar24._16_4_ + auVar214._16_4_ * 0.0;
      auVar137._20_4_ = auVar26._20_4_ * 0.0 + auVar24._20_4_ + auVar214._20_4_ * 0.0;
      auVar137._24_4_ = auVar26._24_4_ * 0.0 + auVar24._24_4_ + auVar214._24_4_ * 0.0;
      auVar137._28_4_ = auVar24._28_4_ + auVar24._28_4_ + auVar214._28_4_;
      auVar14 = vcmpps_avx(auVar137,ZEXT432(0) << 0x20,2);
      auVar162 = vblendvps_avx(auVar162,_local_5c0,auVar14);
      auVar25 = vblendvps_avx(auVar25,_local_580,auVar14);
      auVar24 = vblendvps_avx(auVar28,auVar238,auVar14);
      auVar32 = vblendvps_avx(auVar15,auVar280,auVar14);
      auVar26 = vblendvps_avx(auVar300,auVar294,auVar14);
      auVar195 = vblendvps_avx(auVar27,auVar326,auVar14);
      auVar214 = vblendvps_avx(auVar280,auVar15,auVar14);
      auVar300 = vblendvps_avx(auVar294,auVar300,auVar14);
      _local_680 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
      _auStack_670 = auVar254._16_16_;
      auVar254 = vblendvps_avx(auVar326,auVar27,auVar14);
      auVar214 = vsubps_avx(auVar214,auVar162);
      auVar15 = vsubps_avx(auVar300,auVar25);
      auVar254 = vsubps_avx(auVar254,auVar24);
      auVar27 = vsubps_avx(auVar25,auVar26);
      fVar263 = auVar15._0_4_;
      fVar151 = auVar24._0_4_;
      fVar275 = auVar15._4_4_;
      fVar189 = auVar24._4_4_;
      auVar41._4_4_ = fVar189 * fVar275;
      auVar41._0_4_ = fVar151 * fVar263;
      fVar203 = auVar15._8_4_;
      fVar200 = auVar24._8_4_;
      auVar41._8_4_ = fVar200 * fVar203;
      fVar308 = auVar15._12_4_;
      fVar201 = auVar24._12_4_;
      auVar41._12_4_ = fVar201 * fVar308;
      fVar272 = auVar15._16_4_;
      fVar168 = auVar24._16_4_;
      auVar41._16_4_ = fVar168 * fVar272;
      fVar269 = auVar15._20_4_;
      fVar183 = auVar24._20_4_;
      auVar41._20_4_ = fVar183 * fVar269;
      fVar143 = auVar15._24_4_;
      fVar185 = auVar24._24_4_;
      auVar41._24_4_ = fVar185 * fVar143;
      auVar41._28_4_ = auVar300._28_4_;
      fVar250 = auVar25._0_4_;
      fVar241 = auVar254._0_4_;
      fVar283 = auVar25._4_4_;
      fVar243 = auVar254._4_4_;
      auVar42._4_4_ = fVar243 * fVar283;
      auVar42._0_4_ = fVar241 * fVar250;
      fVar305 = auVar25._8_4_;
      fVar245 = auVar254._8_4_;
      auVar42._8_4_ = fVar245 * fVar305;
      fVar271 = auVar25._12_4_;
      fVar207 = auVar254._12_4_;
      auVar42._12_4_ = fVar207 * fVar271;
      fVar264 = auVar25._16_4_;
      fVar167 = auVar254._16_4_;
      auVar42._16_4_ = fVar167 * fVar264;
      fVar270 = auVar25._20_4_;
      fVar233 = auVar254._20_4_;
      auVar42._20_4_ = fVar233 * fVar270;
      fVar146 = auVar25._24_4_;
      fVar242 = auVar254._24_4_;
      uVar125 = auVar28._28_4_;
      auVar42._24_4_ = fVar242 * fVar146;
      auVar42._28_4_ = uVar125;
      auVar300 = vsubps_avx(auVar42,auVar41);
      fVar256 = auVar162._0_4_;
      fVar286 = auVar162._4_4_;
      auVar43._4_4_ = fVar243 * fVar286;
      auVar43._0_4_ = fVar241 * fVar256;
      fVar205 = auVar162._8_4_;
      auVar43._8_4_ = fVar245 * fVar205;
      fVar310 = auVar162._12_4_;
      auVar43._12_4_ = fVar207 * fVar310;
      fVar265 = auVar162._16_4_;
      auVar43._16_4_ = fVar167 * fVar265;
      fVar206 = auVar162._20_4_;
      auVar43._20_4_ = fVar233 * fVar206;
      fVar148 = auVar162._24_4_;
      auVar43._24_4_ = fVar242 * fVar148;
      auVar43._28_4_ = uVar125;
      fVar257 = auVar214._0_4_;
      fVar288 = auVar214._4_4_;
      auVar44._4_4_ = fVar189 * fVar288;
      auVar44._0_4_ = fVar151 * fVar257;
      fVar307 = auVar214._8_4_;
      auVar44._8_4_ = fVar200 * fVar307;
      fVar309 = auVar214._12_4_;
      auVar44._12_4_ = fVar201 * fVar309;
      fVar204 = auVar214._16_4_;
      auVar44._16_4_ = fVar168 * fVar204;
      fVar166 = auVar214._20_4_;
      auVar44._20_4_ = fVar183 * fVar166;
      fVar149 = auVar214._24_4_;
      auVar44._24_4_ = fVar185 * fVar149;
      auVar44._28_4_ = auVar326._28_4_;
      auVar28 = vsubps_avx(auVar44,auVar43);
      auVar45._4_4_ = fVar283 * fVar288;
      auVar45._0_4_ = fVar250 * fVar257;
      auVar45._8_4_ = fVar305 * fVar307;
      auVar45._12_4_ = fVar271 * fVar309;
      auVar45._16_4_ = fVar264 * fVar204;
      auVar45._20_4_ = fVar270 * fVar166;
      auVar45._24_4_ = fVar146 * fVar149;
      auVar45._28_4_ = uVar125;
      auVar329._0_4_ = fVar256 * fVar263;
      auVar329._4_4_ = fVar286 * fVar275;
      auVar329._8_4_ = fVar205 * fVar203;
      auVar329._12_4_ = fVar310 * fVar308;
      auVar329._16_4_ = fVar265 * fVar272;
      auVar329._20_4_ = fVar206 * fVar269;
      auVar329._24_4_ = fVar148 * fVar143;
      auVar329._28_4_ = 0;
      auVar29 = vsubps_avx(auVar329,auVar45);
      auVar31 = vsubps_avx(auVar24,auVar195);
      fVar258 = auVar29._28_4_ + auVar28._28_4_;
      auVar158._0_4_ = auVar29._0_4_ + auVar28._0_4_ * 0.0 + auVar300._0_4_ * 0.0;
      auVar158._4_4_ = auVar29._4_4_ + auVar28._4_4_ * 0.0 + auVar300._4_4_ * 0.0;
      auVar158._8_4_ = auVar29._8_4_ + auVar28._8_4_ * 0.0 + auVar300._8_4_ * 0.0;
      auVar158._12_4_ = auVar29._12_4_ + auVar28._12_4_ * 0.0 + auVar300._12_4_ * 0.0;
      auVar158._16_4_ = auVar29._16_4_ + auVar28._16_4_ * 0.0 + auVar300._16_4_ * 0.0;
      auVar158._20_4_ = auVar29._20_4_ + auVar28._20_4_ * 0.0 + auVar300._20_4_ * 0.0;
      auVar158._24_4_ = auVar29._24_4_ + auVar28._24_4_ * 0.0 + auVar300._24_4_ * 0.0;
      auVar158._28_4_ = fVar258 + auVar300._28_4_;
      fVar187 = auVar27._0_4_;
      fVar129 = auVar27._4_4_;
      auVar46._4_4_ = fVar129 * auVar195._4_4_;
      auVar46._0_4_ = fVar187 * auVar195._0_4_;
      fVar144 = auVar27._8_4_;
      auVar46._8_4_ = fVar144 * auVar195._8_4_;
      fVar220 = auVar27._12_4_;
      auVar46._12_4_ = fVar220 * auVar195._12_4_;
      fVar202 = auVar27._16_4_;
      auVar46._16_4_ = fVar202 * auVar195._16_4_;
      fVar231 = auVar27._20_4_;
      auVar46._20_4_ = fVar231 * auVar195._20_4_;
      fVar232 = auVar27._24_4_;
      auVar46._24_4_ = fVar232 * auVar195._24_4_;
      auVar46._28_4_ = fVar258;
      fVar258 = auVar31._0_4_;
      fVar303 = auVar31._4_4_;
      auVar47._4_4_ = auVar26._4_4_ * fVar303;
      auVar47._0_4_ = auVar26._0_4_ * fVar258;
      fVar230 = auVar31._8_4_;
      auVar47._8_4_ = auVar26._8_4_ * fVar230;
      fVar311 = auVar31._12_4_;
      auVar47._12_4_ = auVar26._12_4_ * fVar311;
      fVar273 = auVar31._16_4_;
      auVar47._16_4_ = auVar26._16_4_ * fVar273;
      fVar274 = auVar31._20_4_;
      auVar47._20_4_ = auVar26._20_4_ * fVar274;
      fVar150 = auVar31._24_4_;
      auVar47._24_4_ = auVar26._24_4_ * fVar150;
      auVar47._28_4_ = auVar29._28_4_;
      auVar27 = vsubps_avx(auVar47,auVar46);
      auVar28 = vsubps_avx(auVar162,auVar32);
      fVar244 = auVar28._0_4_;
      fVar246 = auVar28._4_4_;
      auVar48._4_4_ = fVar246 * auVar195._4_4_;
      auVar48._0_4_ = fVar244 * auVar195._0_4_;
      fVar247 = auVar28._8_4_;
      auVar48._8_4_ = fVar247 * auVar195._8_4_;
      fVar248 = auVar28._12_4_;
      auVar48._12_4_ = fVar248 * auVar195._12_4_;
      fVar249 = auVar28._16_4_;
      auVar48._16_4_ = fVar249 * auVar195._16_4_;
      fVar259 = auVar28._20_4_;
      auVar48._20_4_ = fVar259 * auVar195._20_4_;
      fVar260 = auVar28._24_4_;
      auVar48._24_4_ = fVar260 * auVar195._24_4_;
      auVar48._28_4_ = auVar195._28_4_;
      auVar49._4_4_ = auVar32._4_4_ * fVar303;
      auVar49._0_4_ = auVar32._0_4_ * fVar258;
      auVar49._8_4_ = auVar32._8_4_ * fVar230;
      auVar49._12_4_ = auVar32._12_4_ * fVar311;
      auVar49._16_4_ = auVar32._16_4_ * fVar273;
      auVar49._20_4_ = auVar32._20_4_ * fVar274;
      auVar49._24_4_ = auVar32._24_4_ * fVar150;
      auVar49._28_4_ = auVar300._28_4_;
      auVar300 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = auVar26._4_4_ * fVar246;
      auVar50._0_4_ = auVar26._0_4_ * fVar244;
      auVar50._8_4_ = auVar26._8_4_ * fVar247;
      auVar50._12_4_ = auVar26._12_4_ * fVar248;
      auVar50._16_4_ = auVar26._16_4_ * fVar249;
      auVar50._20_4_ = auVar26._20_4_ * fVar259;
      auVar50._24_4_ = auVar26._24_4_ * fVar260;
      auVar50._28_4_ = auVar195._28_4_;
      auVar51._4_4_ = auVar32._4_4_ * fVar129;
      auVar51._0_4_ = auVar32._0_4_ * fVar187;
      auVar51._8_4_ = auVar32._8_4_ * fVar144;
      auVar51._12_4_ = auVar32._12_4_ * fVar220;
      auVar51._16_4_ = auVar32._16_4_ * fVar202;
      auVar51._20_4_ = auVar32._20_4_ * fVar231;
      auVar51._24_4_ = auVar32._24_4_ * fVar232;
      auVar51._28_4_ = auVar32._28_4_;
      auVar32 = vsubps_avx(auVar51,auVar50);
      auVar217._0_4_ = auVar27._0_4_ * 0.0 + auVar32._0_4_ + auVar300._0_4_ * 0.0;
      auVar217._4_4_ = auVar27._4_4_ * 0.0 + auVar32._4_4_ + auVar300._4_4_ * 0.0;
      auVar217._8_4_ = auVar27._8_4_ * 0.0 + auVar32._8_4_ + auVar300._8_4_ * 0.0;
      auVar217._12_4_ = auVar27._12_4_ * 0.0 + auVar32._12_4_ + auVar300._12_4_ * 0.0;
      auVar217._16_4_ = auVar27._16_4_ * 0.0 + auVar32._16_4_ + auVar300._16_4_ * 0.0;
      auVar217._20_4_ = auVar27._20_4_ * 0.0 + auVar32._20_4_ + auVar300._20_4_ * 0.0;
      auVar217._24_4_ = auVar27._24_4_ * 0.0 + auVar32._24_4_ + auVar300._24_4_ * 0.0;
      auVar217._28_4_ = auVar32._28_4_ + auVar32._28_4_ + auVar300._28_4_;
      auVar32 = vmaxps_avx(auVar158,auVar217);
      auVar32 = vcmpps_avx(auVar32,ZEXT832(0) << 0x20,2);
      auVar178 = vpackssdw_avx(auVar32._0_16_,auVar32._16_16_);
      auVar178 = vpand_avx(auVar178,_local_680);
      auVar213 = vpmovsxwd_avx(auVar178);
      auVar194 = vpunpckhwd_avx(auVar178,auVar178);
      auVar196._16_16_ = auVar194;
      auVar196._0_16_ = auVar213;
      if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar196 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar196 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar196 >> 0x7f,0) == '\0') &&
            (auVar196 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar194 >> 0x3f,0) == '\0') &&
          (auVar196 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar194[0xf]
         ) {
LAB_008dd3af:
        auVar226._8_8_ = uStack_4f8;
        auVar226._0_8_ = local_500;
        auVar226._16_8_ = uStack_4f0;
        auVar226._24_8_ = uStack_4e8;
        auVar199 = ZEXT3264(auVar196);
        auVar163 = ZEXT3264(local_540);
        auVar229 = ZEXT3264(local_560);
      }
      else {
        auVar52._4_4_ = fVar303 * fVar275;
        auVar52._0_4_ = fVar258 * fVar263;
        auVar52._8_4_ = fVar230 * fVar203;
        auVar52._12_4_ = fVar311 * fVar308;
        auVar52._16_4_ = fVar273 * fVar272;
        auVar52._20_4_ = fVar274 * fVar269;
        auVar52._24_4_ = fVar150 * fVar143;
        auVar52._28_4_ = auVar194._12_4_;
        auVar316._0_4_ = fVar187 * fVar241;
        auVar316._4_4_ = fVar129 * fVar243;
        auVar316._8_4_ = fVar144 * fVar245;
        auVar316._12_4_ = fVar220 * fVar207;
        auVar316._16_4_ = fVar202 * fVar167;
        auVar316._20_4_ = fVar231 * fVar233;
        auVar316._24_4_ = fVar232 * fVar242;
        auVar316._28_4_ = 0;
        auVar32 = vsubps_avx(auVar316,auVar52);
        auVar53._4_4_ = fVar246 * fVar243;
        auVar53._0_4_ = fVar244 * fVar241;
        auVar53._8_4_ = fVar247 * fVar245;
        auVar53._12_4_ = fVar248 * fVar207;
        auVar53._16_4_ = fVar249 * fVar167;
        auVar53._20_4_ = fVar259 * fVar233;
        auVar53._24_4_ = fVar260 * fVar242;
        auVar53._28_4_ = auVar254._28_4_;
        auVar54._4_4_ = fVar303 * fVar288;
        auVar54._0_4_ = fVar258 * fVar257;
        auVar54._8_4_ = fVar230 * fVar307;
        auVar54._12_4_ = fVar311 * fVar309;
        auVar54._16_4_ = fVar273 * fVar204;
        auVar54._20_4_ = fVar274 * fVar166;
        auVar54._24_4_ = fVar150 * fVar149;
        auVar54._28_4_ = auVar31._28_4_;
        auVar195 = vsubps_avx(auVar54,auVar53);
        auVar55._4_4_ = fVar129 * fVar288;
        auVar55._0_4_ = fVar187 * fVar257;
        auVar55._8_4_ = fVar144 * fVar307;
        auVar55._12_4_ = fVar220 * fVar309;
        auVar55._16_4_ = fVar202 * fVar204;
        auVar55._20_4_ = fVar231 * fVar166;
        auVar55._24_4_ = fVar232 * fVar149;
        auVar55._28_4_ = auVar158._28_4_;
        auVar56._4_4_ = fVar246 * fVar275;
        auVar56._0_4_ = fVar244 * fVar263;
        auVar56._8_4_ = fVar247 * fVar203;
        auVar56._12_4_ = fVar248 * fVar308;
        auVar56._16_4_ = fVar249 * fVar272;
        auVar56._20_4_ = fVar259 * fVar269;
        auVar56._24_4_ = fVar260 * fVar143;
        auVar56._28_4_ = auVar15._28_4_;
        auVar254 = vsubps_avx(auVar56,auVar55);
        auVar255._0_4_ = auVar32._0_4_ * 0.0 + auVar254._0_4_ + auVar195._0_4_ * 0.0;
        auVar255._4_4_ = auVar32._4_4_ * 0.0 + auVar254._4_4_ + auVar195._4_4_ * 0.0;
        auVar255._8_4_ = auVar32._8_4_ * 0.0 + auVar254._8_4_ + auVar195._8_4_ * 0.0;
        auVar255._12_4_ = auVar32._12_4_ * 0.0 + auVar254._12_4_ + auVar195._12_4_ * 0.0;
        auVar255._16_4_ = auVar32._16_4_ * 0.0 + auVar254._16_4_ + auVar195._16_4_ * 0.0;
        auVar255._20_4_ = auVar32._20_4_ * 0.0 + auVar254._20_4_ + auVar195._20_4_ * 0.0;
        auVar255._24_4_ = auVar32._24_4_ * 0.0 + auVar254._24_4_ + auVar195._24_4_ * 0.0;
        auVar255._28_4_ = auVar15._28_4_ + auVar254._28_4_ + auVar158._28_4_;
        auVar26 = vrcpps_avx(auVar255);
        fVar263 = auVar26._0_4_;
        fVar257 = auVar26._4_4_;
        auVar57._4_4_ = auVar255._4_4_ * fVar257;
        auVar57._0_4_ = auVar255._0_4_ * fVar263;
        fVar258 = auVar26._8_4_;
        auVar57._8_4_ = auVar255._8_4_ * fVar258;
        fVar275 = auVar26._12_4_;
        auVar57._12_4_ = auVar255._12_4_ * fVar275;
        fVar288 = auVar26._16_4_;
        auVar57._16_4_ = auVar255._16_4_ * fVar288;
        fVar303 = auVar26._20_4_;
        auVar57._20_4_ = auVar255._20_4_ * fVar303;
        fVar203 = auVar26._24_4_;
        auVar57._24_4_ = auVar255._24_4_ * fVar203;
        auVar57._28_4_ = auVar31._28_4_;
        auVar317._8_4_ = 0x3f800000;
        auVar317._0_8_ = 0x3f8000003f800000;
        auVar317._12_4_ = 0x3f800000;
        auVar317._16_4_ = 0x3f800000;
        auVar317._20_4_ = 0x3f800000;
        auVar317._24_4_ = 0x3f800000;
        auVar317._28_4_ = 0x3f800000;
        auVar300 = vsubps_avx(auVar317,auVar57);
        fVar263 = auVar300._0_4_ * fVar263 + fVar263;
        fVar257 = auVar300._4_4_ * fVar257 + fVar257;
        fVar258 = auVar300._8_4_ * fVar258 + fVar258;
        fVar275 = auVar300._12_4_ * fVar275 + fVar275;
        fVar288 = auVar300._16_4_ * fVar288 + fVar288;
        fVar303 = auVar300._20_4_ * fVar303 + fVar303;
        fVar203 = auVar300._24_4_ * fVar203 + fVar203;
        auVar58._4_4_ =
             (auVar32._4_4_ * fVar286 + auVar195._4_4_ * fVar283 + auVar254._4_4_ * fVar189) *
             fVar257;
        auVar58._0_4_ =
             (auVar32._0_4_ * fVar256 + auVar195._0_4_ * fVar250 + auVar254._0_4_ * fVar151) *
             fVar263;
        auVar58._8_4_ =
             (auVar32._8_4_ * fVar205 + auVar195._8_4_ * fVar305 + auVar254._8_4_ * fVar200) *
             fVar258;
        auVar58._12_4_ =
             (auVar32._12_4_ * fVar310 + auVar195._12_4_ * fVar271 + auVar254._12_4_ * fVar201) *
             fVar275;
        auVar58._16_4_ =
             (auVar32._16_4_ * fVar265 + auVar195._16_4_ * fVar264 + auVar254._16_4_ * fVar168) *
             fVar288;
        auVar58._20_4_ =
             (auVar32._20_4_ * fVar206 + auVar195._20_4_ * fVar270 + auVar254._20_4_ * fVar183) *
             fVar303;
        auVar58._24_4_ =
             (auVar32._24_4_ * fVar148 + auVar195._24_4_ * fVar146 + auVar254._24_4_ * fVar185) *
             fVar203;
        auVar58._28_4_ = auVar162._28_4_ + auVar214._28_4_ + auVar24._28_4_;
        auVar213 = vpermilps_avx(ZEXT416(local_7e0),0);
        auVar197._16_16_ = auVar213;
        auVar197._0_16_ = auVar213;
        auVar24 = vcmpps_avx(auVar197,auVar58,2);
        uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar224._4_4_ = uVar125;
        auVar224._0_4_ = uVar125;
        auVar224._8_4_ = uVar125;
        auVar224._12_4_ = uVar125;
        auVar224._16_4_ = uVar125;
        auVar224._20_4_ = uVar125;
        auVar224._24_4_ = uVar125;
        auVar224._28_4_ = uVar125;
        auVar32 = vcmpps_avx(auVar58,auVar224,2);
        auVar24 = vandps_avx(auVar32,auVar24);
        auVar213 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
        auVar178 = vpand_avx(auVar178,auVar213);
        auVar213 = vpmovsxwd_avx(auVar178);
        auVar194 = vpshufd_avx(auVar178,0xee);
        auVar194 = vpmovsxwd_avx(auVar194);
        auVar196._16_16_ = auVar194;
        auVar196._0_16_ = auVar213;
        if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar196 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar196 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar196 >> 0x7f,0) == '\0') &&
              (auVar196 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar194 >> 0x3f,0) == '\0') &&
            (auVar196 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar194[0xf]) goto LAB_008dd3af;
        auVar24 = vcmpps_avx(ZEXT832(0) << 0x20,auVar255,4);
        auVar213 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
        auVar178 = vpand_avx(auVar178,auVar213);
        auVar213 = vpmovsxwd_avx(auVar178);
        auVar178 = vpunpckhwd_avx(auVar178,auVar178);
        auVar199 = ZEXT1664(auVar178);
        auVar239._16_16_ = auVar178;
        auVar239._0_16_ = auVar213;
        auVar226._8_8_ = uStack_4f8;
        auVar226._0_8_ = local_500;
        auVar226._16_8_ = uStack_4f0;
        auVar226._24_8_ = uStack_4e8;
        auVar163 = ZEXT3264(local_540);
        auVar229 = ZEXT3264(local_560);
        if ((((((((auVar239 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar239 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar239 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar239 >> 0x7f,0) != '\0') ||
              (auVar239 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar178 >> 0x3f,0) != '\0') ||
            (auVar239 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar178[0xf] < '\0') {
          auVar198._0_4_ = auVar158._0_4_ * fVar263;
          auVar198._4_4_ = auVar158._4_4_ * fVar257;
          auVar198._8_4_ = auVar158._8_4_ * fVar258;
          auVar198._12_4_ = auVar158._12_4_ * fVar275;
          auVar198._16_4_ = auVar158._16_4_ * fVar288;
          auVar198._20_4_ = auVar158._20_4_ * fVar303;
          auVar198._24_4_ = auVar158._24_4_ * fVar203;
          auVar198._28_4_ = 0;
          auVar59._4_4_ = auVar217._4_4_ * fVar257;
          auVar59._0_4_ = auVar217._0_4_ * fVar263;
          auVar59._8_4_ = auVar217._8_4_ * fVar258;
          auVar59._12_4_ = auVar217._12_4_ * fVar275;
          auVar59._16_4_ = auVar217._16_4_ * fVar288;
          auVar59._20_4_ = auVar217._20_4_ * fVar303;
          auVar59._24_4_ = auVar217._24_4_ * fVar203;
          auVar59._28_4_ = auVar300._28_4_ + auVar26._28_4_;
          auVar225._8_4_ = 0x3f800000;
          auVar225._0_8_ = 0x3f8000003f800000;
          auVar225._12_4_ = 0x3f800000;
          auVar225._16_4_ = 0x3f800000;
          auVar225._20_4_ = 0x3f800000;
          auVar225._24_4_ = 0x3f800000;
          auVar225._28_4_ = 0x3f800000;
          auVar24 = vsubps_avx(auVar225,auVar198);
          auVar24 = vblendvps_avx(auVar24,auVar198,auVar14);
          auVar163 = ZEXT3264(auVar24);
          auVar24 = vsubps_avx(auVar225,auVar59);
          auVar199 = ZEXT3264(auVar24);
          _local_360 = vblendvps_avx(auVar24,auVar59,auVar14);
          auVar229 = ZEXT3264(auVar58);
          auVar226 = auVar239;
        }
      }
      local_560 = auVar229._0_32_;
      local_540 = auVar163._0_32_;
      if ((((((((auVar226 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar226 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar226 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar226 >> 0x7f,0) != '\0') ||
            (auVar226 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar226 >> 0xbf,0) != '\0') ||
          (auVar226 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar226[0x1f] < '\0') {
        auVar24 = vsubps_avx(local_780,_local_840);
        local_840._0_4_ = (float)local_840._0_4_ + auVar163._0_4_ * auVar24._0_4_;
        local_840._4_4_ = (float)local_840._4_4_ + auVar163._4_4_ * auVar24._4_4_;
        fStack_838 = fStack_838 + auVar163._8_4_ * auVar24._8_4_;
        fStack_834 = fStack_834 + auVar163._12_4_ * auVar24._12_4_;
        fStack_830 = fStack_830 + auVar163._16_4_ * auVar24._16_4_;
        fStack_82c = fStack_82c + auVar163._20_4_ * auVar24._20_4_;
        fStack_828 = fStack_828 + auVar163._24_4_ * auVar24._24_4_;
        fStack_824 = fStack_824 + auVar24._28_4_;
        fVar263 = *(float *)((long)local_7f0->ray_space + k * 4 + -0x10);
        auVar60._4_4_ = ((float)local_840._4_4_ + (float)local_840._4_4_) * fVar263;
        auVar60._0_4_ = ((float)local_840._0_4_ + (float)local_840._0_4_) * fVar263;
        auVar60._8_4_ = (fStack_838 + fStack_838) * fVar263;
        auVar60._12_4_ = (fStack_834 + fStack_834) * fVar263;
        auVar60._16_4_ = (fStack_830 + fStack_830) * fVar263;
        auVar60._20_4_ = (fStack_82c + fStack_82c) * fVar263;
        auVar60._24_4_ = (fStack_828 + fStack_828) * fVar263;
        auVar60._28_4_ = fStack_824 + fStack_824;
        auVar24 = vcmpps_avx(local_560,auVar60,6);
        auVar32 = auVar226 & auVar24;
        auVar141 = ZEXT3264(auVar215);
        if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar32 >> 0x7f,0) != '\0') ||
              (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar32 >> 0xbf,0) != '\0') ||
            (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar32[0x1f] < '\0') {
          local_220 = vandps_avx(auVar24,auVar226);
          local_2c0._0_4_ = (float)local_360._0_4_ + (float)local_360._0_4_ + -1.0;
          local_2c0._4_4_ = (float)local_360._4_4_ + (float)local_360._4_4_ + -1.0;
          fStack_2b8 = (float)uStack_358 + (float)uStack_358 + -1.0;
          fStack_2b4 = uStack_358._4_4_ + uStack_358._4_4_ + -1.0;
          fStack_2b0 = (float)uStack_350 + (float)uStack_350 + -1.0;
          fStack_2ac = uStack_350._4_4_ + uStack_350._4_4_ + -1.0;
          fStack_2a8 = (float)uStack_348 + (float)uStack_348 + -1.0;
          fStack_2a4 = uStack_348._4_4_ + uStack_348._4_4_ + -1.0;
          local_280 = 0;
          uStack_268 = uStack_6c8;
          uStack_258 = uStack_6d8;
          uStack_248 = uStack_5c8;
          uStack_238 = uStack_5d8;
          local_360._4_4_ = local_2c0._4_4_;
          local_360._0_4_ = local_2c0._0_4_;
          uStack_358._0_4_ = fStack_2b8;
          uStack_358._4_4_ = fStack_2b4;
          uStack_350._0_4_ = fStack_2b0;
          uStack_350._4_4_ = fStack_2ac;
          auVar157 = _local_360;
          uStack_348._0_4_ = fStack_2a8;
          uStack_348._4_4_ = fStack_2a4;
          auVar24 = _local_360;
          if ((pGVar124->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            uVar123 = 0;
            auVar320 = ZEXT3264(local_7a0);
          }
          else {
            auVar320 = ZEXT3264(local_7a0);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar123 = CONCAT71((int7)(uVar123 >> 8),1),
               pGVar124->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar174._0_4_ = 1.0 / (float)local_5f0._0_4_;
              auVar174._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar223 = vshufps_avx(auVar174,auVar174,0);
              local_200[0] = auVar223._0_4_ * (auVar163._0_4_ + 0.0);
              local_200[1] = auVar223._4_4_ * (auVar163._4_4_ + 1.0);
              local_200[2] = auVar223._8_4_ * (auVar163._8_4_ + 2.0);
              local_200[3] = auVar223._12_4_ * (auVar163._12_4_ + 3.0);
              fStack_1f0 = auVar223._0_4_ * (auVar163._16_4_ + 4.0);
              fStack_1ec = auVar223._4_4_ * (auVar163._20_4_ + 5.0);
              fStack_1e8 = auVar223._8_4_ * (auVar163._24_4_ + 6.0);
              fStack_1e4 = auVar163._28_4_ + 7.0;
              uStack_350 = auVar157._16_8_;
              uStack_348 = auVar24._24_8_;
              local_1e0 = local_360;
              uStack_1d8 = uStack_358;
              uStack_1d0 = uStack_350;
              uStack_1c8 = uStack_348;
              local_1c0 = local_560;
              uVar125 = vmovmskps_avx(local_220);
              uVar123 = CONCAT44((int)(uVar123 >> 0x20),uVar125);
              uVar121 = 0;
              if (uVar123 != 0) {
                for (; (uVar123 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
                }
              }
              _local_640 = vshufps_avx(ZEXT416(uVar120),ZEXT416(uVar120),0);
              _auStack_630 = auVar162._16_16_;
              _local_720 = vpermilps_avx(ZEXT416(uVar9),0);
              _auStack_710 = auVar25._16_16_;
              _local_740 = auVar215;
              _local_360 = auVar24;
              local_2e0 = local_540;
              local_2a0 = local_560;
              local_27c = uVar10;
              local_270 = local_6d0;
              local_260 = local_6e0;
              local_250 = local_5d0;
              local_240 = local_5e0;
              while( true ) {
                auVar215 = auVar141._0_32_;
                if (uVar123 == 0) break;
                uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
                local_3e0 = local_200[uVar121];
                local_3d0 = *(undefined4 *)((long)&local_1e0 + uVar121 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar121 * 4);
                fVar250 = 1.0 - local_3e0;
                fVar263 = local_3e0 * fVar250 * 4.0;
                auVar223 = ZEXT416((uint)(local_3e0 * local_3e0 * 0.5));
                auVar223 = vshufps_avx(auVar223,auVar223,0);
                auVar178 = ZEXT416((uint)((fVar250 * fVar250 + fVar263) * 0.5));
                auVar178 = vshufps_avx(auVar178,auVar178,0);
                auVar213 = ZEXT416((uint)((-local_3e0 * local_3e0 - fVar263) * 0.5));
                auVar213 = vshufps_avx(auVar213,auVar213,0);
                local_6b0.context = context->user;
                auVar194 = ZEXT416((uint)(fVar250 * -fVar250 * 0.5));
                auVar194 = vshufps_avx(auVar194,auVar194,0);
                auVar175._0_4_ =
                     auVar194._0_4_ * (float)local_6d0._0_4_ +
                     auVar213._0_4_ * (float)local_6e0._0_4_ +
                     auVar223._0_4_ * (float)local_5e0._0_4_ +
                     auVar178._0_4_ * (float)local_5d0._0_4_;
                auVar175._4_4_ =
                     auVar194._4_4_ * (float)local_6d0._4_4_ +
                     auVar213._4_4_ * (float)local_6e0._4_4_ +
                     auVar223._4_4_ * (float)local_5e0._4_4_ +
                     auVar178._4_4_ * (float)local_5d0._4_4_;
                auVar175._8_4_ =
                     auVar194._8_4_ * (float)uStack_6c8 +
                     auVar213._8_4_ * (float)uStack_6d8 +
                     auVar223._8_4_ * (float)uStack_5d8 + auVar178._8_4_ * (float)uStack_5c8;
                auVar175._12_4_ =
                     auVar194._12_4_ * uStack_6c8._4_4_ +
                     auVar213._12_4_ * uStack_6d8._4_4_ +
                     auVar223._12_4_ * uStack_5d8._4_4_ + auVar178._12_4_ * uStack_5c8._4_4_;
                local_410 = (RTCHitN  [16])vshufps_avx(auVar175,auVar175,0);
                local_400 = vshufps_avx(auVar175,auVar175,0x55);
                auVar199 = ZEXT1664(local_400);
                local_3f0 = vshufps_avx(auVar175,auVar175,0xaa);
                local_3c0 = local_720;
                uStack_3b8 = uStack_718;
                local_3b0 = _local_640;
                vcmpps_avx(ZEXT1632(_local_640),ZEXT1632(_local_640),0xf);
                uStack_39c = (local_6b0.context)->instID[0];
                local_3a0 = uStack_39c;
                uStack_398 = uStack_39c;
                uStack_394 = uStack_39c;
                uStack_390 = (local_6b0.context)->instPrimID[0];
                uStack_38c = uStack_390;
                uStack_388 = uStack_390;
                uStack_384 = uStack_390;
                local_800 = *local_6b8;
                local_6b0.valid = (int *)local_800;
                local_6b0.geometryUserPtr = pGVar124->userPtr;
                local_6b0.hit = local_410;
                local_6b0.N = 4;
                local_780._0_8_ = uVar121;
                local_680._0_4_ = uVar125;
                local_6b0.ray = (RTCRayN *)ray;
                fStack_3dc = local_3e0;
                fStack_3d8 = local_3e0;
                fStack_3d4 = local_3e0;
                uStack_3cc = local_3d0;
                uStack_3c8 = local_3d0;
                uStack_3c4 = local_3d0;
                if (pGVar124->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar199 = ZEXT1664(local_400);
                  (*pGVar124->occlusionFilterN)(&local_6b0);
                  auVar320 = ZEXT3264(local_7a0);
                  auVar229 = ZEXT3264(local_560);
                  auVar163 = ZEXT3264(local_540);
                  uVar121 = local_780._0_8_;
                  uVar125 = local_680._0_4_;
                  fVar312 = (float)local_7c0._0_4_;
                  fVar321 = (float)local_7c0._4_4_;
                  fVar322 = fStack_7b8;
                  fVar323 = fStack_7b4;
                  fVar296 = fStack_7b0;
                  fVar302 = fStack_7ac;
                  fVar304 = fStack_7a8;
                  fVar306 = fStack_7a4;
                  fVar128 = (float)local_700._0_4_;
                  fVar142 = (float)local_700._4_4_;
                  fVar145 = fStack_6f8;
                  fVar147 = fStack_6f4;
                  fVar152 = fStack_6f0;
                  fVar164 = fStack_6ec;
                  fVar165 = fStack_6e8;
                }
                if (local_800 == (undefined1  [16])0x0) {
                  auVar223 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar223 = auVar223 ^ _DAT_01f46b70;
                  auVar141 = ZEXT3264(_local_740);
                }
                else {
                  p_Var13 = context->args->filter;
                  if (p_Var13 == (RTCFilterFunctionN)0x0) {
                    auVar141 = ZEXT3264(_local_740);
                  }
                  else {
                    auVar141 = ZEXT3264(_local_740);
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar124->field_8).field_0x2 & 0x40) != 0)) {
                      auVar199 = ZEXT1664(auVar199._0_16_);
                      (*p_Var13)(&local_6b0);
                      auVar141 = ZEXT3264(_local_740);
                      auVar320 = ZEXT3264(local_7a0);
                      auVar229 = ZEXT3264(local_560);
                      auVar163 = ZEXT3264(local_540);
                      uVar121 = local_780._0_8_;
                      uVar125 = local_680._0_4_;
                      fVar312 = (float)local_7c0._0_4_;
                      fVar321 = (float)local_7c0._4_4_;
                      fVar322 = fStack_7b8;
                      fVar323 = fStack_7b4;
                      fVar296 = fStack_7b0;
                      fVar302 = fStack_7ac;
                      fVar304 = fStack_7a8;
                      fVar306 = fStack_7a4;
                      fVar128 = (float)local_700._0_4_;
                      fVar142 = (float)local_700._4_4_;
                      fVar145 = fStack_6f8;
                      fVar147 = fStack_6f4;
                      fVar152 = fStack_6f0;
                      fVar164 = fStack_6ec;
                      fVar165 = fStack_6e8;
                    }
                  }
                  auVar178 = vpcmpeqd_avx(local_800,_DAT_01f45a50);
                  auVar223 = auVar178 ^ _DAT_01f46b70;
                  auVar176._8_4_ = 0xff800000;
                  auVar176._0_8_ = 0xff800000ff800000;
                  auVar176._12_4_ = 0xff800000;
                  auVar178 = vblendvps_avx(auVar176,*(undefined1 (*) [16])(local_6b0.ray + 0x80),
                                           auVar178);
                  *(undefined1 (*) [16])(local_6b0.ray + 0x80) = auVar178;
                }
                auVar215 = auVar141._0_32_;
                auVar154._8_8_ = 0x100000001;
                auVar154._0_8_ = 0x100000001;
                if ((auVar154 & auVar223) != (undefined1  [16])0x0) {
                  uVar123 = CONCAT71((int7)(uVar123 >> 8),1);
                  local_540 = auVar163._0_32_;
                  local_560 = auVar229._0_32_;
                  goto LAB_008dc551;
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar125;
                uVar123 = uVar123 ^ 1L << (uVar121 & 0x3f);
                uVar121 = 0;
                if (uVar123 != 0) {
                  for (; (uVar123 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
                  }
                }
              }
              uVar123 = 0;
              local_540 = auVar163._0_32_;
              local_560 = auVar229._0_32_;
            }
          }
LAB_008dc551:
          auVar163 = ZEXT1664(local_760._0_16_);
          goto LAB_008dbfd0;
        }
      }
      uVar123 = 0;
      auVar163 = ZEXT1664(auVar223);
      auVar320 = ZEXT3264(local_7a0);
    }
LAB_008dbfd0:
    auVar229 = ZEXT3264(auVar181);
    if (8 < (int)uVar10) {
      auVar223 = vpshufd_avx(ZEXT416(uVar10),0);
      local_4a0 = auVar223._0_4_;
      fStack_49c = auVar223._4_4_;
      fStack_498 = auVar223._8_4_;
      fStack_494 = auVar223._12_4_;
      auVar223 = vshufps_avx(auVar163._0_16_,auVar163._0_16_,0);
      local_320._16_16_ = auVar223;
      local_320._0_16_ = auVar223;
      auVar106._4_4_ = uStack_7dc;
      auVar106._0_4_ = local_7e0;
      auVar106._8_4_ = fStack_7d8;
      auVar106._12_4_ = fStack_7d4;
      auVar223 = vpermilps_avx(auVar106,0);
      local_340._16_16_ = auVar223;
      local_340._0_16_ = auVar223;
      auVar134._0_4_ = 1.0 / (float)local_5f0._0_4_;
      auVar134._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar223 = vshufps_avx(auVar134,auVar134,0);
      register0x00001210 = auVar223;
      _local_120 = auVar223;
      local_5f0 = vshufps_avx(ZEXT416((uint)local_7e8),ZEXT416((uint)local_7e8),0);
      local_300 = vpermilps_avx(local_660._0_16_,0);
      auVar141 = ZEXT1664(local_300);
      fVar263 = (float)local_620._0_4_;
      fVar250 = (float)local_620._4_4_;
      fVar256 = fStack_618;
      fVar257 = fStack_614;
      fVar258 = fStack_610;
      fVar275 = fStack_60c;
      fVar283 = fStack_608;
      _local_740 = auVar215;
      for (lVar127 = 8; lVar127 < (int)uVar10; lVar127 = lVar127 + 8) {
        pauVar7 = (undefined1 (*) [28])(bspline_basis0 + lVar127 * 4 + lVar126);
        fVar286 = *(float *)*pauVar7;
        fVar303 = *(float *)(*pauVar7 + 4);
        fVar203 = *(float *)(*pauVar7 + 8);
        fVar205 = *(float *)(*pauVar7 + 0xc);
        fVar307 = *(float *)(*pauVar7 + 0x10);
        fVar308 = *(float *)(*pauVar7 + 0x14);
        fVar271 = *(float *)(*pauVar7 + 0x18);
        auVar117 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar126 + 0x21fffac + lVar127 * 4);
        fVar309 = *(float *)*pauVar7;
        fVar311 = *(float *)(*pauVar7 + 4);
        fVar264 = *(float *)(*pauVar7 + 8);
        fVar265 = *(float *)(*pauVar7 + 0xc);
        fVar273 = *(float *)(*pauVar7 + 0x10);
        fVar269 = *(float *)(*pauVar7 + 0x14);
        fVar206 = *(float *)(*pauVar7 + 0x18);
        auVar116 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar126 + 0x2200430 + lVar127 * 4);
        fVar166 = *(float *)*pauVar7;
        fVar274 = *(float *)(*pauVar7 + 4);
        fVar143 = *(float *)(*pauVar7 + 8);
        fVar146 = *(float *)(*pauVar7 + 0xc);
        fVar148 = *(float *)(*pauVar7 + 0x10);
        fVar149 = *(float *)(*pauVar7 + 0x14);
        fVar150 = *(float *)(*pauVar7 + 0x18);
        auVar115 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar126 + 0x22008b4 + lVar127 * 4);
        fVar151 = *(float *)*pauVar7;
        fVar189 = *(float *)(*pauVar7 + 4);
        fVar200 = *(float *)(*pauVar7 + 8);
        fVar201 = *(float *)(*pauVar7 + 0xc);
        fVar168 = *(float *)(*pauVar7 + 0x10);
        fVar183 = *(float *)(*pauVar7 + 0x14);
        fVar185 = *(float *)(*pauVar7 + 0x18);
        auVar114 = *pauVar7;
        fVar187 = auVar199._28_4_;
        fVar202 = auVar320._0_4_;
        fVar231 = auVar320._4_4_;
        fVar232 = auVar320._8_4_;
        fVar241 = auVar320._12_4_;
        fVar243 = auVar320._16_4_;
        fVar245 = auVar320._20_4_;
        fVar207 = auVar320._24_4_;
        fStack_824 = fVar187 + *(float *)pauVar7[1];
        fVar220 = fVar187 + fStack_824;
        local_840._0_4_ =
             (float)local_140._0_4_ * fVar286 +
             fVar309 * (float)local_460._0_4_ + fVar263 * fVar166 + (float)local_440._0_4_ * fVar151
        ;
        local_840._4_4_ =
             (float)local_140._4_4_ * fVar303 +
             fVar311 * (float)local_460._4_4_ + fVar250 * fVar274 + (float)local_440._4_4_ * fVar189
        ;
        fStack_838 = fStack_138 * fVar203 +
                     fVar264 * fStack_458 + fVar256 * fVar143 + fStack_438 * fVar200;
        fStack_834 = fStack_134 * fVar205 +
                     fVar265 * fStack_454 + fVar257 * fVar146 + fStack_434 * fVar201;
        fStack_830 = fStack_130 * fVar307 +
                     fVar273 * fStack_450 + fVar258 * fVar148 + fStack_430 * fVar168;
        fStack_82c = fStack_12c * fVar308 +
                     fVar269 * fStack_44c + fVar275 * fVar149 + fStack_42c * fVar183;
        fStack_828 = fStack_128 * fVar271 +
                     fVar206 * fStack_448 + fVar283 * fVar150 + fStack_428 * fVar185;
        fStack_824 = fStack_824 + fVar187 + fVar187 + auVar141._28_4_;
        fVar288 = auVar229._0_4_;
        fVar305 = auVar229._4_4_;
        fVar230 = auVar229._8_4_;
        fVar310 = auVar229._12_4_;
        fVar272 = auVar229._16_4_;
        fVar204 = auVar229._20_4_;
        fVar270 = auVar229._24_4_;
        local_760._0_4_ =
             fVar286 * fVar288 + fVar128 * fVar309 + fVar202 * fVar166 + fVar312 * fVar151;
        local_760._4_4_ =
             fVar303 * fVar305 + fVar142 * fVar311 + fVar231 * fVar274 + fVar321 * fVar189;
        local_760._8_4_ =
             fVar203 * fVar230 + fVar145 * fVar264 + fVar232 * fVar143 + fVar322 * fVar200;
        local_760._12_4_ =
             fVar205 * fVar310 + fVar147 * fVar265 + fVar241 * fVar146 + fVar323 * fVar201;
        local_760._16_4_ =
             fVar307 * fVar272 + fVar152 * fVar273 + fVar243 * fVar148 + fVar296 * fVar168;
        local_760._20_4_ =
             fVar308 * fVar204 + fVar164 * fVar269 + fVar245 * fVar149 + fVar302 * fVar183;
        local_760._24_4_ =
             fVar271 * fVar270 + fVar165 * fVar206 + fVar207 * fVar150 + fVar304 * fVar185;
        local_760._28_4_ = fStack_824 + fVar187 + fVar187 + auVar163._28_4_;
        auVar199 = ZEXT3264(local_760);
        fVar129 = fVar286 * (float)local_c0._0_4_ +
                  (float)local_a0._0_4_ * fVar309 +
                  fVar166 * (float)local_160._0_4_ + (float)local_80._0_4_ * fVar151;
        fVar144 = fVar303 * (float)local_c0._4_4_ +
                  (float)local_a0._4_4_ * fVar311 +
                  fVar274 * (float)local_160._4_4_ + (float)local_80._4_4_ * fVar189;
        fStack_7d8 = fVar203 * fStack_b8 +
                     fStack_98 * fVar264 + fVar143 * fStack_158 + fStack_78 * fVar200;
        fStack_7d4 = fVar205 * fStack_b4 +
                     fStack_94 * fVar265 + fVar146 * fStack_154 + fStack_74 * fVar201;
        fStack_7d0 = fVar307 * fStack_b0 +
                     fStack_90 * fVar273 + fVar148 * fStack_150 + fStack_70 * fVar168;
        fStack_7cc = fVar308 * fStack_ac +
                     fStack_8c * fVar269 + fVar149 * fStack_14c + fStack_6c * fVar183;
        fStack_7c8 = fVar271 * fStack_a8 +
                     fStack_88 * fVar206 + fVar150 * fStack_148 + fStack_68 * fVar185;
        fStack_7c4 = fStack_824 + fVar220;
        pfVar1 = (float *)(bspline_basis1 + lVar127 * 4 + lVar126);
        fVar274 = *pfVar1;
        fVar143 = pfVar1[1];
        fVar146 = pfVar1[2];
        fVar148 = pfVar1[3];
        fVar149 = pfVar1[4];
        fVar150 = pfVar1[5];
        fVar151 = pfVar1[6];
        pfVar2 = (float *)(lVar126 + 0x22023cc + lVar127 * 4);
        fVar189 = *pfVar2;
        fVar200 = pfVar2[1];
        fVar201 = pfVar2[2];
        fVar168 = pfVar2[3];
        fVar183 = pfVar2[4];
        fVar185 = pfVar2[5];
        fVar187 = pfVar2[6];
        auVar162 = *(undefined1 (*) [32])(lVar126 + 0x2202850 + lVar127 * 4);
        auVar141 = ZEXT3264(auVar162);
        auVar25 = *(undefined1 (*) [32])(lVar126 + 0x2202cd4 + lVar127 * 4);
        auVar163 = ZEXT3264(auVar25);
        fVar303 = auVar25._0_4_;
        fVar205 = auVar25._4_4_;
        fVar308 = auVar25._8_4_;
        fVar309 = auVar25._12_4_;
        fVar264 = auVar25._16_4_;
        fVar273 = auVar25._20_4_;
        fVar206 = auVar25._24_4_;
        fVar203 = auVar162._0_4_;
        fVar307 = auVar162._4_4_;
        fVar271 = auVar162._8_4_;
        fVar311 = auVar162._12_4_;
        fVar265 = auVar162._16_4_;
        fVar269 = auVar162._20_4_;
        fVar166 = auVar162._24_4_;
        fVar286 = auVar229._28_4_;
        fVar220 = fVar306 + fVar306 + fVar220;
        local_660._0_4_ =
             (float)local_140._0_4_ * fVar274 +
             fVar189 * (float)local_460._0_4_ + fVar263 * fVar203 + (float)local_440._0_4_ * fVar303
        ;
        local_660._4_4_ =
             (float)local_140._4_4_ * fVar143 +
             fVar200 * (float)local_460._4_4_ + fVar250 * fVar307 + (float)local_440._4_4_ * fVar205
        ;
        local_660._8_4_ =
             fStack_138 * fVar146 + fVar201 * fStack_458 + fVar256 * fVar271 + fStack_438 * fVar308;
        local_660._12_4_ =
             fStack_134 * fVar148 + fVar168 * fStack_454 + fVar257 * fVar311 + fStack_434 * fVar309;
        local_660._16_4_ =
             fStack_130 * fVar149 + fVar183 * fStack_450 + fVar258 * fVar265 + fStack_430 * fVar264;
        local_660._20_4_ =
             fStack_12c * fVar150 + fVar185 * fStack_44c + fVar275 * fVar269 + fStack_42c * fVar273;
        local_660._24_4_ =
             fStack_128 * fVar151 + fVar187 * fStack_448 + fVar283 * fVar166 + fStack_428 * fVar206;
        local_660._28_4_ = fVar306 + fStack_64 + fVar220;
        auVar227._0_4_ =
             fVar288 * fVar274 + fVar128 * fVar189 + fVar202 * fVar203 + fVar312 * fVar303;
        auVar227._4_4_ =
             fVar305 * fVar143 + fVar142 * fVar200 + fVar231 * fVar307 + fVar321 * fVar205;
        auVar227._8_4_ =
             fVar230 * fVar146 + fVar145 * fVar201 + fVar232 * fVar271 + fVar322 * fVar308;
        auVar227._12_4_ =
             fVar310 * fVar148 + fVar147 * fVar168 + fVar241 * fVar311 + fVar323 * fVar309;
        auVar227._16_4_ =
             fVar272 * fVar149 + fVar152 * fVar183 + fVar243 * fVar265 + fVar296 * fVar264;
        auVar227._20_4_ =
             fVar204 * fVar150 + fVar164 * fVar185 + fVar245 * fVar269 + fVar302 * fVar273;
        auVar227._24_4_ =
             fVar270 * fVar151 + fVar165 * fVar187 + fVar207 * fVar166 + fVar304 * fVar206;
        auVar227._28_4_ = fVar220 + fVar306 + fVar306 + fVar286;
        local_5c0._0_4_ =
             (float)local_a0._0_4_ * fVar189 +
             fVar203 * (float)local_160._0_4_ + (float)local_80._0_4_ * fVar303 +
             fVar274 * (float)local_c0._0_4_;
        local_5c0._4_4_ =
             (float)local_a0._4_4_ * fVar200 +
             fVar307 * (float)local_160._4_4_ + (float)local_80._4_4_ * fVar205 +
             fVar143 * (float)local_c0._4_4_;
        fStack_5b8 = fStack_98 * fVar201 + fVar271 * fStack_158 + fStack_78 * fVar308 +
                     fVar146 * fStack_b8;
        fStack_5b4 = fStack_94 * fVar168 + fVar311 * fStack_154 + fStack_74 * fVar309 +
                     fVar148 * fStack_b4;
        fStack_5b0 = fStack_90 * fVar183 + fVar265 * fStack_150 + fStack_70 * fVar264 +
                     fVar149 * fStack_b0;
        fStack_5ac = fStack_8c * fVar185 + fVar269 * fStack_14c + fStack_6c * fVar273 +
                     fVar150 * fStack_ac;
        fStack_5a8 = fStack_88 * fVar187 + fVar166 * fStack_148 + fStack_68 * fVar206 +
                     fVar151 * fStack_a8;
        fStack_5a4 = fVar306 + fVar306 + fStack_64 + fVar220;
        auVar32 = vsubps_avx(local_660,_local_840);
        auVar26 = vsubps_avx(auVar227,local_760);
        fVar296 = auVar32._0_4_;
        fVar302 = auVar32._4_4_;
        auVar61._4_4_ = local_760._4_4_ * fVar302;
        auVar61._0_4_ = (float)local_760._0_4_ * fVar296;
        fVar304 = auVar32._8_4_;
        auVar61._8_4_ = local_760._8_4_ * fVar304;
        fVar306 = auVar32._12_4_;
        auVar61._12_4_ = local_760._12_4_ * fVar306;
        fVar152 = auVar32._16_4_;
        auVar61._16_4_ = local_760._16_4_ * fVar152;
        fVar164 = auVar32._20_4_;
        auVar61._20_4_ = local_760._20_4_ * fVar164;
        fVar165 = auVar32._24_4_;
        auVar61._24_4_ = local_760._24_4_ * fVar165;
        auVar61._28_4_ = fVar220;
        fVar263 = auVar26._0_4_;
        fVar250 = auVar26._4_4_;
        auVar62._4_4_ = fVar250 * (float)local_840._4_4_;
        auVar62._0_4_ = fVar263 * (float)local_840._0_4_;
        fVar256 = auVar26._8_4_;
        auVar62._8_4_ = fVar256 * fStack_838;
        fVar257 = auVar26._12_4_;
        auVar62._12_4_ = fVar257 * fStack_834;
        fVar258 = auVar26._16_4_;
        auVar62._16_4_ = fVar258 * fStack_830;
        fVar275 = auVar26._20_4_;
        auVar62._20_4_ = fVar275 * fStack_82c;
        fVar283 = auVar26._24_4_;
        auVar62._24_4_ = fVar283 * fStack_828;
        auVar62._28_4_ = auVar227._28_4_;
        auVar195 = vsubps_avx(auVar61,auVar62);
        auVar107._4_4_ = fVar144;
        auVar107._0_4_ = fVar129;
        auVar107._8_4_ = fStack_7d8;
        auVar107._12_4_ = fStack_7d4;
        auVar107._16_4_ = fStack_7d0;
        auVar107._20_4_ = fStack_7cc;
        auVar107._24_4_ = fStack_7c8;
        auVar107._28_4_ = fStack_7c4;
        auVar24 = vmaxps_avx(auVar107,_local_5c0);
        auVar63._4_4_ = auVar24._4_4_ * auVar24._4_4_ * (fVar302 * fVar302 + fVar250 * fVar250);
        auVar63._0_4_ = auVar24._0_4_ * auVar24._0_4_ * (fVar296 * fVar296 + fVar263 * fVar263);
        auVar63._8_4_ = auVar24._8_4_ * auVar24._8_4_ * (fVar304 * fVar304 + fVar256 * fVar256);
        auVar63._12_4_ = auVar24._12_4_ * auVar24._12_4_ * (fVar306 * fVar306 + fVar257 * fVar257);
        auVar63._16_4_ = auVar24._16_4_ * auVar24._16_4_ * (fVar152 * fVar152 + fVar258 * fVar258);
        auVar63._20_4_ = auVar24._20_4_ * auVar24._20_4_ * (fVar164 * fVar164 + fVar275 * fVar275);
        auVar63._24_4_ = auVar24._24_4_ * auVar24._24_4_ * (fVar165 * fVar165 + fVar283 * fVar283);
        auVar63._28_4_ = local_660._28_4_ + auVar227._28_4_;
        auVar64._4_4_ = auVar195._4_4_ * auVar195._4_4_;
        auVar64._0_4_ = auVar195._0_4_ * auVar195._0_4_;
        auVar64._8_4_ = auVar195._8_4_ * auVar195._8_4_;
        auVar64._12_4_ = auVar195._12_4_ * auVar195._12_4_;
        auVar64._16_4_ = auVar195._16_4_ * auVar195._16_4_;
        auVar64._20_4_ = auVar195._20_4_ * auVar195._20_4_;
        auVar64._24_4_ = auVar195._24_4_ * auVar195._24_4_;
        auVar64._28_4_ = auVar195._28_4_;
        auVar24 = vcmpps_avx(auVar64,auVar63,2);
        local_280 = (uint)lVar127;
        auVar178 = vpshufd_avx(ZEXT416(local_280),0);
        auVar223 = vpor_avx(auVar178,_DAT_01f4ad30);
        auVar178 = vpor_avx(auVar178,_DAT_01f7afa0);
        auVar112._4_4_ = fStack_49c;
        auVar112._0_4_ = local_4a0;
        auVar112._8_4_ = fStack_498;
        auVar112._12_4_ = fStack_494;
        auVar223 = vpcmpgtd_avx(auVar112,auVar223);
        auVar178 = vpcmpgtd_avx(auVar112,auVar178);
        register0x00001290 = auVar178;
        _local_580 = auVar223;
        auVar195 = _local_580 & auVar24;
        fVar312 = (float)local_7c0._0_4_;
        fVar321 = (float)local_7c0._4_4_;
        fVar322 = fStack_7b8;
        fVar323 = fStack_7b4;
        fVar296 = fStack_7b0;
        fVar302 = fStack_7ac;
        fVar304 = fStack_7a8;
        fVar306 = fStack_7a4;
        fVar263 = (float)local_620._0_4_;
        fVar250 = (float)local_620._4_4_;
        fVar256 = fStack_618;
        fVar257 = fStack_614;
        fVar258 = fStack_610;
        fVar275 = fStack_60c;
        fVar283 = fStack_608;
        fVar128 = (float)local_700._0_4_;
        fVar142 = (float)local_700._4_4_;
        fVar145 = fStack_6f8;
        fVar147 = fStack_6f4;
        fVar152 = fStack_6f0;
        fVar164 = fStack_6ec;
        fVar165 = fStack_6e8;
        if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar195 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar195 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar195 >> 0x7f,0) == '\0') &&
              (auVar195 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar195 >> 0xbf,0) == '\0') &&
            (auVar195 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar195[0x1f]) {
          auVar320 = ZEXT3264(auVar320._0_32_);
          auVar229 = ZEXT3264(auVar229._0_32_);
        }
        else {
          local_4c0 = fVar274 * (float)local_5a0._0_4_ +
                      fVar189 * (float)local_e0._0_4_ +
                      (float)local_100._0_4_ * fVar203 + (float)local_740._0_4_ * fVar303;
          fStack_4bc = fVar143 * (float)local_5a0._4_4_ +
                       fVar200 * (float)local_e0._4_4_ +
                       (float)local_100._4_4_ * fVar307 + (float)local_740._4_4_ * fVar205;
          fStack_4b8 = fVar146 * fStack_598 +
                       fVar201 * fStack_d8 + fStack_f8 * fVar271 + fStack_738 * fVar308;
          fStack_4b4 = fVar148 * fStack_594 +
                       fVar168 * fStack_d4 + fStack_f4 * fVar311 + fStack_734 * fVar309;
          fStack_4b0 = fVar149 * fStack_590 +
                       fVar183 * fStack_d0 + fStack_f0 * fVar265 + fStack_730 * fVar264;
          fStack_4ac = fVar150 * fStack_58c +
                       fVar185 * fStack_cc + fStack_ec * fVar269 + fStack_72c * fVar273;
          fStack_4a8 = fVar151 * fStack_588 +
                       fVar187 * fStack_c8 + fStack_e8 * fVar166 + fStack_728 * fVar206;
          fStack_4a4 = pfVar1[7] + auVar162._28_4_ + auVar25._28_4_ + 0.0;
          local_640._0_4_ = auVar116._0_4_;
          local_640._4_4_ = auVar116._4_4_;
          fStack_638 = auVar116._8_4_;
          fStack_634 = auVar116._12_4_;
          auStack_630._0_4_ = auVar116._16_4_;
          auStack_630._4_4_ = auVar116._20_4_;
          fStack_628 = auVar116._24_4_;
          local_720._0_4_ = auVar115._0_4_;
          local_720._4_4_ = auVar115._4_4_;
          uStack_718._0_4_ = auVar115._8_4_;
          uStack_718._4_4_ = auVar115._12_4_;
          auStack_710._0_4_ = auVar115._16_4_;
          auStack_710._4_4_ = auVar115._20_4_;
          fStack_708 = auVar115._24_4_;
          local_480._0_4_ = auVar114._0_4_;
          local_480._4_4_ = auVar114._4_4_;
          fStack_478 = auVar114._8_4_;
          fStack_474 = auVar114._12_4_;
          fStack_470 = auVar114._16_4_;
          fStack_46c = auVar114._20_4_;
          fStack_468 = auVar114._24_4_;
          fVar233 = (float)local_740._0_4_ * (float)local_480._0_4_;
          fVar242 = (float)local_740._4_4_ * (float)local_480._4_4_;
          fVar244 = fStack_738 * fStack_478;
          fVar246 = fStack_734 * fStack_474;
          fVar247 = fStack_730 * fStack_470;
          fVar248 = fStack_72c * fStack_46c;
          fVar249 = fStack_728 * fStack_468;
          pfVar1 = (float *)(lVar126 + 0x2201640 + lVar127 * 4);
          fVar303 = *pfVar1;
          fVar203 = pfVar1[1];
          fVar205 = pfVar1[2];
          fVar307 = pfVar1[3];
          fVar308 = pfVar1[4];
          fVar271 = pfVar1[5];
          fVar309 = pfVar1[6];
          pfVar2 = (float *)(lVar126 + 0x2201ac4 + lVar127 * 4);
          fVar311 = *pfVar2;
          fVar264 = pfVar2[1];
          fVar265 = pfVar2[2];
          fVar273 = pfVar2[3];
          fVar269 = pfVar2[4];
          fVar206 = pfVar2[5];
          fVar166 = pfVar2[6];
          pfVar3 = (float *)(lVar126 + 0x22011bc + lVar127 * 4);
          fVar274 = *pfVar3;
          fVar143 = pfVar3[1];
          fVar146 = pfVar3[2];
          fVar148 = pfVar3[3];
          fVar149 = pfVar3[4];
          fVar150 = pfVar3[5];
          fVar151 = pfVar3[6];
          fVar220 = pfVar1[7] + pfVar2[7];
          fVar167 = pfVar2[7] + fVar286 + 0.0;
          fStack_4c4 = fVar286 + 0.0 + fVar286 + auVar24._28_4_;
          pfVar1 = (float *)(lVar126 + 0x2200d38 + lVar127 * 4);
          fVar189 = *pfVar1;
          fVar200 = pfVar1[1];
          fVar201 = pfVar1[2];
          fVar168 = pfVar1[3];
          fVar183 = pfVar1[4];
          fVar185 = pfVar1[5];
          fVar187 = pfVar1[6];
          local_480._4_4_ =
               (float)local_140._4_4_ * fVar200 +
               fVar143 * (float)local_460._4_4_ +
               (float)local_620._4_4_ * fVar203 + (float)local_440._4_4_ * fVar264;
          local_480._0_4_ =
               (float)local_140._0_4_ * fVar189 +
               fVar274 * (float)local_460._0_4_ +
               (float)local_620._0_4_ * fVar303 + (float)local_440._0_4_ * fVar311;
          fStack_478 = fStack_138 * fVar201 +
                       fVar146 * fStack_458 + fStack_618 * fVar205 + fStack_438 * fVar265;
          fStack_474 = fStack_134 * fVar168 +
                       fVar148 * fStack_454 + fStack_614 * fVar307 + fStack_434 * fVar273;
          fStack_470 = fStack_130 * fVar183 +
                       fVar149 * fStack_450 + fStack_610 * fVar308 + fStack_430 * fVar269;
          fStack_46c = fStack_12c * fVar185 +
                       fVar150 * fStack_44c + fStack_60c * fVar271 + fStack_42c * fVar206;
          fStack_468 = fStack_128 * fVar187 +
                       fVar151 * fStack_448 + fStack_608 * fVar309 + fStack_428 * fVar166;
          fStack_464 = fVar220 + fVar167;
          auVar159._0_4_ =
               fVar288 * fVar189 +
               fVar274 * (float)local_700._0_4_ +
               fVar202 * fVar303 + (float)local_7c0._0_4_ * fVar311;
          auVar159._4_4_ =
               fVar305 * fVar200 +
               fVar143 * (float)local_700._4_4_ +
               fVar231 * fVar203 + (float)local_7c0._4_4_ * fVar264;
          auVar159._8_4_ =
               fVar230 * fVar201 + fVar146 * fStack_6f8 + fVar232 * fVar205 + fStack_7b8 * fVar265;
          auVar159._12_4_ =
               fVar310 * fVar168 + fVar148 * fStack_6f4 + fVar241 * fVar307 + fStack_7b4 * fVar273;
          auVar159._16_4_ =
               fVar272 * fVar183 + fVar149 * fStack_6f0 + fVar243 * fVar308 + fStack_7b0 * fVar269;
          auVar159._20_4_ =
               fVar204 * fVar185 + fVar150 * fStack_6ec + fVar245 * fVar271 + fStack_7ac * fVar206;
          auVar159._24_4_ =
               fVar270 * fVar187 + fVar151 * fStack_6e8 + fVar207 * fVar309 + fStack_7a8 * fVar166;
          auVar159._28_4_ = fVar167 + fStack_4c4;
          local_4e0 = fVar274 * (float)local_e0._0_4_ +
                      (float)local_100._0_4_ * fVar303 + (float)local_740._0_4_ * fVar311 +
                      (float)local_5a0._0_4_ * fVar189;
          fStack_4dc = fVar143 * (float)local_e0._4_4_ +
                       (float)local_100._4_4_ * fVar203 + (float)local_740._4_4_ * fVar264 +
                       (float)local_5a0._4_4_ * fVar200;
          fStack_4d8 = fVar146 * fStack_d8 + fStack_f8 * fVar205 + fStack_738 * fVar265 +
                       fStack_598 * fVar201;
          fStack_4d4 = fVar148 * fStack_d4 + fStack_f4 * fVar307 + fStack_734 * fVar273 +
                       fStack_594 * fVar168;
          fStack_4d0 = fVar149 * fStack_d0 + fStack_f0 * fVar308 + fStack_730 * fVar269 +
                       fStack_590 * fVar183;
          fStack_4cc = fVar150 * fStack_cc + fStack_ec * fVar271 + fStack_72c * fVar206 +
                       fStack_58c * fVar185;
          fStack_4c8 = fVar151 * fStack_c8 + fStack_e8 * fVar309 + fStack_728 * fVar166 +
                       fStack_588 * fVar187;
          fStack_4c4 = pfVar3[7] + fVar220 + fStack_4c4;
          pfVar1 = (float *)(lVar126 + 0x2203a60 + lVar127 * 4);
          fVar288 = *pfVar1;
          fVar303 = pfVar1[1];
          fVar203 = pfVar1[2];
          fVar305 = pfVar1[3];
          fVar205 = pfVar1[4];
          fVar307 = pfVar1[5];
          fVar230 = pfVar1[6];
          pfVar2 = (float *)(lVar126 + 0x2203ee4 + lVar127 * 4);
          fVar308 = *pfVar2;
          fVar271 = pfVar2[1];
          fVar310 = pfVar2[2];
          fVar309 = pfVar2[3];
          fVar311 = pfVar2[4];
          fVar272 = pfVar2[5];
          fVar264 = pfVar2[6];
          pfVar3 = (float *)(lVar126 + 0x22035dc + lVar127 * 4);
          fVar265 = *pfVar3;
          fVar204 = pfVar3[1];
          fVar273 = pfVar3[2];
          fVar269 = pfVar3[3];
          fVar270 = pfVar3[4];
          fVar206 = pfVar3[5];
          fVar166 = pfVar3[6];
          pfVar4 = (float *)(lVar126 + 0x2203158 + lVar127 * 4);
          fVar274 = *pfVar4;
          fVar143 = pfVar4[1];
          fVar146 = pfVar4[2];
          fVar148 = pfVar4[3];
          fVar149 = pfVar4[4];
          fVar150 = pfVar4[5];
          fVar151 = pfVar4[6];
          auVar281._0_4_ =
               (float)local_140._0_4_ * fVar274 +
               fVar265 * (float)local_460._0_4_ +
               (float)local_620._0_4_ * fVar288 + (float)local_440._0_4_ * fVar308;
          auVar281._4_4_ =
               (float)local_140._4_4_ * fVar143 +
               fVar204 * (float)local_460._4_4_ +
               (float)local_620._4_4_ * fVar303 + (float)local_440._4_4_ * fVar271;
          auVar281._8_4_ =
               fStack_138 * fVar146 +
               fVar273 * fStack_458 + fStack_618 * fVar203 + fStack_438 * fVar310;
          auVar281._12_4_ =
               fStack_134 * fVar148 +
               fVar269 * fStack_454 + fStack_614 * fVar305 + fStack_434 * fVar309;
          auVar281._16_4_ =
               fStack_130 * fVar149 +
               fVar270 * fStack_450 + fStack_610 * fVar205 + fStack_430 * fVar311;
          auVar281._20_4_ =
               fStack_12c * fVar150 +
               fVar206 * fStack_44c + fStack_60c * fVar307 + fStack_42c * fVar272;
          auVar281._24_4_ =
               fStack_128 * fVar151 +
               fVar166 * fStack_448 + fStack_608 * fVar230 + fStack_428 * fVar264;
          auVar281._28_4_ = fStack_424 + fStack_424 + fStack_604 + fStack_424;
          auVar318._0_4_ =
               fVar274 * fVar169 +
               fVar265 * (float)local_700._0_4_ +
               fVar202 * fVar288 + (float)local_7c0._0_4_ * fVar308;
          auVar318._4_4_ =
               fVar143 * fVar184 +
               fVar204 * (float)local_700._4_4_ +
               fVar231 * fVar303 + (float)local_7c0._4_4_ * fVar271;
          auVar318._8_4_ =
               fVar146 * fVar186 + fVar273 * fStack_6f8 + fVar232 * fVar203 + fStack_7b8 * fVar310;
          auVar318._12_4_ =
               fVar148 * fVar188 + fVar269 * fStack_6f4 + fVar241 * fVar305 + fStack_7b4 * fVar309;
          auVar318._16_4_ =
               fVar149 * fVar169 + fVar270 * fStack_6f0 + fVar243 * fVar205 + fStack_7b0 * fVar311;
          auVar318._20_4_ =
               fVar150 * fVar184 + fVar206 * fStack_6ec + fVar245 * fVar307 + fStack_7ac * fVar272;
          auVar318._24_4_ =
               fVar151 * fVar186 + fVar166 * fStack_6e8 + fVar207 * fVar230 + fStack_7a8 * fVar264;
          auVar318._28_4_ = fStack_424 + fStack_424 + fVar286 + fStack_424;
          auVar228._8_4_ = 0x7fffffff;
          auVar228._0_8_ = 0x7fffffff7fffffff;
          auVar228._12_4_ = 0x7fffffff;
          auVar228._16_4_ = 0x7fffffff;
          auVar228._20_4_ = 0x7fffffff;
          auVar228._24_4_ = 0x7fffffff;
          auVar228._28_4_ = 0x7fffffff;
          auVar162 = vandps_avx(_local_480,auVar228);
          auVar195 = vandps_avx(auVar159,auVar228);
          auVar195 = vmaxps_avx(auVar162,auVar195);
          auVar109._4_4_ = fStack_4dc;
          auVar109._0_4_ = local_4e0;
          auVar109._8_4_ = fStack_4d8;
          auVar109._12_4_ = fStack_4d4;
          auVar109._16_4_ = fStack_4d0;
          auVar109._20_4_ = fStack_4cc;
          auVar109._24_4_ = fStack_4c8;
          auVar109._28_4_ = fStack_4c4;
          auVar162 = vandps_avx(auVar228,auVar109);
          auVar195 = vmaxps_avx(auVar195,auVar162);
          auVar195 = vcmpps_avx(auVar195,local_320,1);
          auVar214 = vblendvps_avx(_local_480,auVar32,auVar195);
          auVar138._0_4_ =
               fVar274 * (float)local_5a0._0_4_ +
               fVar265 * (float)local_e0._0_4_ +
               fVar308 * (float)local_740._0_4_ + (float)local_100._0_4_ * fVar288;
          auVar138._4_4_ =
               fVar143 * (float)local_5a0._4_4_ +
               fVar204 * (float)local_e0._4_4_ +
               fVar271 * (float)local_740._4_4_ + (float)local_100._4_4_ * fVar303;
          auVar138._8_4_ =
               fVar146 * fStack_598 +
               fVar273 * fStack_d8 + fVar310 * fStack_738 + fStack_f8 * fVar203;
          auVar138._12_4_ =
               fVar148 * fStack_594 +
               fVar269 * fStack_d4 + fVar309 * fStack_734 + fStack_f4 * fVar305;
          auVar138._16_4_ =
               fVar149 * fStack_590 +
               fVar270 * fStack_d0 + fVar311 * fStack_730 + fStack_f0 * fVar205;
          auVar138._20_4_ =
               fVar150 * fStack_58c +
               fVar206 * fStack_cc + fVar272 * fStack_72c + fStack_ec * fVar307;
          auVar138._24_4_ =
               fVar151 * fStack_588 +
               fVar166 * fStack_c8 + fVar264 * fStack_728 + fStack_e8 * fVar230;
          auVar138._28_4_ = auVar162._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar215 = vblendvps_avx(auVar159,auVar26,auVar195);
          auVar162 = vandps_avx(auVar281,auVar228);
          auVar195 = vandps_avx(auVar318,auVar228);
          auVar254 = vmaxps_avx(auVar162,auVar195);
          auVar162 = vandps_avx(auVar138,auVar228);
          auVar162 = vmaxps_avx(auVar254,auVar162);
          local_680._0_4_ = auVar117._0_4_;
          local_680._4_4_ = auVar117._4_4_;
          fStack_678 = auVar117._8_4_;
          fStack_674 = auVar117._12_4_;
          auStack_670._0_4_ = auVar117._16_4_;
          auStack_670._4_4_ = auVar117._20_4_;
          fStack_668 = auVar117._24_4_;
          auVar195 = vcmpps_avx(auVar162,local_320,1);
          auVar162 = vblendvps_avx(auVar281,auVar32,auVar195);
          auVar139._0_4_ =
               (float)local_5a0._0_4_ * (float)local_680._0_4_ +
               (float)local_e0._0_4_ * (float)local_640._0_4_ +
               (float)local_100._0_4_ * (float)local_720._0_4_ + fVar233;
          auVar139._4_4_ =
               (float)local_5a0._4_4_ * (float)local_680._4_4_ +
               (float)local_e0._4_4_ * (float)local_640._4_4_ +
               (float)local_100._4_4_ * (float)local_720._4_4_ + fVar242;
          auVar139._8_4_ =
               fStack_598 * fStack_678 +
               fStack_d8 * fStack_638 + fStack_f8 * (float)uStack_718 + fVar244;
          auVar139._12_4_ =
               fStack_594 * fStack_674 +
               fStack_d4 * fStack_634 + fStack_f4 * uStack_718._4_4_ + fVar246;
          auVar139._16_4_ =
               fStack_590 * (float)auStack_670._0_4_ +
               fStack_d0 * (float)auStack_630._0_4_ + fStack_f0 * (float)auStack_710._0_4_ + fVar247
          ;
          auVar139._20_4_ =
               fStack_58c * (float)auStack_670._4_4_ +
               fStack_cc * (float)auStack_630._4_4_ + fStack_ec * (float)auStack_710._4_4_ + fVar248
          ;
          auVar139._24_4_ =
               fStack_588 * fStack_668 + fStack_c8 * fStack_628 + fStack_e8 * fStack_708 + fVar249;
          auVar139._28_4_ = auVar254._28_4_ + fStack_4a4 + auVar25._28_4_ + 0.0;
          auVar25 = vblendvps_avx(auVar318,auVar26,auVar195);
          fVar187 = auVar214._0_4_;
          fVar220 = auVar214._4_4_;
          fVar202 = auVar214._8_4_;
          fVar231 = auVar214._12_4_;
          fVar232 = auVar214._16_4_;
          fVar241 = auVar214._20_4_;
          fVar243 = auVar214._24_4_;
          fVar245 = auVar214._28_4_;
          fVar264 = auVar162._0_4_;
          fVar204 = auVar162._4_4_;
          fVar269 = auVar162._8_4_;
          fVar206 = auVar162._12_4_;
          fVar274 = auVar162._16_4_;
          fVar146 = auVar162._20_4_;
          fVar149 = auVar162._24_4_;
          fVar286 = auVar215._0_4_;
          fVar303 = auVar215._4_4_;
          fVar305 = auVar215._8_4_;
          fVar307 = auVar215._12_4_;
          fVar308 = auVar215._16_4_;
          fVar310 = auVar215._20_4_;
          fVar311 = auVar215._24_4_;
          auVar295._0_4_ = fVar286 * fVar286 + fVar187 * fVar187;
          auVar295._4_4_ = fVar303 * fVar303 + fVar220 * fVar220;
          auVar295._8_4_ = fVar305 * fVar305 + fVar202 * fVar202;
          auVar295._12_4_ = fVar307 * fVar307 + fVar231 * fVar231;
          auVar295._16_4_ = fVar308 * fVar308 + fVar232 * fVar232;
          auVar295._20_4_ = fVar310 * fVar310 + fVar241 * fVar241;
          auVar295._24_4_ = fVar311 * fVar311 + fVar243 * fVar243;
          auVar295._28_4_ = fStack_7a4 + auVar26._28_4_;
          auVar32 = vrsqrtps_avx(auVar295);
          fVar288 = auVar32._0_4_;
          fVar203 = auVar32._4_4_;
          auVar65._4_4_ = fVar203 * 1.5;
          auVar65._0_4_ = fVar288 * 1.5;
          fVar205 = auVar32._8_4_;
          auVar65._8_4_ = fVar205 * 1.5;
          fVar230 = auVar32._12_4_;
          auVar65._12_4_ = fVar230 * 1.5;
          fVar271 = auVar32._16_4_;
          auVar65._16_4_ = fVar271 * 1.5;
          fVar309 = auVar32._20_4_;
          auVar65._20_4_ = fVar309 * 1.5;
          fVar272 = auVar32._24_4_;
          auVar65._24_4_ = fVar272 * 1.5;
          auVar65._28_4_ = auVar318._28_4_;
          auVar66._4_4_ = fVar203 * fVar203 * fVar203 * auVar295._4_4_ * 0.5;
          auVar66._0_4_ = fVar288 * fVar288 * fVar288 * auVar295._0_4_ * 0.5;
          auVar66._8_4_ = fVar205 * fVar205 * fVar205 * auVar295._8_4_ * 0.5;
          auVar66._12_4_ = fVar230 * fVar230 * fVar230 * auVar295._12_4_ * 0.5;
          auVar66._16_4_ = fVar271 * fVar271 * fVar271 * auVar295._16_4_ * 0.5;
          auVar66._20_4_ = fVar309 * fVar309 * fVar309 * auVar295._20_4_ * 0.5;
          auVar66._24_4_ = fVar272 * fVar272 * fVar272 * auVar295._24_4_ * 0.5;
          auVar66._28_4_ = auVar295._28_4_;
          auVar26 = vsubps_avx(auVar65,auVar66);
          fVar151 = auVar26._0_4_;
          fVar189 = auVar26._4_4_;
          fVar200 = auVar26._8_4_;
          fVar201 = auVar26._12_4_;
          fVar168 = auVar26._16_4_;
          fVar183 = auVar26._20_4_;
          fVar185 = auVar26._24_4_;
          fVar288 = auVar25._0_4_;
          fVar203 = auVar25._4_4_;
          fVar205 = auVar25._8_4_;
          fVar230 = auVar25._12_4_;
          fVar271 = auVar25._16_4_;
          fVar309 = auVar25._20_4_;
          fVar272 = auVar25._24_4_;
          auVar268._0_4_ = fVar288 * fVar288 + fVar264 * fVar264;
          auVar268._4_4_ = fVar203 * fVar203 + fVar204 * fVar204;
          auVar268._8_4_ = fVar205 * fVar205 + fVar269 * fVar269;
          auVar268._12_4_ = fVar230 * fVar230 + fVar206 * fVar206;
          auVar268._16_4_ = fVar271 * fVar271 + fVar274 * fVar274;
          auVar268._20_4_ = fVar309 * fVar309 + fVar146 * fVar146;
          auVar268._24_4_ = fVar272 * fVar272 + fVar149 * fVar149;
          auVar268._28_4_ = auVar32._28_4_ + auVar162._28_4_;
          auVar162 = vrsqrtps_avx(auVar268);
          fVar265 = auVar162._0_4_;
          fVar273 = auVar162._4_4_;
          auVar67._4_4_ = fVar273 * 1.5;
          auVar67._0_4_ = fVar265 * 1.5;
          fVar270 = auVar162._8_4_;
          auVar67._8_4_ = fVar270 * 1.5;
          fVar166 = auVar162._12_4_;
          auVar67._12_4_ = fVar166 * 1.5;
          fVar143 = auVar162._16_4_;
          auVar67._16_4_ = fVar143 * 1.5;
          fVar148 = auVar162._20_4_;
          auVar67._20_4_ = fVar148 * 1.5;
          fVar150 = auVar162._24_4_;
          auVar67._24_4_ = fVar150 * 1.5;
          auVar67._28_4_ = auVar318._28_4_;
          auVar68._4_4_ = fVar273 * fVar273 * fVar273 * auVar268._4_4_ * 0.5;
          auVar68._0_4_ = fVar265 * fVar265 * fVar265 * auVar268._0_4_ * 0.5;
          auVar68._8_4_ = fVar270 * fVar270 * fVar270 * auVar268._8_4_ * 0.5;
          auVar68._12_4_ = fVar166 * fVar166 * fVar166 * auVar268._12_4_ * 0.5;
          auVar68._16_4_ = fVar143 * fVar143 * fVar143 * auVar268._16_4_ * 0.5;
          auVar68._20_4_ = fVar148 * fVar148 * fVar148 * auVar268._20_4_ * 0.5;
          auVar68._24_4_ = fVar150 * fVar150 * fVar150 * auVar268._24_4_ * 0.5;
          auVar68._28_4_ = auVar268._28_4_;
          auVar25 = vsubps_avx(auVar67,auVar68);
          fVar265 = auVar25._0_4_;
          fVar273 = auVar25._4_4_;
          fVar270 = auVar25._8_4_;
          fVar166 = auVar25._12_4_;
          fVar143 = auVar25._16_4_;
          fVar148 = auVar25._20_4_;
          fVar150 = auVar25._24_4_;
          fVar286 = fVar129 * fVar151 * fVar286;
          fVar303 = fVar144 * fVar189 * fVar303;
          auVar69._4_4_ = fVar303;
          auVar69._0_4_ = fVar286;
          fVar305 = fStack_7d8 * fVar200 * fVar305;
          auVar69._8_4_ = fVar305;
          fVar307 = fStack_7d4 * fVar201 * fVar307;
          auVar69._12_4_ = fVar307;
          fVar308 = fStack_7d0 * fVar168 * fVar308;
          auVar69._16_4_ = fVar308;
          fVar310 = fStack_7cc * fVar183 * fVar310;
          auVar69._20_4_ = fVar310;
          fVar311 = fStack_7c8 * fVar185 * fVar311;
          auVar69._24_4_ = fVar311;
          auVar69._28_4_ = auVar162._28_4_;
          local_680._4_4_ = fVar303 + (float)local_840._4_4_;
          local_680._0_4_ = fVar286 + (float)local_840._0_4_;
          fStack_678 = fVar305 + fStack_838;
          fStack_674 = fVar307 + fStack_834;
          auStack_670._0_4_ = fVar308 + fStack_830;
          auStack_670._4_4_ = fVar310 + fStack_82c;
          fStack_668 = fVar311 + fStack_828;
          fStack_664 = auVar162._28_4_ + fStack_824;
          fVar286 = fVar129 * fVar151 * -fVar187;
          fVar303 = fVar144 * fVar189 * -fVar220;
          auVar70._4_4_ = fVar303;
          auVar70._0_4_ = fVar286;
          fVar305 = fStack_7d8 * fVar200 * -fVar202;
          auVar70._8_4_ = fVar305;
          fVar307 = fStack_7d4 * fVar201 * -fVar231;
          auVar70._12_4_ = fVar307;
          fVar308 = fStack_7d0 * fVar168 * -fVar232;
          auVar70._16_4_ = fVar308;
          fVar310 = fStack_7cc * fVar183 * -fVar241;
          auVar70._20_4_ = fVar310;
          fVar311 = fStack_7c8 * fVar185 * -fVar243;
          auVar70._24_4_ = fVar311;
          auVar70._28_4_ = -fVar245;
          local_720._4_4_ = local_760._4_4_ + fVar303;
          local_720._0_4_ = (float)local_760._0_4_ + fVar286;
          uStack_718._0_4_ = local_760._8_4_ + fVar305;
          uStack_718._4_4_ = local_760._12_4_ + fVar307;
          auStack_710._0_4_ = local_760._16_4_ + fVar308;
          auStack_710._4_4_ = local_760._20_4_ + fVar310;
          fStack_708 = local_760._24_4_ + fVar311;
          fStack_704 = local_760._28_4_ + -fVar245;
          fVar286 = fVar151 * 0.0 * fVar129;
          fVar303 = fVar189 * 0.0 * fVar144;
          auVar71._4_4_ = fVar303;
          auVar71._0_4_ = fVar286;
          fVar305 = fVar200 * 0.0 * fStack_7d8;
          auVar71._8_4_ = fVar305;
          fVar307 = fVar201 * 0.0 * fStack_7d4;
          auVar71._12_4_ = fVar307;
          fVar308 = fVar168 * 0.0 * fStack_7d0;
          auVar71._16_4_ = fVar308;
          fVar310 = fVar183 * 0.0 * fStack_7cc;
          auVar71._20_4_ = fVar310;
          fVar311 = fVar185 * 0.0 * fStack_7c8;
          auVar71._24_4_ = fVar311;
          auVar71._28_4_ = fVar245;
          auVar162 = vsubps_avx(_local_840,auVar69);
          auVar330._0_4_ = fVar286 + auVar139._0_4_;
          auVar330._4_4_ = fVar303 + auVar139._4_4_;
          auVar330._8_4_ = fVar305 + auVar139._8_4_;
          auVar330._12_4_ = fVar307 + auVar139._12_4_;
          auVar330._16_4_ = fVar308 + auVar139._16_4_;
          auVar330._20_4_ = fVar310 + auVar139._20_4_;
          auVar330._24_4_ = fVar311 + auVar139._24_4_;
          auVar330._28_4_ = fVar245 + auVar139._28_4_;
          fVar286 = (float)local_5c0._0_4_ * fVar265 * fVar288;
          fVar288 = (float)local_5c0._4_4_ * fVar273 * fVar203;
          auVar72._4_4_ = fVar288;
          auVar72._0_4_ = fVar286;
          fVar303 = fStack_5b8 * fVar270 * fVar205;
          auVar72._8_4_ = fVar303;
          fVar203 = fStack_5b4 * fVar166 * fVar230;
          auVar72._12_4_ = fVar203;
          fVar305 = fStack_5b0 * fVar143 * fVar271;
          auVar72._16_4_ = fVar305;
          fVar205 = fStack_5ac * fVar148 * fVar309;
          auVar72._20_4_ = fVar205;
          fVar307 = fStack_5a8 * fVar150 * fVar272;
          auVar72._24_4_ = fVar307;
          auVar72._28_4_ = fStack_824;
          auVar27 = vsubps_avx(local_760,auVar70);
          auVar325._0_4_ = local_660._0_4_ + fVar286;
          auVar325._4_4_ = local_660._4_4_ + fVar288;
          auVar325._8_4_ = local_660._8_4_ + fVar303;
          auVar325._12_4_ = local_660._12_4_ + fVar203;
          auVar325._16_4_ = local_660._16_4_ + fVar305;
          auVar325._20_4_ = local_660._20_4_ + fVar205;
          auVar325._24_4_ = local_660._24_4_ + fVar307;
          auVar325._28_4_ = local_660._28_4_ + fStack_824;
          fVar286 = fVar265 * -fVar264 * (float)local_5c0._0_4_;
          fVar288 = fVar273 * -fVar204 * (float)local_5c0._4_4_;
          auVar73._4_4_ = fVar288;
          auVar73._0_4_ = fVar286;
          fVar303 = fVar270 * -fVar269 * fStack_5b8;
          auVar73._8_4_ = fVar303;
          fVar203 = fVar166 * -fVar206 * fStack_5b4;
          auVar73._12_4_ = fVar203;
          fVar305 = fVar143 * -fVar274 * fStack_5b0;
          auVar73._16_4_ = fVar305;
          fVar205 = fVar148 * -fVar146 * fStack_5ac;
          auVar73._20_4_ = fVar205;
          fVar307 = fVar150 * -fVar149 * fStack_5a8;
          auVar73._24_4_ = fVar307;
          auVar73._28_4_ = fStack_7c4;
          auVar28 = vsubps_avx(auVar139,auVar71);
          auVar218._0_4_ = auVar227._0_4_ + fVar286;
          auVar218._4_4_ = auVar227._4_4_ + fVar288;
          auVar218._8_4_ = auVar227._8_4_ + fVar303;
          auVar218._12_4_ = auVar227._12_4_ + fVar203;
          auVar218._16_4_ = auVar227._16_4_ + fVar305;
          auVar218._20_4_ = auVar227._20_4_ + fVar205;
          auVar218._24_4_ = auVar227._24_4_ + fVar307;
          auVar218._28_4_ = auVar227._28_4_ + fStack_7c4;
          fVar286 = fVar265 * 0.0 * (float)local_5c0._0_4_;
          fVar288 = fVar273 * 0.0 * (float)local_5c0._4_4_;
          auVar74._4_4_ = fVar288;
          auVar74._0_4_ = fVar286;
          fVar303 = fVar270 * 0.0 * fStack_5b8;
          auVar74._8_4_ = fVar303;
          fVar203 = fVar166 * 0.0 * fStack_5b4;
          auVar74._12_4_ = fVar203;
          fVar305 = fVar143 * 0.0 * fStack_5b0;
          auVar74._16_4_ = fVar305;
          fVar205 = fVar148 * 0.0 * fStack_5ac;
          auVar74._20_4_ = fVar205;
          fVar307 = fVar150 * 0.0 * fStack_5a8;
          auVar74._24_4_ = fVar307;
          auVar74._28_4_ = auVar139._28_4_;
          auVar32 = vsubps_avx(local_660,auVar72);
          auVar111._4_4_ = fStack_4bc;
          auVar111._0_4_ = local_4c0;
          auVar111._8_4_ = fStack_4b8;
          auVar111._12_4_ = fStack_4b4;
          auVar111._16_4_ = fStack_4b0;
          auVar111._20_4_ = fStack_4ac;
          auVar111._24_4_ = fStack_4a8;
          auVar111._28_4_ = fStack_4a4;
          auVar282._0_4_ = local_4c0 + fVar286;
          auVar282._4_4_ = fStack_4bc + fVar288;
          auVar282._8_4_ = fStack_4b8 + fVar303;
          auVar282._12_4_ = fStack_4b4 + fVar203;
          auVar282._16_4_ = fStack_4b0 + fVar305;
          auVar282._20_4_ = fStack_4ac + fVar205;
          auVar282._24_4_ = fStack_4a8 + fVar307;
          auVar282._28_4_ = fStack_4a4 + auVar139._28_4_;
          auVar26 = vsubps_avx(auVar227,auVar73);
          auVar195 = vsubps_avx(auVar111,auVar74);
          auVar214 = vsubps_avx(auVar218,auVar27);
          auVar215 = vsubps_avx(auVar282,auVar28);
          auVar75._4_4_ = auVar28._4_4_ * auVar214._4_4_;
          auVar75._0_4_ = auVar28._0_4_ * auVar214._0_4_;
          auVar75._8_4_ = auVar28._8_4_ * auVar214._8_4_;
          auVar75._12_4_ = auVar28._12_4_ * auVar214._12_4_;
          auVar75._16_4_ = auVar28._16_4_ * auVar214._16_4_;
          auVar75._20_4_ = auVar28._20_4_ * auVar214._20_4_;
          auVar75._24_4_ = auVar28._24_4_ * auVar214._24_4_;
          auVar75._28_4_ = auVar318._28_4_;
          auVar76._4_4_ = auVar27._4_4_ * auVar215._4_4_;
          auVar76._0_4_ = auVar27._0_4_ * auVar215._0_4_;
          auVar76._8_4_ = auVar27._8_4_ * auVar215._8_4_;
          auVar76._12_4_ = auVar27._12_4_ * auVar215._12_4_;
          auVar76._16_4_ = auVar27._16_4_ * auVar215._16_4_;
          auVar76._20_4_ = auVar27._20_4_ * auVar215._20_4_;
          auVar76._24_4_ = auVar27._24_4_ * auVar215._24_4_;
          auVar76._28_4_ = fStack_4a4;
          auVar254 = vsubps_avx(auVar76,auVar75);
          auVar77._4_4_ = auVar162._4_4_ * auVar215._4_4_;
          auVar77._0_4_ = auVar162._0_4_ * auVar215._0_4_;
          auVar77._8_4_ = auVar162._8_4_ * auVar215._8_4_;
          auVar77._12_4_ = auVar162._12_4_ * auVar215._12_4_;
          auVar77._16_4_ = auVar162._16_4_ * auVar215._16_4_;
          auVar77._20_4_ = auVar162._20_4_ * auVar215._20_4_;
          auVar77._24_4_ = auVar162._24_4_ * auVar215._24_4_;
          auVar77._28_4_ = auVar215._28_4_;
          auVar215 = vsubps_avx(auVar325,auVar162);
          auVar78._4_4_ = auVar28._4_4_ * auVar215._4_4_;
          auVar78._0_4_ = auVar28._0_4_ * auVar215._0_4_;
          auVar78._8_4_ = auVar28._8_4_ * auVar215._8_4_;
          auVar78._12_4_ = auVar28._12_4_ * auVar215._12_4_;
          auVar78._16_4_ = auVar28._16_4_ * auVar215._16_4_;
          auVar78._20_4_ = auVar28._20_4_ * auVar215._20_4_;
          auVar78._24_4_ = auVar28._24_4_ * auVar215._24_4_;
          auVar78._28_4_ = auVar25._28_4_;
          auVar300 = vsubps_avx(auVar78,auVar77);
          auVar79._4_4_ = auVar27._4_4_ * auVar215._4_4_;
          auVar79._0_4_ = auVar27._0_4_ * auVar215._0_4_;
          auVar79._8_4_ = auVar27._8_4_ * auVar215._8_4_;
          auVar79._12_4_ = auVar27._12_4_ * auVar215._12_4_;
          auVar79._16_4_ = auVar27._16_4_ * auVar215._16_4_;
          auVar79._20_4_ = auVar27._20_4_ * auVar215._20_4_;
          auVar79._24_4_ = auVar27._24_4_ * auVar215._24_4_;
          auVar79._28_4_ = auVar25._28_4_;
          auVar80._4_4_ = auVar162._4_4_ * auVar214._4_4_;
          auVar80._0_4_ = auVar162._0_4_ * auVar214._0_4_;
          auVar80._8_4_ = auVar162._8_4_ * auVar214._8_4_;
          auVar80._12_4_ = auVar162._12_4_ * auVar214._12_4_;
          auVar80._16_4_ = auVar162._16_4_ * auVar214._16_4_;
          auVar80._20_4_ = auVar162._20_4_ * auVar214._20_4_;
          auVar80._24_4_ = auVar162._24_4_ * auVar214._24_4_;
          auVar80._28_4_ = auVar214._28_4_;
          auVar25 = vsubps_avx(auVar80,auVar79);
          auVar160._0_4_ = auVar254._0_4_ * 0.0 + auVar25._0_4_ + auVar300._0_4_ * 0.0;
          auVar160._4_4_ = auVar254._4_4_ * 0.0 + auVar25._4_4_ + auVar300._4_4_ * 0.0;
          auVar160._8_4_ = auVar254._8_4_ * 0.0 + auVar25._8_4_ + auVar300._8_4_ * 0.0;
          auVar160._12_4_ = auVar254._12_4_ * 0.0 + auVar25._12_4_ + auVar300._12_4_ * 0.0;
          auVar160._16_4_ = auVar254._16_4_ * 0.0 + auVar25._16_4_ + auVar300._16_4_ * 0.0;
          auVar160._20_4_ = auVar254._20_4_ * 0.0 + auVar25._20_4_ + auVar300._20_4_ * 0.0;
          auVar160._24_4_ = auVar254._24_4_ * 0.0 + auVar25._24_4_ + auVar300._24_4_ * 0.0;
          auVar160._28_4_ = auVar254._28_4_ + auVar25._28_4_ + auVar300._28_4_;
          auVar15 = vcmpps_avx(auVar160,ZEXT832(0) << 0x20,2);
          auVar25 = vblendvps_avx(auVar32,_local_680,auVar15);
          auVar199 = ZEXT3264(auVar25);
          auVar32 = vblendvps_avx(auVar26,_local_720,auVar15);
          auVar26 = vblendvps_avx(auVar195,auVar330,auVar15);
          auVar195 = vblendvps_avx(auVar162,auVar325,auVar15);
          auVar214 = vblendvps_avx(auVar27,auVar218,auVar15);
          auVar215 = vblendvps_avx(auVar28,auVar282,auVar15);
          auVar254 = vblendvps_avx(auVar325,auVar162,auVar15);
          auVar300 = vblendvps_avx(auVar218,auVar27,auVar15);
          auVar14 = vblendvps_avx(auVar282,auVar28,auVar15);
          auVar162 = vandps_avx(auVar24,_local_580);
          auVar254 = vsubps_avx(auVar254,auVar25);
          auVar29 = vsubps_avx(auVar300,auVar32);
          auVar30 = vsubps_avx(auVar14,auVar26);
          auVar14 = vsubps_avx(auVar32,auVar214);
          fVar286 = auVar29._0_4_;
          fVar247 = auVar26._0_4_;
          fVar230 = auVar29._4_4_;
          fVar248 = auVar26._4_4_;
          auVar81._4_4_ = fVar248 * fVar230;
          auVar81._0_4_ = fVar247 * fVar286;
          fVar264 = auVar29._8_4_;
          fVar249 = auVar26._8_4_;
          auVar81._8_4_ = fVar249 * fVar264;
          fVar166 = auVar29._12_4_;
          fVar259 = auVar26._12_4_;
          auVar81._12_4_ = fVar259 * fVar166;
          fVar151 = auVar29._16_4_;
          fVar260 = auVar26._16_4_;
          auVar81._16_4_ = fVar260 * fVar151;
          fVar187 = auVar29._20_4_;
          fVar261 = auVar26._20_4_;
          auVar81._20_4_ = fVar261 * fVar187;
          fVar245 = auVar29._24_4_;
          fVar262 = auVar26._24_4_;
          auVar81._24_4_ = fVar262 * fVar245;
          auVar81._28_4_ = auVar300._28_4_;
          fVar288 = auVar32._0_4_;
          fVar276 = auVar30._0_4_;
          fVar308 = auVar32._4_4_;
          fVar284 = auVar30._4_4_;
          auVar82._4_4_ = fVar284 * fVar308;
          auVar82._0_4_ = fVar276 * fVar288;
          fVar265 = auVar32._8_4_;
          fVar287 = auVar30._8_4_;
          auVar82._8_4_ = fVar287 * fVar265;
          fVar274 = auVar32._12_4_;
          fVar289 = auVar30._12_4_;
          auVar82._12_4_ = fVar289 * fVar274;
          fVar189 = auVar32._16_4_;
          fVar290 = auVar30._16_4_;
          auVar82._16_4_ = fVar290 * fVar189;
          fVar220 = auVar32._20_4_;
          fVar291 = auVar30._20_4_;
          auVar82._20_4_ = fVar291 * fVar220;
          fVar207 = auVar32._24_4_;
          fVar292 = auVar30._24_4_;
          uVar125 = auVar27._28_4_;
          auVar82._24_4_ = fVar292 * fVar207;
          auVar82._28_4_ = uVar125;
          auVar300 = vsubps_avx(auVar82,auVar81);
          fVar303 = auVar25._0_4_;
          fVar271 = auVar25._4_4_;
          auVar83._4_4_ = fVar284 * fVar271;
          auVar83._0_4_ = fVar276 * fVar303;
          fVar204 = auVar25._8_4_;
          auVar83._8_4_ = fVar287 * fVar204;
          fVar143 = auVar25._12_4_;
          auVar83._12_4_ = fVar289 * fVar143;
          fVar200 = auVar25._16_4_;
          auVar83._16_4_ = fVar290 * fVar200;
          fVar202 = auVar25._20_4_;
          auVar83._20_4_ = fVar291 * fVar202;
          fVar167 = auVar25._24_4_;
          auVar83._24_4_ = fVar292 * fVar167;
          auVar83._28_4_ = uVar125;
          fVar203 = auVar254._0_4_;
          fVar310 = auVar254._4_4_;
          auVar84._4_4_ = fVar248 * fVar310;
          auVar84._0_4_ = fVar247 * fVar203;
          fVar273 = auVar254._8_4_;
          auVar84._8_4_ = fVar249 * fVar273;
          fVar146 = auVar254._12_4_;
          auVar84._12_4_ = fVar259 * fVar146;
          fVar201 = auVar254._16_4_;
          auVar84._16_4_ = fVar260 * fVar201;
          fVar231 = auVar254._20_4_;
          auVar84._20_4_ = fVar261 * fVar231;
          fVar233 = auVar254._24_4_;
          auVar84._24_4_ = fVar262 * fVar233;
          auVar84._28_4_ = auVar325._28_4_;
          auVar27 = vsubps_avx(auVar84,auVar83);
          auVar85._4_4_ = fVar308 * fVar310;
          auVar85._0_4_ = fVar288 * fVar203;
          auVar85._8_4_ = fVar265 * fVar273;
          auVar85._12_4_ = fVar274 * fVar146;
          auVar85._16_4_ = fVar189 * fVar201;
          auVar85._20_4_ = fVar220 * fVar231;
          auVar85._24_4_ = fVar207 * fVar233;
          auVar85._28_4_ = uVar125;
          auVar86._4_4_ = fVar271 * fVar230;
          auVar86._0_4_ = fVar303 * fVar286;
          auVar86._8_4_ = fVar204 * fVar264;
          auVar86._12_4_ = fVar143 * fVar166;
          auVar86._16_4_ = fVar200 * fVar151;
          auVar86._20_4_ = fVar202 * fVar187;
          auVar86._24_4_ = fVar167 * fVar245;
          auVar86._28_4_ = auVar28._28_4_;
          auVar28 = vsubps_avx(auVar86,auVar85);
          auVar31 = vsubps_avx(auVar26,auVar215);
          fVar205 = auVar28._28_4_ + auVar27._28_4_;
          local_760._0_4_ = auVar28._0_4_ + auVar27._0_4_ * 0.0 + auVar300._0_4_ * 0.0;
          local_760._4_4_ = auVar28._4_4_ + auVar27._4_4_ * 0.0 + auVar300._4_4_ * 0.0;
          local_760._8_4_ = auVar28._8_4_ + auVar27._8_4_ * 0.0 + auVar300._8_4_ * 0.0;
          local_760._12_4_ = auVar28._12_4_ + auVar27._12_4_ * 0.0 + auVar300._12_4_ * 0.0;
          local_760._16_4_ = auVar28._16_4_ + auVar27._16_4_ * 0.0 + auVar300._16_4_ * 0.0;
          local_760._20_4_ = auVar28._20_4_ + auVar27._20_4_ * 0.0 + auVar300._20_4_ * 0.0;
          local_760._24_4_ = auVar28._24_4_ + auVar27._24_4_ * 0.0 + auVar300._24_4_ * 0.0;
          local_760._28_4_ = fVar205 + auVar300._28_4_;
          fVar305 = auVar14._0_4_;
          fVar309 = auVar14._4_4_;
          auVar87._4_4_ = auVar215._4_4_ * fVar309;
          auVar87._0_4_ = auVar215._0_4_ * fVar305;
          fVar269 = auVar14._8_4_;
          auVar87._8_4_ = auVar215._8_4_ * fVar269;
          fVar148 = auVar14._12_4_;
          auVar87._12_4_ = auVar215._12_4_ * fVar148;
          fVar168 = auVar14._16_4_;
          auVar87._16_4_ = auVar215._16_4_ * fVar168;
          fVar232 = auVar14._20_4_;
          auVar87._20_4_ = auVar215._20_4_ * fVar232;
          fVar242 = auVar14._24_4_;
          auVar87._24_4_ = auVar215._24_4_ * fVar242;
          auVar87._28_4_ = fVar205;
          fVar205 = auVar31._0_4_;
          fVar311 = auVar31._4_4_;
          auVar88._4_4_ = auVar214._4_4_ * fVar311;
          auVar88._0_4_ = auVar214._0_4_ * fVar205;
          fVar270 = auVar31._8_4_;
          auVar88._8_4_ = auVar214._8_4_ * fVar270;
          fVar149 = auVar31._12_4_;
          auVar88._12_4_ = auVar214._12_4_ * fVar149;
          fVar183 = auVar31._16_4_;
          auVar88._16_4_ = auVar214._16_4_ * fVar183;
          fVar241 = auVar31._20_4_;
          auVar88._20_4_ = auVar214._20_4_ * fVar241;
          fVar244 = auVar31._24_4_;
          auVar88._24_4_ = auVar214._24_4_ * fVar244;
          auVar88._28_4_ = auVar28._28_4_;
          auVar14 = vsubps_avx(auVar88,auVar87);
          auVar27 = vsubps_avx(auVar25,auVar195);
          fVar307 = auVar27._0_4_;
          fVar272 = auVar27._4_4_;
          auVar89._4_4_ = auVar215._4_4_ * fVar272;
          auVar89._0_4_ = auVar215._0_4_ * fVar307;
          fVar206 = auVar27._8_4_;
          auVar89._8_4_ = auVar215._8_4_ * fVar206;
          fVar150 = auVar27._12_4_;
          auVar89._12_4_ = auVar215._12_4_ * fVar150;
          fVar185 = auVar27._16_4_;
          auVar89._16_4_ = auVar215._16_4_ * fVar185;
          fVar243 = auVar27._20_4_;
          auVar89._20_4_ = auVar215._20_4_ * fVar243;
          fVar246 = auVar27._24_4_;
          auVar89._24_4_ = auVar215._24_4_ * fVar246;
          auVar89._28_4_ = auVar215._28_4_;
          auVar90._4_4_ = fVar311 * auVar195._4_4_;
          auVar90._0_4_ = fVar205 * auVar195._0_4_;
          auVar90._8_4_ = fVar270 * auVar195._8_4_;
          auVar90._12_4_ = fVar149 * auVar195._12_4_;
          auVar90._16_4_ = fVar183 * auVar195._16_4_;
          auVar90._20_4_ = fVar241 * auVar195._20_4_;
          auVar90._24_4_ = fVar244 * auVar195._24_4_;
          auVar90._28_4_ = auVar300._28_4_;
          auVar215 = vsubps_avx(auVar89,auVar90);
          auVar91._4_4_ = auVar214._4_4_ * fVar272;
          auVar91._0_4_ = auVar214._0_4_ * fVar307;
          auVar91._8_4_ = auVar214._8_4_ * fVar206;
          auVar91._12_4_ = auVar214._12_4_ * fVar150;
          auVar91._16_4_ = auVar214._16_4_ * fVar185;
          auVar91._20_4_ = auVar214._20_4_ * fVar243;
          auVar91._24_4_ = auVar214._24_4_ * fVar246;
          auVar91._28_4_ = auVar214._28_4_;
          auVar92._4_4_ = fVar309 * auVar195._4_4_;
          auVar92._0_4_ = fVar305 * auVar195._0_4_;
          auVar92._8_4_ = fVar269 * auVar195._8_4_;
          auVar92._12_4_ = fVar148 * auVar195._12_4_;
          auVar92._16_4_ = fVar168 * auVar195._16_4_;
          auVar92._20_4_ = fVar232 * auVar195._20_4_;
          auVar92._24_4_ = fVar242 * auVar195._24_4_;
          auVar92._28_4_ = auVar195._28_4_;
          auVar195 = vsubps_avx(auVar92,auVar91);
          auVar140._0_4_ = auVar14._0_4_ * 0.0 + auVar195._0_4_ + auVar215._0_4_ * 0.0;
          auVar140._4_4_ = auVar14._4_4_ * 0.0 + auVar195._4_4_ + auVar215._4_4_ * 0.0;
          auVar140._8_4_ = auVar14._8_4_ * 0.0 + auVar195._8_4_ + auVar215._8_4_ * 0.0;
          auVar140._12_4_ = auVar14._12_4_ * 0.0 + auVar195._12_4_ + auVar215._12_4_ * 0.0;
          auVar140._16_4_ = auVar14._16_4_ * 0.0 + auVar195._16_4_ + auVar215._16_4_ * 0.0;
          auVar140._20_4_ = auVar14._20_4_ * 0.0 + auVar195._20_4_ + auVar215._20_4_ * 0.0;
          auVar140._24_4_ = auVar14._24_4_ * 0.0 + auVar195._24_4_ + auVar215._24_4_ * 0.0;
          auVar140._28_4_ = auVar215._28_4_ + auVar195._28_4_ + auVar215._28_4_;
          auVar141 = ZEXT3264(auVar140);
          auVar195 = vmaxps_avx(local_760,auVar140);
          auVar195 = vcmpps_avx(auVar195,ZEXT432(0) << 0x20,2);
          auVar214 = auVar162 & auVar195;
          if ((((((((auVar214 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar214 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar214 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar214 >> 0x7f,0) == '\0') &&
                (auVar214 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar214 >> 0xbf,0) == '\0') &&
              (auVar214 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar214[0x1f]) {
LAB_008dd321:
            auVar285 = auVar30._4_12_;
            auVar163 = ZEXT3264(CONCAT824(uStack_4e8,
                                          CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
            auVar301._4_4_ = fVar144;
            auVar301._0_4_ = fVar129;
            auVar301._8_4_ = fStack_7d8;
            auVar301._12_4_ = fStack_7d4;
            auVar301._16_4_ = fStack_7d0;
            auVar301._20_4_ = fStack_7cc;
            auVar301._24_4_ = fStack_7c8;
            auVar301._28_4_ = fStack_7c4;
          }
          else {
            auVar214 = vandps_avx(auVar195,auVar162);
            auVar93._4_4_ = fVar311 * fVar230;
            auVar93._0_4_ = fVar205 * fVar286;
            auVar93._8_4_ = fVar270 * fVar264;
            auVar93._12_4_ = fVar149 * fVar166;
            auVar93._16_4_ = fVar183 * fVar151;
            auVar93._20_4_ = fVar241 * fVar187;
            auVar93._24_4_ = fVar244 * fVar245;
            auVar93._28_4_ = auVar162._28_4_;
            auVar94._4_4_ = fVar309 * fVar284;
            auVar94._0_4_ = fVar305 * fVar276;
            auVar94._8_4_ = fVar269 * fVar287;
            auVar94._12_4_ = fVar148 * fVar289;
            auVar94._16_4_ = fVar168 * fVar290;
            auVar94._20_4_ = fVar232 * fVar291;
            auVar94._24_4_ = fVar242 * fVar292;
            auVar94._28_4_ = auVar195._28_4_;
            auVar195 = vsubps_avx(auVar94,auVar93);
            auVar95._4_4_ = fVar272 * fVar284;
            auVar95._0_4_ = fVar307 * fVar276;
            auVar95._8_4_ = fVar206 * fVar287;
            auVar95._12_4_ = fVar150 * fVar289;
            auVar95._16_4_ = fVar185 * fVar290;
            auVar95._20_4_ = fVar243 * fVar291;
            auVar95._24_4_ = fVar246 * fVar292;
            auVar95._28_4_ = auVar30._28_4_;
            auVar96._4_4_ = fVar311 * fVar310;
            auVar96._0_4_ = fVar205 * fVar203;
            auVar96._8_4_ = fVar270 * fVar273;
            auVar96._12_4_ = fVar149 * fVar146;
            auVar96._16_4_ = fVar183 * fVar201;
            auVar96._20_4_ = fVar241 * fVar231;
            auVar96._24_4_ = fVar244 * fVar233;
            auVar96._28_4_ = auVar31._28_4_;
            auVar30 = vsubps_avx(auVar96,auVar95);
            auVar285 = auVar30._4_12_;
            auVar97._4_4_ = fVar309 * fVar310;
            auVar97._0_4_ = fVar305 * fVar203;
            auVar97._8_4_ = fVar269 * fVar273;
            auVar97._12_4_ = fVar148 * fVar146;
            auVar97._16_4_ = fVar168 * fVar201;
            auVar97._20_4_ = fVar232 * fVar231;
            auVar97._24_4_ = fVar242 * fVar233;
            auVar97._28_4_ = auVar254._28_4_;
            auVar98._4_4_ = fVar272 * fVar230;
            auVar98._0_4_ = fVar307 * fVar286;
            auVar98._8_4_ = fVar206 * fVar264;
            auVar98._12_4_ = fVar150 * fVar166;
            auVar98._16_4_ = fVar185 * fVar151;
            auVar98._20_4_ = fVar243 * fVar187;
            auVar98._24_4_ = fVar246 * fVar245;
            auVar98._28_4_ = auVar29._28_4_;
            auVar215 = vsubps_avx(auVar98,auVar97);
            auVar161._0_4_ = auVar195._0_4_ * 0.0 + auVar215._0_4_ + auVar30._0_4_ * 0.0;
            auVar161._4_4_ = auVar195._4_4_ * 0.0 + auVar215._4_4_ + auVar30._4_4_ * 0.0;
            auVar161._8_4_ = auVar195._8_4_ * 0.0 + auVar215._8_4_ + auVar30._8_4_ * 0.0;
            auVar161._12_4_ = auVar195._12_4_ * 0.0 + auVar215._12_4_ + auVar30._12_4_ * 0.0;
            auVar161._16_4_ = auVar195._16_4_ * 0.0 + auVar215._16_4_ + auVar30._16_4_ * 0.0;
            auVar161._20_4_ = auVar195._20_4_ * 0.0 + auVar215._20_4_ + auVar30._20_4_ * 0.0;
            auVar161._24_4_ = auVar195._24_4_ * 0.0 + auVar215._24_4_ + auVar30._24_4_ * 0.0;
            auVar161._28_4_ = auVar29._28_4_ + auVar215._28_4_ + auVar254._28_4_;
            auVar162 = vrcpps_avx(auVar161);
            fVar286 = auVar162._0_4_;
            fVar203 = auVar162._4_4_;
            auVar99._4_4_ = auVar161._4_4_ * fVar203;
            auVar99._0_4_ = auVar161._0_4_ * fVar286;
            fVar305 = auVar162._8_4_;
            auVar99._8_4_ = auVar161._8_4_ * fVar305;
            fVar205 = auVar162._12_4_;
            auVar99._12_4_ = auVar161._12_4_ * fVar205;
            fVar307 = auVar162._16_4_;
            auVar99._16_4_ = auVar161._16_4_ * fVar307;
            fVar230 = auVar162._20_4_;
            auVar99._20_4_ = auVar161._20_4_ * fVar230;
            fVar310 = auVar162._24_4_;
            auVar99._24_4_ = auVar161._24_4_ * fVar310;
            auVar99._28_4_ = auVar31._28_4_;
            auVar319._8_4_ = 0x3f800000;
            auVar319._0_8_ = 0x3f8000003f800000;
            auVar319._12_4_ = 0x3f800000;
            auVar319._16_4_ = 0x3f800000;
            auVar319._20_4_ = 0x3f800000;
            auVar319._24_4_ = 0x3f800000;
            auVar319._28_4_ = 0x3f800000;
            auVar162 = vsubps_avx(auVar319,auVar99);
            fVar286 = auVar162._0_4_ * fVar286 + fVar286;
            fVar203 = auVar162._4_4_ * fVar203 + fVar203;
            fVar305 = auVar162._8_4_ * fVar305 + fVar305;
            fVar205 = auVar162._12_4_ * fVar205 + fVar205;
            fVar307 = auVar162._16_4_ * fVar307 + fVar307;
            fVar230 = auVar162._20_4_ * fVar230 + fVar230;
            fVar310 = auVar162._24_4_ * fVar310 + fVar310;
            auVar100._4_4_ =
                 (fVar271 * auVar195._4_4_ + auVar30._4_4_ * fVar308 + auVar215._4_4_ * fVar248) *
                 fVar203;
            auVar100._0_4_ =
                 (fVar303 * auVar195._0_4_ + auVar30._0_4_ * fVar288 + auVar215._0_4_ * fVar247) *
                 fVar286;
            auVar100._8_4_ =
                 (fVar204 * auVar195._8_4_ + auVar30._8_4_ * fVar265 + auVar215._8_4_ * fVar249) *
                 fVar305;
            auVar100._12_4_ =
                 (fVar143 * auVar195._12_4_ + auVar30._12_4_ * fVar274 + auVar215._12_4_ * fVar259)
                 * fVar205;
            auVar100._16_4_ =
                 (fVar200 * auVar195._16_4_ + auVar30._16_4_ * fVar189 + auVar215._16_4_ * fVar260)
                 * fVar307;
            auVar100._20_4_ =
                 (fVar202 * auVar195._20_4_ + auVar30._20_4_ * fVar220 + auVar215._20_4_ * fVar261)
                 * fVar230;
            auVar100._24_4_ =
                 (fVar167 * auVar195._24_4_ + auVar30._24_4_ * fVar207 + auVar215._24_4_ * fVar262)
                 * fVar310;
            auVar100._28_4_ = auVar25._28_4_ + auVar32._28_4_ + auVar26._28_4_;
            auVar199 = ZEXT3264(auVar100);
            uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar219._4_4_ = uVar125;
            auVar219._0_4_ = uVar125;
            auVar219._8_4_ = uVar125;
            auVar219._12_4_ = uVar125;
            auVar219._16_4_ = uVar125;
            auVar219._20_4_ = uVar125;
            auVar219._24_4_ = uVar125;
            auVar219._28_4_ = uVar125;
            auVar162 = vcmpps_avx(local_340,auVar100,2);
            auVar25 = vcmpps_avx(auVar100,auVar219,2);
            auVar162 = vandps_avx(auVar162,auVar25);
            auVar32 = auVar214 & auVar162;
            if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar32 >> 0x7f,0) == '\0') &&
                  (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar32 >> 0xbf,0) == '\0') &&
                (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar32[0x1f]) goto LAB_008dd321;
            auVar162 = vandps_avx(auVar214,auVar162);
            auVar32 = vcmpps_avx(ZEXT432(0) << 0x20,auVar161,4);
            auVar26 = auVar162 & auVar32;
            auVar163 = ZEXT3264(CONCAT824(uStack_4e8,
                                          CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
            auVar301._4_4_ = fVar144;
            auVar301._0_4_ = fVar129;
            auVar301._8_4_ = fStack_7d8;
            auVar301._12_4_ = fStack_7d4;
            auVar301._16_4_ = fStack_7d0;
            auVar301._20_4_ = fStack_7cc;
            auVar301._24_4_ = fStack_7c8;
            auVar301._28_4_ = fStack_7c4;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar162 = vandps_avx(auVar32,auVar162);
              auVar163 = ZEXT3264(auVar162);
              auVar101._4_4_ = fVar203 * local_760._4_4_;
              auVar101._0_4_ = fVar286 * (float)local_760._0_4_;
              auVar101._8_4_ = fVar305 * local_760._8_4_;
              auVar101._12_4_ = fVar205 * local_760._12_4_;
              auVar101._16_4_ = fVar307 * local_760._16_4_;
              auVar101._20_4_ = fVar230 * local_760._20_4_;
              auVar101._24_4_ = fVar310 * local_760._24_4_;
              auVar101._28_4_ = auVar25._28_4_;
              auVar102._4_4_ = auVar140._4_4_ * fVar203;
              auVar102._0_4_ = auVar140._0_4_ * fVar286;
              auVar102._8_4_ = auVar140._8_4_ * fVar305;
              auVar102._12_4_ = auVar140._12_4_ * fVar205;
              auVar102._16_4_ = auVar140._16_4_ * fVar307;
              auVar102._20_4_ = auVar140._20_4_ * fVar230;
              auVar102._24_4_ = auVar140._24_4_ * fVar310;
              auVar102._28_4_ = auVar140._28_4_;
              auVar240._8_4_ = 0x3f800000;
              auVar240._0_8_ = 0x3f8000003f800000;
              auVar240._12_4_ = 0x3f800000;
              auVar240._16_4_ = 0x3f800000;
              auVar240._20_4_ = 0x3f800000;
              auVar240._24_4_ = 0x3f800000;
              auVar240._28_4_ = 0x3f800000;
              auVar162 = vsubps_avx(auVar240,auVar101);
              local_180 = vblendvps_avx(auVar162,auVar101,auVar15);
              auVar162 = vsubps_avx(auVar240,auVar102);
              _local_380 = vblendvps_avx(auVar162,auVar102,auVar15);
              auVar141 = ZEXT3264(_local_380);
              local_1a0 = auVar100;
            }
          }
          auVar162 = auVar163._0_32_;
          auVar320 = ZEXT3264(local_7a0);
          if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar162 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar162 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar162 >> 0x7f,0) == '\0') &&
                (auVar163 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar162 >> 0xbf,0) == '\0') &&
              (auVar163 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar163[0x1f]) {
            auVar229 = ZEXT3264(auVar181);
          }
          else {
            auVar25 = vsubps_avx(_local_5c0,auVar301);
            auVar199 = ZEXT3264(local_180);
            fVar288 = auVar301._0_4_ + auVar25._0_4_ * local_180._0_4_;
            fVar303 = auVar301._4_4_ + auVar25._4_4_ * local_180._4_4_;
            fVar203 = auVar301._8_4_ + auVar25._8_4_ * local_180._8_4_;
            fVar305 = auVar301._12_4_ + auVar25._12_4_ * local_180._12_4_;
            fVar205 = auVar301._16_4_ + auVar25._16_4_ * local_180._16_4_;
            fVar307 = auVar301._20_4_ + auVar25._20_4_ * local_180._20_4_;
            fVar230 = auVar301._24_4_ + auVar25._24_4_ * local_180._24_4_;
            fVar308 = auVar301._28_4_ + auVar25._28_4_;
            fVar286 = *(float *)((long)local_7f0->ray_space + k * 4 + -0x10);
            auVar103._4_4_ = (fVar303 + fVar303) * fVar286;
            auVar103._0_4_ = (fVar288 + fVar288) * fVar286;
            auVar103._8_4_ = (fVar203 + fVar203) * fVar286;
            auVar103._12_4_ = (fVar305 + fVar305) * fVar286;
            auVar103._16_4_ = (fVar205 + fVar205) * fVar286;
            auVar103._20_4_ = (fVar307 + fVar307) * fVar286;
            auVar103._24_4_ = (fVar230 + fVar230) * fVar286;
            auVar103._28_4_ = fVar308 + fVar308;
            auVar25 = vcmpps_avx(local_1a0,auVar103,6);
            auVar141 = ZEXT3264(auVar25);
            auVar32 = auVar162 & auVar25;
            auVar229 = ZEXT3264(auVar181);
            if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar32 >> 0x7f,0) != '\0') ||
                  (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar32 >> 0xbf,0) != '\0') ||
                (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar32[0x1f] < '\0') {
              local_220 = vandps_avx(auVar25,auVar162);
              auVar141 = ZEXT3264(local_220);
              auVar155._0_8_ =
                   CONCAT44((float)local_380._4_4_ + (float)local_380._4_4_ + -1.0,
                            (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0);
              auVar155._8_4_ = (float)uStack_378 + (float)uStack_378 + -1.0;
              auVar155._12_4_ = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
              auVar157._16_4_ = (float)uStack_370 + (float)uStack_370 + -1.0;
              auVar157._0_16_ = auVar155;
              auVar157._20_4_ = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
              fStack_2a8 = (float)uStack_368 + (float)uStack_368 + -1.0;
              _local_2c0 = auVar157;
              fStack_2a4 = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
              auVar163 = ZEXT3264(_local_2c0);
              local_2e0 = local_180;
              local_2a0 = local_1a0;
              local_270 = local_6d0;
              uStack_268 = uStack_6c8;
              local_260 = local_6e0;
              uStack_258 = uStack_6d8;
              local_250 = local_5d0;
              uStack_248 = uStack_5c8;
              local_240 = local_5e0;
              uStack_238 = uStack_5d8;
              pGVar124 = (context->scene->geometries).items[local_7e8].ptr;
              _local_380 = _local_2c0;
              if ((pGVar124->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                pRVar119 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar119 = context->args;
                if ((pRVar119->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar119 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar119 >> 8),1),
                   pGVar124->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_780._4_28_ = auVar227._4_28_;
                  local_780._0_4_ = (int)uVar123;
                  auVar177._0_4_ = (float)(int)local_280;
                  auVar177._4_12_ = auVar285;
                  auVar223 = vshufps_avx(auVar177,auVar177,0);
                  local_200[0] = (auVar223._0_4_ + local_180._0_4_ + 0.0) * (float)local_120._0_4_;
                  local_200[1] = (auVar223._4_4_ + local_180._4_4_ + 1.0) * (float)local_120._4_4_;
                  local_200[2] = (auVar223._8_4_ + local_180._8_4_ + 2.0) * fStack_118;
                  local_200[3] = (auVar223._12_4_ + local_180._12_4_ + 3.0) * fStack_114;
                  fStack_1f0 = (auVar223._0_4_ + local_180._16_4_ + 4.0) * fStack_110;
                  fStack_1ec = (auVar223._4_4_ + local_180._20_4_ + 5.0) * fStack_10c;
                  fStack_1e8 = (auVar223._8_4_ + local_180._24_4_ + 6.0) * fStack_108;
                  fStack_1e4 = auVar223._12_4_ + (float)local_180._28_4_ + 7.0;
                  uStack_378 = auVar155._8_8_;
                  uStack_370 = auVar157._16_8_;
                  uStack_368 = local_2c0._24_8_;
                  local_1e0 = auVar155._0_8_;
                  uStack_1d8 = uStack_378;
                  uStack_1d0 = uStack_370;
                  uStack_1c8 = uStack_368;
                  auVar163 = ZEXT3264(local_1a0);
                  local_1c0 = local_1a0;
                  uVar125 = vmovmskps_avx(local_220);
                  uVar123 = CONCAT44((int)((ulong)pRVar119 >> 0x20),uVar125);
                  uVar121 = 0;
                  if (uVar123 != 0) {
                    for (; (uVar123 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
                    }
                  }
                  local_660._0_8_ = pGVar124;
                  _local_640 = auVar24;
                  local_27c = uVar10;
                  while (uVar123 != 0) {
                    local_7e0 = (uint)uVar123;
                    uStack_7dc = (undefined4)(uVar123 >> 0x20);
                    local_760._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_3e0 = local_200[uVar121];
                    local_3d0 = *(undefined4 *)((long)&local_1e0 + uVar121 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar121 * 4);
                    fVar302 = 1.0 - local_3e0;
                    fVar296 = local_3e0 * fVar302 * 4.0;
                    auVar223 = ZEXT416((uint)(local_3e0 * local_3e0 * 0.5));
                    auVar223 = vshufps_avx(auVar223,auVar223,0);
                    auVar178 = ZEXT416((uint)((fVar302 * fVar302 + fVar296) * 0.5));
                    auVar178 = vshufps_avx(auVar178,auVar178,0);
                    auVar213 = ZEXT416((uint)((-local_3e0 * local_3e0 - fVar296) * 0.5));
                    auVar213 = vshufps_avx(auVar213,auVar213,0);
                    local_6b0.context = context->user;
                    auVar194 = ZEXT416((uint)(fVar302 * -fVar302 * 0.5));
                    auVar194 = vshufps_avx(auVar194,auVar194,0);
                    auVar179._0_4_ =
                         auVar194._0_4_ * (float)local_6d0._0_4_ +
                         auVar213._0_4_ * (float)local_6e0._0_4_ +
                         auVar223._0_4_ * (float)local_5e0._0_4_ +
                         auVar178._0_4_ * (float)local_5d0._0_4_;
                    auVar179._4_4_ =
                         auVar194._4_4_ * (float)local_6d0._4_4_ +
                         auVar213._4_4_ * (float)local_6e0._4_4_ +
                         auVar223._4_4_ * (float)local_5e0._4_4_ +
                         auVar178._4_4_ * (float)local_5d0._4_4_;
                    auVar179._8_4_ =
                         auVar194._8_4_ * (float)uStack_6c8 +
                         auVar213._8_4_ * (float)uStack_6d8 +
                         auVar223._8_4_ * (float)uStack_5d8 + auVar178._8_4_ * (float)uStack_5c8;
                    auVar179._12_4_ =
                         auVar194._12_4_ * uStack_6c8._4_4_ +
                         auVar213._12_4_ * uStack_6d8._4_4_ +
                         auVar223._12_4_ * uStack_5d8._4_4_ + auVar178._12_4_ * uStack_5c8._4_4_;
                    local_410 = (RTCHitN  [16])vshufps_avx(auVar179,auVar179,0);
                    local_400 = vshufps_avx(auVar179,auVar179,0x55);
                    auVar199 = ZEXT1664(local_400);
                    local_3f0 = vshufps_avx(auVar179,auVar179,0xaa);
                    local_3c0 = local_300._0_8_;
                    uStack_3b8 = local_300._8_8_;
                    local_3b0 = local_5f0;
                    vcmpps_avx(ZEXT1632(local_5f0),ZEXT1632(local_5f0),0xf);
                    uStack_39c = (local_6b0.context)->instID[0];
                    local_3a0 = uStack_39c;
                    uStack_398 = uStack_39c;
                    uStack_394 = uStack_39c;
                    uStack_390 = (local_6b0.context)->instPrimID[0];
                    uStack_38c = uStack_390;
                    uStack_388 = uStack_390;
                    uStack_384 = uStack_390;
                    local_800 = *local_6b8;
                    local_6b0.valid = (int *)local_800;
                    local_6b0.geometryUserPtr = pGVar124->userPtr;
                    local_6b0.hit = local_410;
                    local_6b0.N = 4;
                    local_6b0.ray = (RTCRayN *)ray;
                    fStack_3dc = local_3e0;
                    fStack_3d8 = local_3e0;
                    fStack_3d4 = local_3e0;
                    uStack_3cc = local_3d0;
                    uStack_3c8 = local_3d0;
                    uStack_3c4 = local_3d0;
                    if (pGVar124->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar199 = ZEXT1664(local_400);
                      (*pGVar124->occlusionFilterN)(&local_6b0);
                    }
                    if (local_800 == (undefined1  [16])0x0) {
                      auVar223 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar223 = auVar223 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_660._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar199 = ZEXT1664(auVar199._0_16_);
                        (*p_Var13)(&local_6b0);
                      }
                      auVar178 = vpcmpeqd_avx(local_800,_DAT_01f45a50);
                      auVar223 = auVar178 ^ _DAT_01f46b70;
                      auVar180._8_4_ = 0xff800000;
                      auVar180._0_8_ = 0xff800000ff800000;
                      auVar180._12_4_ = 0xff800000;
                      auVar178 = vblendvps_avx(auVar180,*(undefined1 (*) [16])(local_6b0.ray + 0x80)
                                               ,auVar178);
                      *(undefined1 (*) [16])(local_6b0.ray + 0x80) = auVar178;
                    }
                    auVar141 = ZEXT1664(auVar223);
                    auVar156._8_8_ = 0x100000001;
                    auVar156._0_8_ = 0x100000001;
                    auVar163 = ZEXT1664(auVar156);
                    if ((auVar156 & auVar223) != (undefined1  [16])0x0) {
                      pRVar119 = (RTCIntersectArguments *)0x1;
                      goto LAB_008dd347;
                    }
                    auVar141 = ZEXT464((uint)local_760._0_4_);
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_760._0_4_;
                    uVar123 = CONCAT44(uStack_7dc,local_7e0) ^ 1L << (uVar121 & 0x3f);
                    uVar121 = 0;
                    pGVar124 = (Geometry *)local_660._0_8_;
                    if (uVar123 != 0) {
                      for (; (uVar123 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
                      }
                    }
                  }
                  pRVar119 = (RTCIntersectArguments *)0x0;
LAB_008dd347:
                  auVar320 = ZEXT3264(local_7a0);
                  uVar123 = (ulong)(uint)local_780._0_4_;
                  fVar312 = (float)local_7c0._0_4_;
                  fVar321 = (float)local_7c0._4_4_;
                  fVar322 = fStack_7b8;
                  fVar323 = fStack_7b4;
                  fVar296 = fStack_7b0;
                  fVar302 = fStack_7ac;
                  fVar304 = fStack_7a8;
                  fVar306 = fStack_7a4;
                  fVar263 = (float)local_620._0_4_;
                  fVar250 = (float)local_620._4_4_;
                  fVar256 = fStack_618;
                  fVar257 = fStack_614;
                  fVar258 = fStack_610;
                  fVar275 = fStack_60c;
                  fVar283 = fStack_608;
                  fVar128 = (float)local_700._0_4_;
                  fVar142 = (float)local_700._4_4_;
                  fVar145 = fStack_6f8;
                  fVar147 = fStack_6f4;
                  fVar152 = fStack_6f0;
                  fVar164 = fStack_6ec;
                  fVar165 = fStack_6e8;
                }
              }
              auVar229 = ZEXT3264(auVar181);
              uVar123 = CONCAT71((int7)(uVar123 >> 8),(byte)uVar123 | (byte)pRVar119);
            }
          }
        }
      }
    }
    if ((uVar123 & 1) != 0) break;
    uVar125 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar133._4_4_ = uVar125;
    auVar133._0_4_ = uVar125;
    auVar133._8_4_ = uVar125;
    auVar133._12_4_ = uVar125;
    auVar223 = vcmpps_avx(local_2f0,auVar133,2);
    uVar120 = vmovmskps_avx(auVar223);
  }
  return uVar118 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }